

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx512::CurveNiIntersectorK<8,16>::
     intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::BezierCurveT,16>,embree::avx512::Intersect1KEpilog1<16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  undefined1 auVar5 [16];
  Primitive PVar6;
  uint uVar7;
  Geometry *pGVar8;
  RTCFilterFunctionN p_Var9;
  RTCRayQueryContext *pRVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  undefined1 auVar25 [16];
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  int iVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  int iVar65;
  int iVar66;
  int iVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  byte bVar75;
  byte bVar76;
  byte bVar77;
  ulong uVar78;
  byte bVar79;
  byte bVar80;
  ulong uVar81;
  int iVar82;
  ulong uVar83;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  uint uVar84;
  long lVar85;
  byte bVar86;
  undefined1 uVar87;
  undefined1 uVar88;
  uint uVar89;
  uint uVar90;
  uint uVar153;
  uint uVar154;
  uint uVar156;
  uint uVar157;
  uint uVar158;
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  uint uVar155;
  uint uVar159;
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  float pp;
  float fVar160;
  undefined4 uVar161;
  undefined1 auVar163 [16];
  undefined1 auVar168 [32];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar166 [16];
  float fVar162;
  undefined1 auVar167 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [64];
  undefined1 auVar239 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  float fVar174;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  undefined1 auVar186 [32];
  undefined1 auVar175 [16];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  float fVar220;
  float fVar221;
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [32];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar240 [64];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [64];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [64];
  undefined1 auVar261 [64];
  undefined1 auVar262 [64];
  undefined1 auVar263 [64];
  undefined1 auVar264 [64];
  undefined1 auVar265 [64];
  undefined1 auVar266 [32];
  undefined1 in_ZMM31 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vint<16> mask;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  vfloatx_conflict vu0;
  StackEntry stack [3];
  RTCFilterFunctionNArguments local_b50;
  undefined1 local_b20 [32];
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 (*local_a48) [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [16];
  undefined1 local_a10 [16];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [8];
  float fStack_9b8;
  float fStack_9b4;
  float fStack_9b0;
  float fStack_9ac;
  float fStack_9a8;
  float fStack_9a4;
  undefined1 local_9a0 [32];
  undefined1 local_970 [16];
  undefined1 local_960 [16];
  undefined1 local_950 [8];
  float fStack_948;
  float fStack_944;
  undefined1 local_940 [16];
  undefined1 local_930 [16];
  undefined1 local_920 [16];
  Primitive *local_910;
  ulong local_908;
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [64];
  undefined1 local_700 [64];
  undefined1 local_6c0 [32];
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_670 [16];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  RTCHitN local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  byte abStack_1a0 [32];
  undefined1 auStack_180 [32];
  ulong uStack_160;
  int aiStack_158 [74];
  int iVar2;
  int iVar3;
  int iVar4;
  
  PVar6 = prim[1];
  uVar78 = (ulong)(byte)PVar6;
  fVar221 = *(float *)(prim + uVar78 * 0x19 + 0x12);
  auVar93 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar93 = vinsertps_avx(auVar93,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar25 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar97 = vinsertps_avx(auVar25,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar100 = vsubps_avx(auVar93,*(undefined1 (*) [16])(prim + uVar78 * 0x19 + 6));
  fVar220 = fVar221 * auVar100._0_4_;
  fVar160 = fVar221 * auVar97._0_4_;
  auVar93._8_8_ = 0;
  auVar93._0_8_ = *(ulong *)(prim + uVar78 * 4 + 6);
  auVar109 = vpmovsxbd_avx2(auVar93);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + uVar78 * 5 + 6);
  auVar107 = vpmovsxbd_avx2(auVar25);
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar107 = vcvtdq2ps_avx(auVar107);
  auVar94._8_8_ = 0;
  auVar94._0_8_ = *(ulong *)(prim + uVar78 * 6 + 6);
  auVar110 = vpmovsxbd_avx2(auVar94);
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar78 * 0xb + 6);
  auVar111 = vpmovsxbd_avx2(auVar5);
  auVar91._8_8_ = 0;
  auVar91._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar6 * 0xc) + 6);
  auVar116 = vpmovsxbd_avx2(auVar91);
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar112 = vcvtdq2ps_avx(auVar116);
  auVar99._8_8_ = 0;
  auVar99._0_8_ = *(ulong *)(prim + (uint)(byte)PVar6 * 0xc + uVar78 + 6);
  auVar108 = vpmovsxbd_avx2(auVar99);
  auVar108 = vcvtdq2ps_avx(auVar108);
  uVar81 = (ulong)(uint)((int)(uVar78 * 9) * 2);
  auVar95._8_8_ = 0;
  auVar95._0_8_ = *(ulong *)(prim + uVar81 + 6);
  auVar113 = vpmovsxbd_avx2(auVar95);
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar92._8_8_ = 0;
  auVar92._0_8_ = *(ulong *)(prim + uVar81 + uVar78 + 6);
  auVar114 = vpmovsxbd_avx2(auVar92);
  auVar114 = vcvtdq2ps_avx(auVar114);
  uVar83 = (ulong)(uint)((int)(uVar78 * 5) << 2);
  auVar96._8_8_ = 0;
  auVar96._0_8_ = *(ulong *)(prim + uVar83 + 6);
  auVar106 = vpmovsxbd_avx2(auVar96);
  auVar115 = vcvtdq2ps_avx(auVar106);
  auVar126._4_4_ = fVar160;
  auVar126._0_4_ = fVar160;
  auVar126._8_4_ = fVar160;
  auVar126._12_4_ = fVar160;
  auVar126._16_4_ = fVar160;
  auVar126._20_4_ = fVar160;
  auVar126._24_4_ = fVar160;
  auVar126._28_4_ = fVar160;
  auVar128._8_4_ = 1;
  auVar128._0_8_ = 0x100000001;
  auVar128._12_4_ = 1;
  auVar128._16_4_ = 1;
  auVar128._20_4_ = 1;
  auVar128._24_4_ = 1;
  auVar128._28_4_ = 1;
  auVar104 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar118 = ZEXT1632(CONCAT412(fVar221 * auVar97._12_4_,
                                CONCAT48(fVar221 * auVar97._8_4_,
                                         CONCAT44(fVar221 * auVar97._4_4_,fVar160))));
  auVar117 = vpermps_avx2(auVar128,auVar118);
  auVar105 = vpermps_avx512vl(auVar104,auVar118);
  fVar160 = auVar105._0_4_;
  fVar190 = auVar105._4_4_;
  auVar118._4_4_ = fVar190 * auVar110._4_4_;
  auVar118._0_4_ = fVar160 * auVar110._0_4_;
  fVar192 = auVar105._8_4_;
  auVar118._8_4_ = fVar192 * auVar110._8_4_;
  fVar194 = auVar105._12_4_;
  auVar118._12_4_ = fVar194 * auVar110._12_4_;
  fVar162 = auVar105._16_4_;
  auVar118._16_4_ = fVar162 * auVar110._16_4_;
  fVar196 = auVar105._20_4_;
  auVar118._20_4_ = fVar196 * auVar110._20_4_;
  fVar198 = auVar105._24_4_;
  auVar118._24_4_ = fVar198 * auVar110._24_4_;
  auVar118._28_4_ = auVar116._28_4_;
  auVar116._4_4_ = auVar108._4_4_ * fVar190;
  auVar116._0_4_ = auVar108._0_4_ * fVar160;
  auVar116._8_4_ = auVar108._8_4_ * fVar192;
  auVar116._12_4_ = auVar108._12_4_ * fVar194;
  auVar116._16_4_ = auVar108._16_4_ * fVar162;
  auVar116._20_4_ = auVar108._20_4_ * fVar196;
  auVar116._24_4_ = auVar108._24_4_ * fVar198;
  auVar116._28_4_ = auVar106._28_4_;
  auVar106._4_4_ = auVar115._4_4_ * fVar190;
  auVar106._0_4_ = auVar115._0_4_ * fVar160;
  auVar106._8_4_ = auVar115._8_4_ * fVar192;
  auVar106._12_4_ = auVar115._12_4_ * fVar194;
  auVar106._16_4_ = auVar115._16_4_ * fVar162;
  auVar106._20_4_ = auVar115._20_4_ * fVar196;
  auVar106._24_4_ = auVar115._24_4_ * fVar198;
  auVar106._28_4_ = auVar105._28_4_;
  auVar93 = vfmadd231ps_fma(auVar118,auVar117,auVar107);
  auVar25 = vfmadd231ps_fma(auVar116,auVar117,auVar112);
  auVar94 = vfmadd231ps_fma(auVar106,auVar114,auVar117);
  auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar126,auVar109);
  auVar25 = vfmadd231ps_fma(ZEXT1632(auVar25),auVar126,auVar111);
  auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar113,auVar126);
  auVar127._4_4_ = fVar220;
  auVar127._0_4_ = fVar220;
  auVar127._8_4_ = fVar220;
  auVar127._12_4_ = fVar220;
  auVar127._16_4_ = fVar220;
  auVar127._20_4_ = fVar220;
  auVar127._24_4_ = fVar220;
  auVar127._28_4_ = fVar220;
  auVar106 = ZEXT1632(CONCAT412(fVar221 * auVar100._12_4_,
                                CONCAT48(fVar221 * auVar100._8_4_,
                                         CONCAT44(fVar221 * auVar100._4_4_,fVar220))));
  auVar116 = vpermps_avx2(auVar128,auVar106);
  auVar106 = vpermps_avx512vl(auVar104,auVar106);
  fVar221 = auVar106._0_4_;
  fVar160 = auVar106._4_4_;
  auVar117._4_4_ = fVar160 * auVar110._4_4_;
  auVar117._0_4_ = fVar221 * auVar110._0_4_;
  fVar190 = auVar106._8_4_;
  auVar117._8_4_ = fVar190 * auVar110._8_4_;
  fVar192 = auVar106._12_4_;
  auVar117._12_4_ = fVar192 * auVar110._12_4_;
  fVar194 = auVar106._16_4_;
  auVar117._16_4_ = fVar194 * auVar110._16_4_;
  fVar162 = auVar106._20_4_;
  auVar117._20_4_ = fVar162 * auVar110._20_4_;
  fVar196 = auVar106._24_4_;
  auVar117._24_4_ = fVar196 * auVar110._24_4_;
  auVar117._28_4_ = 1;
  auVar104._4_4_ = auVar108._4_4_ * fVar160;
  auVar104._0_4_ = auVar108._0_4_ * fVar221;
  auVar104._8_4_ = auVar108._8_4_ * fVar190;
  auVar104._12_4_ = auVar108._12_4_ * fVar192;
  auVar104._16_4_ = auVar108._16_4_ * fVar194;
  auVar104._20_4_ = auVar108._20_4_ * fVar162;
  auVar104._24_4_ = auVar108._24_4_ * fVar196;
  auVar104._28_4_ = auVar110._28_4_;
  auVar108._4_4_ = auVar115._4_4_ * fVar160;
  auVar108._0_4_ = auVar115._0_4_ * fVar221;
  auVar108._8_4_ = auVar115._8_4_ * fVar190;
  auVar108._12_4_ = auVar115._12_4_ * fVar192;
  auVar108._16_4_ = auVar115._16_4_ * fVar194;
  auVar108._20_4_ = auVar115._20_4_ * fVar162;
  auVar108._24_4_ = auVar115._24_4_ * fVar196;
  auVar108._28_4_ = auVar106._28_4_;
  auVar5 = vfmadd231ps_fma(auVar117,auVar116,auVar107);
  auVar91 = vfmadd231ps_fma(auVar104,auVar116,auVar112);
  auVar99 = vfmadd231ps_fma(auVar108,auVar116,auVar114);
  auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar127,auVar109);
  auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar127,auVar111);
  auVar123._8_4_ = 0x7fffffff;
  auVar123._0_8_ = 0x7fffffff7fffffff;
  auVar123._12_4_ = 0x7fffffff;
  auVar123._16_4_ = 0x7fffffff;
  auVar123._20_4_ = 0x7fffffff;
  auVar123._24_4_ = 0x7fffffff;
  auVar123._28_4_ = 0x7fffffff;
  auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),auVar127,auVar113);
  auVar109 = vandps_avx(ZEXT1632(auVar93),auVar123);
  auVar125._8_4_ = 0x219392ef;
  auVar125._0_8_ = 0x219392ef219392ef;
  auVar125._12_4_ = 0x219392ef;
  auVar125._16_4_ = 0x219392ef;
  auVar125._20_4_ = 0x219392ef;
  auVar125._24_4_ = 0x219392ef;
  auVar125._28_4_ = 0x219392ef;
  uVar81 = vcmpps_avx512vl(auVar109,auVar125,1);
  bVar11 = (bool)((byte)uVar81 & 1);
  auVar105._0_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar93._0_4_;
  bVar11 = (bool)((byte)(uVar81 >> 1) & 1);
  auVar105._4_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar93._4_4_;
  bVar11 = (bool)((byte)(uVar81 >> 2) & 1);
  auVar105._8_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar93._8_4_;
  bVar11 = (bool)((byte)(uVar81 >> 3) & 1);
  auVar105._12_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar93._12_4_;
  auVar105._16_4_ = (uint)((byte)(uVar81 >> 4) & 1) * 0x219392ef;
  auVar105._20_4_ = (uint)((byte)(uVar81 >> 5) & 1) * 0x219392ef;
  auVar105._24_4_ = (uint)((byte)(uVar81 >> 6) & 1) * 0x219392ef;
  auVar105._28_4_ = (uint)(byte)(uVar81 >> 7) * 0x219392ef;
  auVar109 = vandps_avx(ZEXT1632(auVar25),auVar123);
  uVar81 = vcmpps_avx512vl(auVar109,auVar125,1);
  bVar11 = (bool)((byte)uVar81 & 1);
  auVar119._0_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar25._0_4_;
  bVar11 = (bool)((byte)(uVar81 >> 1) & 1);
  auVar119._4_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar25._4_4_;
  bVar11 = (bool)((byte)(uVar81 >> 2) & 1);
  auVar119._8_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar25._8_4_;
  bVar11 = (bool)((byte)(uVar81 >> 3) & 1);
  auVar119._12_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar25._12_4_;
  auVar119._16_4_ = (uint)((byte)(uVar81 >> 4) & 1) * 0x219392ef;
  auVar119._20_4_ = (uint)((byte)(uVar81 >> 5) & 1) * 0x219392ef;
  auVar119._24_4_ = (uint)((byte)(uVar81 >> 6) & 1) * 0x219392ef;
  auVar119._28_4_ = (uint)(byte)(uVar81 >> 7) * 0x219392ef;
  auVar109 = vandps_avx(ZEXT1632(auVar94),auVar123);
  uVar81 = vcmpps_avx512vl(auVar109,auVar125,1);
  bVar11 = (bool)((byte)uVar81 & 1);
  auVar109._0_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar94._0_4_;
  bVar11 = (bool)((byte)(uVar81 >> 1) & 1);
  auVar109._4_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar94._4_4_;
  bVar11 = (bool)((byte)(uVar81 >> 2) & 1);
  auVar109._8_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar94._8_4_;
  bVar11 = (bool)((byte)(uVar81 >> 3) & 1);
  auVar109._12_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar94._12_4_;
  auVar109._16_4_ = (uint)((byte)(uVar81 >> 4) & 1) * 0x219392ef;
  auVar109._20_4_ = (uint)((byte)(uVar81 >> 5) & 1) * 0x219392ef;
  auVar109._24_4_ = (uint)((byte)(uVar81 >> 6) & 1) * 0x219392ef;
  auVar109._28_4_ = (uint)(byte)(uVar81 >> 7) * 0x219392ef;
  auVar107 = vrcp14ps_avx512vl(auVar105);
  auVar124._8_4_ = 0x3f800000;
  auVar124._0_8_ = 0x3f8000003f800000;
  auVar124._12_4_ = 0x3f800000;
  auVar124._16_4_ = 0x3f800000;
  auVar124._20_4_ = 0x3f800000;
  auVar124._24_4_ = 0x3f800000;
  auVar124._28_4_ = 0x3f800000;
  auVar93 = vfnmadd213ps_fma(auVar105,auVar107,auVar124);
  auVar93 = vfmadd132ps_fma(ZEXT1632(auVar93),auVar107,auVar107);
  auVar107 = vrcp14ps_avx512vl(auVar119);
  auVar25 = vfnmadd213ps_fma(auVar119,auVar107,auVar124);
  auVar25 = vfmadd132ps_fma(ZEXT1632(auVar25),auVar107,auVar107);
  auVar107 = vrcp14ps_avx512vl(auVar109);
  auVar94 = vfnmadd213ps_fma(auVar109,auVar107,auVar124);
  auVar94 = vfmadd132ps_fma(ZEXT1632(auVar94),auVar107,auVar107);
  auVar109 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 7 + 6));
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar109 = vsubps_avx(auVar109,ZEXT1632(auVar5));
  auVar113._4_4_ = auVar93._4_4_ * auVar109._4_4_;
  auVar113._0_4_ = auVar93._0_4_ * auVar109._0_4_;
  auVar113._8_4_ = auVar93._8_4_ * auVar109._8_4_;
  auVar113._12_4_ = auVar93._12_4_ * auVar109._12_4_;
  auVar113._16_4_ = auVar109._16_4_ * 0.0;
  auVar113._20_4_ = auVar109._20_4_ * 0.0;
  auVar113._24_4_ = auVar109._24_4_ * 0.0;
  auVar113._28_4_ = auVar109._28_4_;
  auVar109 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 9 + 6));
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar109 = vsubps_avx(auVar109,ZEXT1632(auVar5));
  auVar108 = vpbroadcastd_avx512vl();
  auVar107 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar6 * 0x10 + 6));
  auVar122._0_4_ = auVar93._0_4_ * auVar109._0_4_;
  auVar122._4_4_ = auVar93._4_4_ * auVar109._4_4_;
  auVar122._8_4_ = auVar93._8_4_ * auVar109._8_4_;
  auVar122._12_4_ = auVar93._12_4_ * auVar109._12_4_;
  auVar122._16_4_ = auVar109._16_4_ * 0.0;
  auVar122._20_4_ = auVar109._20_4_ * 0.0;
  auVar122._24_4_ = auVar109._24_4_ * 0.0;
  auVar122._28_4_ = 0;
  auVar109 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar6 * 0x10 + uVar78 * -2 + 6));
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar109 = vsubps_avx(auVar109,ZEXT1632(auVar91));
  auVar114._4_4_ = auVar25._4_4_ * auVar109._4_4_;
  auVar114._0_4_ = auVar25._0_4_ * auVar109._0_4_;
  auVar114._8_4_ = auVar25._8_4_ * auVar109._8_4_;
  auVar114._12_4_ = auVar25._12_4_ * auVar109._12_4_;
  auVar114._16_4_ = auVar109._16_4_ * 0.0;
  auVar114._20_4_ = auVar109._20_4_ * 0.0;
  auVar114._24_4_ = auVar109._24_4_ * 0.0;
  auVar114._28_4_ = auVar109._28_4_;
  auVar109 = vcvtdq2ps_avx(auVar107);
  auVar109 = vsubps_avx(auVar109,ZEXT1632(auVar91));
  auVar121._0_4_ = auVar25._0_4_ * auVar109._0_4_;
  auVar121._4_4_ = auVar25._4_4_ * auVar109._4_4_;
  auVar121._8_4_ = auVar25._8_4_ * auVar109._8_4_;
  auVar121._12_4_ = auVar25._12_4_ * auVar109._12_4_;
  auVar121._16_4_ = auVar109._16_4_ * 0.0;
  auVar121._20_4_ = auVar109._20_4_ * 0.0;
  auVar121._24_4_ = auVar109._24_4_ * 0.0;
  auVar121._28_4_ = 0;
  auVar109 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar83 + uVar78 + 6));
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar109 = vsubps_avx(auVar109,ZEXT1632(auVar99));
  auVar115._4_4_ = auVar109._4_4_ * auVar94._4_4_;
  auVar115._0_4_ = auVar109._0_4_ * auVar94._0_4_;
  auVar115._8_4_ = auVar109._8_4_ * auVar94._8_4_;
  auVar115._12_4_ = auVar109._12_4_ * auVar94._12_4_;
  auVar115._16_4_ = auVar109._16_4_ * 0.0;
  auVar115._20_4_ = auVar109._20_4_ * 0.0;
  auVar115._24_4_ = auVar109._24_4_ * 0.0;
  auVar115._28_4_ = auVar109._28_4_;
  auVar109 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 0x17 + 6));
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar109 = vsubps_avx(auVar109,ZEXT1632(auVar99));
  auVar120._0_4_ = auVar94._0_4_ * auVar109._0_4_;
  auVar120._4_4_ = auVar94._4_4_ * auVar109._4_4_;
  auVar120._8_4_ = auVar94._8_4_ * auVar109._8_4_;
  auVar120._12_4_ = auVar94._12_4_ * auVar109._12_4_;
  auVar120._16_4_ = auVar109._16_4_ * 0.0;
  auVar120._20_4_ = auVar109._20_4_ * 0.0;
  auVar120._24_4_ = auVar109._24_4_ * 0.0;
  auVar120._28_4_ = 0;
  auVar109 = vpminsd_avx2(auVar113,auVar122);
  auVar107 = vpminsd_avx2(auVar114,auVar121);
  auVar109 = vmaxps_avx(auVar109,auVar107);
  auVar107 = vpminsd_avx2(auVar115,auVar120);
  uVar161 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar110._4_4_ = uVar161;
  auVar110._0_4_ = uVar161;
  auVar110._8_4_ = uVar161;
  auVar110._12_4_ = uVar161;
  auVar110._16_4_ = uVar161;
  auVar110._20_4_ = uVar161;
  auVar110._24_4_ = uVar161;
  auVar110._28_4_ = uVar161;
  auVar107 = vmaxps_avx512vl(auVar107,auVar110);
  auVar109 = vmaxps_avx(auVar109,auVar107);
  auVar107._8_4_ = 0x3f7ffffa;
  auVar107._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar107._12_4_ = 0x3f7ffffa;
  auVar107._16_4_ = 0x3f7ffffa;
  auVar107._20_4_ = 0x3f7ffffa;
  auVar107._24_4_ = 0x3f7ffffa;
  auVar107._28_4_ = 0x3f7ffffa;
  local_5c0 = vmulps_avx512vl(auVar109,auVar107);
  auVar109 = vpmaxsd_avx2(auVar113,auVar122);
  auVar107 = vpmaxsd_avx2(auVar114,auVar121);
  auVar109 = vminps_avx(auVar109,auVar107);
  auVar107 = vpmaxsd_avx2(auVar115,auVar120);
  uVar161 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar111._4_4_ = uVar161;
  auVar111._0_4_ = uVar161;
  auVar111._8_4_ = uVar161;
  auVar111._12_4_ = uVar161;
  auVar111._16_4_ = uVar161;
  auVar111._20_4_ = uVar161;
  auVar111._24_4_ = uVar161;
  auVar111._28_4_ = uVar161;
  auVar107 = vminps_avx512vl(auVar107,auVar111);
  auVar109 = vminps_avx(auVar109,auVar107);
  auVar112._8_4_ = 0x3f800003;
  auVar112._0_8_ = 0x3f8000033f800003;
  auVar112._12_4_ = 0x3f800003;
  auVar112._16_4_ = 0x3f800003;
  auVar112._20_4_ = 0x3f800003;
  auVar112._24_4_ = 0x3f800003;
  auVar112._28_4_ = 0x3f800003;
  auVar109 = vmulps_avx512vl(auVar109,auVar112);
  uVar27 = vpcmpgtd_avx512vl(auVar108,_DAT_01fe9900);
  uVar26 = vcmpps_avx512vl(local_5c0,auVar109,2);
  if ((byte)((byte)uVar26 & (byte)uVar27) == 0) {
    return;
  }
  local_908 = (ulong)(byte)((byte)uVar26 & (byte)uVar27);
  local_a48 = (undefined1 (*) [32])local_240;
  auVar173 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_4c0 = vmovdqa64_avx512f(auVar173);
  local_910 = prim;
LAB_01d50510:
  lVar85 = 0;
  for (uVar81 = local_908; (uVar81 & 1) == 0; uVar81 = uVar81 >> 1 | 0x8000000000000000) {
    lVar85 = lVar85 + 1;
  }
  uVar84 = *(uint *)(prim + 2);
  uVar7 = *(uint *)(prim + lVar85 * 4 + 6);
  pGVar8 = (context->scene->geometries).items[uVar84].ptr;
  uVar81 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar7);
  p_Var9 = pGVar8[1].intersectionFilterN;
  lVar85 = *(long *)&pGVar8[1].time_range.upper;
  auVar93 = *(undefined1 (*) [16])(lVar85 + (long)p_Var9 * uVar81);
  auVar25 = *(undefined1 (*) [16])(lVar85 + (uVar81 + 1) * (long)p_Var9);
  auVar94 = *(undefined1 (*) [16])(lVar85 + (uVar81 + 2) * (long)p_Var9);
  local_908 = local_908 - 1 & local_908;
  auVar5 = *(undefined1 (*) [16])(lVar85 + (uVar81 + 3) * (long)p_Var9);
  if (local_908 != 0) {
    uVar83 = local_908 - 1 & local_908;
    for (uVar81 = local_908; (uVar81 & 1) == 0; uVar81 = uVar81 >> 1 | 0x8000000000000000) {
    }
    if (uVar83 != 0) {
      for (; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar91 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x1c);
  auVar99 = vinsertps_avx(auVar91,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  local_760 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x100)));
  local_780 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x140)));
  auVar91 = vunpcklps_avx512vl(local_760._0_16_,local_780._0_16_);
  local_a00 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x180)));
  auVar265 = ZEXT3264(local_a00);
  auVar96 = local_a00._0_16_;
  local_a10 = vinsertps_avx512f(auVar91,auVar96,0x28);
  auVar100._0_4_ = auVar93._0_4_ + auVar25._0_4_ + auVar94._0_4_ + auVar5._0_4_;
  auVar100._4_4_ = auVar93._4_4_ + auVar25._4_4_ + auVar94._4_4_ + auVar5._4_4_;
  auVar100._8_4_ = auVar93._8_4_ + auVar25._8_4_ + auVar94._8_4_ + auVar5._8_4_;
  auVar100._12_4_ = auVar93._12_4_ + auVar25._12_4_ + auVar94._12_4_ + auVar5._12_4_;
  auVar97._8_4_ = 0x3e800000;
  auVar97._0_8_ = 0x3e8000003e800000;
  auVar97._12_4_ = 0x3e800000;
  auVar91 = vmulps_avx512vl(auVar100,auVar97);
  auVar91 = vsubps_avx(auVar91,auVar99);
  auVar91 = vdpps_avx(auVar91,local_a10,0x7f);
  fVar221 = *(float *)(ray + k * 4 + 0xc0);
  local_a20 = vdpps_avx(local_a10,local_a10,0x7f);
  auVar101._4_12_ = ZEXT812(0) << 0x20;
  auVar101._0_4_ = local_a20._0_4_;
  auVar92 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar101);
  auVar95 = vfnmadd213ss_fma(auVar92,local_a20,ZEXT416(0x40000000));
  local_5a0 = auVar91._0_4_ * auVar92._0_4_ * auVar95._0_4_;
  auVar98._4_4_ = local_5a0;
  auVar98._0_4_ = local_5a0;
  auVar98._8_4_ = local_5a0;
  auVar98._12_4_ = local_5a0;
  fStack_9b0 = local_5a0;
  _local_9c0 = auVar98;
  fStack_9ac = local_5a0;
  fStack_9a8 = local_5a0;
  fStack_9a4 = local_5a0;
  auVar91 = vfmadd231ps_fma(auVar99,local_a10,auVar98);
  auVar91 = vblendps_avx(auVar91,ZEXT816(0) << 0x40,8);
  auVar93 = vsubps_avx(auVar93,auVar91);
  auVar94 = vsubps_avx(auVar94,auVar91);
  auVar25 = vsubps_avx(auVar25,auVar91);
  auVar5 = vsubps_avx(auVar5,auVar91);
  uVar161 = auVar93._0_4_;
  auVar257._4_4_ = uVar161;
  auVar257._0_4_ = uVar161;
  auVar257._8_4_ = uVar161;
  auVar257._12_4_ = uVar161;
  auVar257._16_4_ = uVar161;
  auVar257._20_4_ = uVar161;
  auVar257._24_4_ = uVar161;
  auVar257._28_4_ = uVar161;
  auVar130._8_4_ = 1;
  auVar130._0_8_ = 0x100000001;
  auVar130._12_4_ = 1;
  auVar130._16_4_ = 1;
  auVar130._20_4_ = 1;
  auVar130._24_4_ = 1;
  auVar130._28_4_ = 1;
  local_880 = ZEXT1632(auVar93);
  auVar109 = vpermps_avx512vl(auVar130,local_880);
  auVar131._8_4_ = 2;
  auVar131._0_8_ = 0x200000002;
  auVar131._12_4_ = 2;
  auVar131._16_4_ = 2;
  auVar131._20_4_ = 2;
  auVar131._24_4_ = 2;
  auVar131._28_4_ = 2;
  local_aa0 = vpermps_avx2(auVar131,local_880);
  auVar260 = ZEXT3264(local_aa0);
  auVar132._8_4_ = 3;
  auVar132._0_8_ = 0x300000003;
  auVar132._12_4_ = 3;
  auVar132._16_4_ = 3;
  auVar132._20_4_ = 3;
  auVar132._24_4_ = 3;
  auVar132._28_4_ = 3;
  local_ac0 = vpermps_avx2(auVar132,local_880);
  auVar261 = ZEXT3264(local_ac0);
  uVar161 = auVar25._0_4_;
  local_860._4_4_ = uVar161;
  local_860._0_4_ = uVar161;
  local_860._8_4_ = uVar161;
  local_860._12_4_ = uVar161;
  local_860._16_4_ = uVar161;
  local_860._20_4_ = uVar161;
  local_860._24_4_ = uVar161;
  local_860._28_4_ = uVar161;
  auVar251 = ZEXT3264(local_860);
  local_8c0 = ZEXT1632(auVar25);
  local_9e0 = vpermps_avx2(auVar130,local_8c0);
  auVar240 = ZEXT3264(local_9e0);
  auVar107 = vpermps_avx512vl(auVar131,local_8c0);
  auVar110 = vpermps_avx512vl(auVar132,local_8c0);
  auVar111 = vbroadcastss_avx512vl(auVar94);
  local_8a0 = ZEXT1632(auVar94);
  local_ae0 = vpermps_avx512vl(auVar130,local_8a0);
  auVar262 = ZEXT3264(local_ae0);
  auVar112 = vpermps_avx512vl(auVar131,local_8a0);
  local_b00 = vpermps_avx512vl(auVar132,local_8a0);
  auVar263 = ZEXT3264(local_b00);
  auVar108 = vbroadcastss_avx512vl(auVar5);
  _local_8e0 = ZEXT1632(auVar5);
  local_b20 = vpermps_avx512vl(auVar130,_local_8e0);
  auVar264 = ZEXT3264(local_b20);
  auVar113 = vpermps_avx512vl(auVar131,_local_8e0);
  auVar114 = vpermps_avx512vl(auVar132,_local_8e0);
  auVar93 = vmulss_avx512f(auVar96,auVar96);
  auVar115 = vfmadd231ps_avx512vl(ZEXT1632(auVar93),local_780,local_780);
  local_580 = vfmadd231ps_avx512vl(auVar115,local_760,local_760);
  uVar161 = local_580._0_4_;
  local_560._4_4_ = uVar161;
  local_560._0_4_ = uVar161;
  local_560._8_4_ = uVar161;
  local_560._12_4_ = uVar161;
  local_560._16_4_ = uVar161;
  local_560._20_4_ = uVar161;
  local_560._24_4_ = uVar161;
  local_560._28_4_ = uVar161;
  auVar129._8_4_ = 0x7fffffff;
  auVar129._0_8_ = 0x7fffffff7fffffff;
  auVar129._12_4_ = 0x7fffffff;
  auVar129._16_4_ = 0x7fffffff;
  auVar129._20_4_ = 0x7fffffff;
  auVar129._24_4_ = 0x7fffffff;
  auVar129._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_560,auVar129);
  local_970 = ZEXT416((uint)local_5a0);
  local_5a0 = fVar221 - local_5a0;
  fStack_59c = local_5a0;
  fStack_598 = local_5a0;
  fStack_594 = local_5a0;
  fStack_590 = local_5a0;
  fStack_58c = local_5a0;
  fStack_588 = local_5a0;
  fStack_584 = local_5a0;
  auVar173 = vpbroadcastd_avx512f();
  local_440 = vmovdqa64_avx512f(auVar173);
  iVar82 = 1;
  uVar81 = 0;
  auVar173 = vpbroadcastd_avx512f();
  local_480 = vmovdqa64_avx512f(auVar173);
  auVar93 = vsqrtss_avx(local_a20,local_a20);
  auVar25 = vsqrtss_avx(local_a20,local_a20);
  local_670 = ZEXT816(0x3f80000000000000);
  auVar115 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar173 = ZEXT3264(auVar115);
  do {
    auVar94 = vmovshdup_avx(local_670);
    auVar94 = vsubps_avx(auVar94,local_670);
    fVar160 = auVar94._0_4_;
    fVar162 = fVar160 * 0.04761905;
    auVar234._0_4_ = local_670._0_4_;
    auVar234._4_4_ = auVar234._0_4_;
    auVar234._8_4_ = auVar234._0_4_;
    auVar234._12_4_ = auVar234._0_4_;
    auVar234._16_4_ = auVar234._0_4_;
    auVar234._20_4_ = auVar234._0_4_;
    auVar234._24_4_ = auVar234._0_4_;
    auVar234._28_4_ = auVar234._0_4_;
    auVar245._4_4_ = fVar160;
    auVar245._0_4_ = fVar160;
    auVar245._8_4_ = fVar160;
    auVar245._12_4_ = fVar160;
    auVar245._16_4_ = fVar160;
    auVar245._20_4_ = fVar160;
    auVar245._24_4_ = fVar160;
    auVar245._28_4_ = fVar160;
    auVar94 = vfmadd231ps_fma(auVar234,auVar245,_DAT_01faff20);
    auVar266 = auVar173._0_32_;
    auVar115 = vsubps_avx512vl(auVar266,ZEXT1632(auVar94));
    fVar160 = auVar94._0_4_;
    fVar190 = auVar94._4_4_;
    auVar74._4_4_ = auVar251._4_4_ * fVar190;
    auVar74._0_4_ = auVar251._0_4_ * fVar160;
    fVar192 = auVar94._8_4_;
    auVar74._8_4_ = auVar251._8_4_ * fVar192;
    fVar194 = auVar94._12_4_;
    auVar74._12_4_ = auVar251._12_4_ * fVar194;
    auVar74._16_4_ = auVar251._16_4_ * 0.0;
    auVar74._20_4_ = auVar251._20_4_ * 0.0;
    auVar74._24_4_ = auVar251._24_4_ * 0.0;
    auVar74._28_4_ = DAT_01faff20._28_4_;
    auVar118 = ZEXT1632(auVar94);
    auVar137._4_4_ = auVar240._4_4_ * fVar190;
    auVar137._0_4_ = auVar240._0_4_ * fVar160;
    auVar137._8_4_ = auVar240._8_4_ * fVar192;
    auVar137._12_4_ = auVar240._12_4_ * fVar194;
    auVar137._16_4_ = auVar240._16_4_ * 0.0;
    auVar137._20_4_ = auVar240._20_4_ * 0.0;
    auVar137._24_4_ = auVar240._24_4_ * 0.0;
    auVar137._28_4_ = auVar234._0_4_;
    auVar116 = vmulps_avx512vl(auVar107,auVar118);
    auVar106 = vmulps_avx512vl(auVar110,auVar118);
    auVar5 = vfmadd231ps_fma(auVar74,auVar115,auVar257);
    auVar117 = vfmadd231ps_avx512vl(auVar137,auVar115,auVar109);
    auVar91 = vfmadd231ps_fma(auVar116,auVar115,auVar260._0_32_);
    auVar99 = vfmadd231ps_fma(auVar106,auVar115,auVar261._0_32_);
    auVar116 = vmulps_avx512vl(auVar111,auVar118);
    auVar120 = ZEXT1632(auVar94);
    auVar106 = vmulps_avx512vl(auVar262._0_32_,auVar120);
    auVar118 = vmulps_avx512vl(auVar112,auVar120);
    auVar104 = vmulps_avx512vl(auVar263._0_32_,auVar120);
    auVar95 = vfmadd231ps_fma(auVar116,auVar115,auVar251._0_32_);
    auVar92 = vfmadd231ps_fma(auVar106,auVar115,auVar240._0_32_);
    auVar116 = vfmadd231ps_avx512vl(auVar118,auVar115,auVar107);
    auVar106 = vfmadd231ps_avx512vl(auVar104,auVar115,auVar110);
    auVar118 = vmulps_avx512vl(auVar108,auVar120);
    auVar104 = vmulps_avx512vl(auVar264._0_32_,auVar120);
    auVar105 = vmulps_avx512vl(auVar113,auVar120);
    auVar119 = vmulps_avx512vl(auVar114,auVar120);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar115,auVar111);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar115,auVar262._0_32_);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar115,auVar112);
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar115,auVar263._0_32_);
    auVar140._28_4_ = auVar240._28_4_;
    auVar140._0_28_ =
         ZEXT1628(CONCAT412(fVar194 * auVar95._12_4_,
                            CONCAT48(fVar192 * auVar95._8_4_,
                                     CONCAT44(fVar190 * auVar95._4_4_,fVar160 * auVar95._0_4_))));
    auVar120 = vmulps_avx512vl(auVar120,ZEXT1632(auVar92));
    auVar121 = vmulps_avx512vl(ZEXT1632(auVar94),auVar116);
    auVar122 = vmulps_avx512vl(ZEXT1632(auVar94),auVar106);
    auVar94 = vfmadd231ps_fma(auVar140,auVar115,ZEXT1632(auVar5));
    auVar120 = vfmadd231ps_avx512vl(auVar120,auVar115,auVar117);
    auVar121 = vfmadd231ps_avx512vl(auVar121,auVar115,ZEXT1632(auVar91));
    auVar122 = vfmadd231ps_avx512vl(auVar122,auVar115,ZEXT1632(auVar99));
    auVar249._0_4_ = auVar118._0_4_ * fVar160;
    auVar249._4_4_ = auVar118._4_4_ * fVar190;
    auVar249._8_4_ = auVar118._8_4_ * fVar192;
    auVar249._12_4_ = auVar118._12_4_ * fVar194;
    auVar249._16_4_ = auVar118._16_4_ * 0.0;
    auVar249._20_4_ = auVar118._20_4_ * 0.0;
    auVar249._24_4_ = auVar118._24_4_ * 0.0;
    auVar249._28_4_ = 0;
    auVar141._4_4_ = auVar104._4_4_ * fVar190;
    auVar141._0_4_ = auVar104._0_4_ * fVar160;
    auVar141._8_4_ = auVar104._8_4_ * fVar192;
    auVar141._12_4_ = auVar104._12_4_ * fVar194;
    auVar141._16_4_ = auVar104._16_4_ * 0.0;
    auVar141._20_4_ = auVar104._20_4_ * 0.0;
    auVar141._24_4_ = auVar104._24_4_ * 0.0;
    auVar141._28_4_ = auVar118._28_4_;
    auVar44._4_4_ = auVar105._4_4_ * fVar190;
    auVar44._0_4_ = auVar105._0_4_ * fVar160;
    auVar44._8_4_ = auVar105._8_4_ * fVar192;
    auVar44._12_4_ = auVar105._12_4_ * fVar194;
    auVar44._16_4_ = auVar105._16_4_ * 0.0;
    auVar44._20_4_ = auVar105._20_4_ * 0.0;
    auVar44._24_4_ = auVar105._24_4_ * 0.0;
    auVar44._28_4_ = auVar104._28_4_;
    auVar45._4_4_ = auVar119._4_4_ * fVar190;
    auVar45._0_4_ = auVar119._0_4_ * fVar160;
    auVar45._8_4_ = auVar119._8_4_ * fVar192;
    auVar45._12_4_ = auVar119._12_4_ * fVar194;
    auVar45._16_4_ = auVar119._16_4_ * 0.0;
    auVar45._20_4_ = auVar119._20_4_ * 0.0;
    auVar45._24_4_ = auVar119._24_4_ * 0.0;
    auVar45._28_4_ = auVar105._28_4_;
    auVar5 = vfmadd231ps_fma(auVar249,auVar115,ZEXT1632(auVar95));
    auVar91 = vfmadd231ps_fma(auVar141,auVar115,ZEXT1632(auVar92));
    auVar99 = vfmadd231ps_fma(auVar44,auVar115,auVar116);
    auVar95 = vfmadd231ps_fma(auVar45,auVar115,auVar106);
    auVar46._28_4_ = auVar117._28_4_;
    auVar46._0_28_ =
         ZEXT1628(CONCAT412(auVar91._12_4_ * fVar194,
                            CONCAT48(auVar91._8_4_ * fVar192,
                                     CONCAT44(auVar91._4_4_ * fVar190,auVar91._0_4_ * fVar160))));
    auVar92 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar194 * auVar5._12_4_,
                                                 CONCAT48(fVar192 * auVar5._8_4_,
                                                          CONCAT44(fVar190 * auVar5._4_4_,
                                                                   fVar160 * auVar5._0_4_)))),
                              auVar115,ZEXT1632(auVar94));
    auVar104 = vfmadd231ps_avx512vl(auVar46,auVar115,auVar120);
    auVar105 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar99._12_4_ * fVar194,
                                             CONCAT48(auVar99._8_4_ * fVar192,
                                                      CONCAT44(auVar99._4_4_ * fVar190,
                                                               auVar99._0_4_ * fVar160)))),auVar115,
                          auVar121);
    auVar116 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar95._12_4_ * fVar194,
                                             CONCAT48(auVar95._8_4_ * fVar192,
                                                      CONCAT44(auVar95._4_4_ * fVar190,
                                                               auVar95._0_4_ * fVar160)))),auVar122,
                          auVar115);
    auVar115 = vsubps_avx(ZEXT1632(auVar5),ZEXT1632(auVar94));
    auVar106 = vsubps_avx512vl(ZEXT1632(auVar91),auVar120);
    auVar117 = vsubps_avx512vl(ZEXT1632(auVar99),auVar121);
    auVar118 = vsubps_avx512vl(ZEXT1632(auVar95),auVar122);
    auVar258._0_4_ = fVar162 * auVar115._0_4_ * 3.0;
    auVar258._4_4_ = fVar162 * auVar115._4_4_ * 3.0;
    auVar258._8_4_ = fVar162 * auVar115._8_4_ * 3.0;
    auVar258._12_4_ = fVar162 * auVar115._12_4_ * 3.0;
    auVar258._16_4_ = fVar162 * auVar115._16_4_ * 3.0;
    auVar258._20_4_ = fVar162 * auVar115._20_4_ * 3.0;
    auVar258._24_4_ = fVar162 * auVar115._24_4_ * 3.0;
    auVar258._28_4_ = 0;
    auVar259._0_4_ = fVar162 * auVar106._0_4_ * 3.0;
    auVar259._4_4_ = fVar162 * auVar106._4_4_ * 3.0;
    auVar259._8_4_ = fVar162 * auVar106._8_4_ * 3.0;
    auVar259._12_4_ = fVar162 * auVar106._12_4_ * 3.0;
    auVar259._16_4_ = fVar162 * auVar106._16_4_ * 3.0;
    auVar259._20_4_ = fVar162 * auVar106._20_4_ * 3.0;
    auVar259._24_4_ = fVar162 * auVar106._24_4_ * 3.0;
    auVar259._28_4_ = 0;
    auVar47._4_4_ = fVar162 * auVar117._4_4_ * 3.0;
    auVar47._0_4_ = fVar162 * auVar117._0_4_ * 3.0;
    auVar47._8_4_ = fVar162 * auVar117._8_4_ * 3.0;
    auVar47._12_4_ = fVar162 * auVar117._12_4_ * 3.0;
    auVar47._16_4_ = fVar162 * auVar117._16_4_ * 3.0;
    auVar47._20_4_ = fVar162 * auVar117._20_4_ * 3.0;
    auVar47._24_4_ = fVar162 * auVar117._24_4_ * 3.0;
    auVar47._28_4_ = auVar119._28_4_;
    fVar160 = auVar118._0_4_ * 3.0 * fVar162;
    fVar190 = auVar118._4_4_ * 3.0 * fVar162;
    auVar48._4_4_ = fVar190;
    auVar48._0_4_ = fVar160;
    fVar192 = auVar118._8_4_ * 3.0 * fVar162;
    auVar48._8_4_ = fVar192;
    fVar194 = auVar118._12_4_ * 3.0 * fVar162;
    auVar48._12_4_ = fVar194;
    fVar196 = auVar118._16_4_ * 3.0 * fVar162;
    auVar48._16_4_ = fVar196;
    fVar198 = auVar118._20_4_ * 3.0 * fVar162;
    auVar48._20_4_ = fVar198;
    fVar220 = auVar118._24_4_ * 3.0 * fVar162;
    auVar48._24_4_ = fVar220;
    auVar48._28_4_ = fVar162;
    auVar94 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
    in_ZMM31 = ZEXT1664(auVar94);
    auVar119 = vpermt2ps_avx512vl(ZEXT1632(auVar92),_DAT_01feed00,ZEXT1632(auVar94));
    auVar120 = vpermt2ps_avx512vl(auVar104,_DAT_01feed00,ZEXT1632(auVar94));
    auVar106 = ZEXT1632(auVar94);
    auVar121 = vpermt2ps_avx512vl(auVar105,_DAT_01feed00,auVar106);
    auVar246._0_4_ = auVar116._0_4_ + fVar160;
    auVar246._4_4_ = auVar116._4_4_ + fVar190;
    auVar246._8_4_ = auVar116._8_4_ + fVar192;
    auVar246._12_4_ = auVar116._12_4_ + fVar194;
    auVar246._16_4_ = auVar116._16_4_ + fVar196;
    auVar246._20_4_ = auVar116._20_4_ + fVar198;
    auVar246._24_4_ = auVar116._24_4_ + fVar220;
    auVar246._28_4_ = auVar116._28_4_ + fVar162;
    auVar115 = vmaxps_avx(auVar116,auVar246);
    auVar122 = vminps_avx512vl(auVar116,auVar246);
    auVar123 = vpermt2ps_avx512vl(auVar116,_DAT_01feed00,auVar106);
    auVar124 = vpermt2ps_avx512vl(auVar258,_DAT_01feed00,auVar106);
    auVar125 = vpermt2ps_avx512vl(auVar259,_DAT_01feed00,auVar106);
    auVar137 = ZEXT1632(auVar94);
    auVar126 = vpermt2ps_avx512vl(auVar47,_DAT_01feed00,auVar137);
    auVar116 = vpermt2ps_avx512vl(auVar48,_DAT_01feed00,auVar137);
    auVar116 = vsubps_avx(auVar123,auVar116);
    auVar106 = vsubps_avx(auVar119,ZEXT1632(auVar92));
    auVar117 = vsubps_avx(auVar120,auVar104);
    auVar118 = vsubps_avx(auVar121,auVar105);
    auVar127 = vmulps_avx512vl(auVar117,auVar47);
    auVar127 = vfmsub231ps_avx512vl(auVar127,auVar259,auVar118);
    auVar128 = vmulps_avx512vl(auVar118,auVar258);
    auVar128 = vfmsub231ps_avx512vl(auVar128,auVar47,auVar106);
    auVar129 = vmulps_avx512vl(auVar106,auVar259);
    auVar129 = vfmsub231ps_avx512vl(auVar129,auVar258,auVar117);
    auVar129 = vmulps_avx512vl(auVar129,auVar129);
    auVar128 = vfmadd231ps_avx512vl(auVar129,auVar128,auVar128);
    auVar127 = vfmadd231ps_avx512vl(auVar128,auVar127,auVar127);
    auVar128 = vmulps_avx512vl(auVar118,auVar118);
    auVar128 = vfmadd231ps_avx512vl(auVar128,auVar117,auVar117);
    auVar128 = vfmadd231ps_avx512vl(auVar128,auVar106,auVar106);
    auVar129 = vrcp14ps_avx512vl(auVar128);
    auVar130 = vfnmadd213ps_avx512vl(auVar129,auVar128,auVar266);
    auVar129 = vfmadd132ps_avx512vl(auVar130,auVar129,auVar129);
    auVar127 = vmulps_avx512vl(auVar127,auVar129);
    auVar130 = vmulps_avx512vl(auVar117,auVar126);
    auVar130 = vfmsub231ps_avx512vl(auVar130,auVar125,auVar118);
    auVar131 = vmulps_avx512vl(auVar118,auVar124);
    auVar131 = vfmsub231ps_avx512vl(auVar131,auVar126,auVar106);
    auVar132 = vmulps_avx512vl(auVar106,auVar125);
    auVar132 = vfmsub231ps_avx512vl(auVar132,auVar124,auVar117);
    auVar132 = vmulps_avx512vl(auVar132,auVar132);
    auVar131 = vfmadd231ps_avx512vl(auVar132,auVar131,auVar131);
    auVar130 = vfmadd231ps_avx512vl(auVar131,auVar130,auVar130);
    auVar129 = vmulps_avx512vl(auVar130,auVar129);
    auVar127 = vmaxps_avx512vl(auVar127,auVar129);
    auVar127 = vsqrtps_avx512vl(auVar127);
    auVar129 = vmaxps_avx512vl(auVar116,auVar123);
    auVar115 = vmaxps_avx512vl(auVar115,auVar129);
    auVar129 = vaddps_avx512vl(auVar127,auVar115);
    auVar115 = vminps_avx(auVar116,auVar123);
    auVar115 = vminps_avx512vl(auVar122,auVar115);
    auVar115 = vsubps_avx512vl(auVar115,auVar127);
    auVar133._8_4_ = 0x3f800002;
    auVar133._0_8_ = 0x3f8000023f800002;
    auVar133._12_4_ = 0x3f800002;
    auVar133._16_4_ = 0x3f800002;
    auVar133._20_4_ = 0x3f800002;
    auVar133._24_4_ = 0x3f800002;
    auVar133._28_4_ = 0x3f800002;
    auVar116 = vmulps_avx512vl(auVar129,auVar133);
    auVar134._8_4_ = 0x3f7ffffc;
    auVar134._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar134._12_4_ = 0x3f7ffffc;
    auVar134._16_4_ = 0x3f7ffffc;
    auVar134._20_4_ = 0x3f7ffffc;
    auVar134._24_4_ = 0x3f7ffffc;
    auVar134._28_4_ = 0x3f7ffffc;
    local_a80 = vmulps_avx512vl(auVar115,auVar134);
    auVar115 = vmulps_avx512vl(auVar116,auVar116);
    auVar116 = vrsqrt14ps_avx512vl(auVar128);
    auVar239._8_4_ = 0xbf000000;
    auVar239._0_8_ = 0xbf000000bf000000;
    auVar239._12_4_ = 0xbf000000;
    auVar239._16_4_ = 0xbf000000;
    auVar239._20_4_ = 0xbf000000;
    auVar239._24_4_ = 0xbf000000;
    auVar239._28_4_ = 0xbf000000;
    auVar122 = vmulps_avx512vl(auVar128,auVar239);
    fVar160 = auVar116._0_4_;
    fVar190 = auVar116._4_4_;
    fVar192 = auVar116._8_4_;
    fVar194 = auVar116._12_4_;
    fVar162 = auVar116._16_4_;
    fVar196 = auVar116._20_4_;
    fVar198 = auVar116._24_4_;
    auVar49._4_4_ = fVar190 * fVar190 * fVar190 * auVar122._4_4_;
    auVar49._0_4_ = fVar160 * fVar160 * fVar160 * auVar122._0_4_;
    auVar49._8_4_ = fVar192 * fVar192 * fVar192 * auVar122._8_4_;
    auVar49._12_4_ = fVar194 * fVar194 * fVar194 * auVar122._12_4_;
    auVar49._16_4_ = fVar162 * fVar162 * fVar162 * auVar122._16_4_;
    auVar49._20_4_ = fVar196 * fVar196 * fVar196 * auVar122._20_4_;
    auVar49._24_4_ = fVar198 * fVar198 * fVar198 * auVar122._24_4_;
    auVar49._28_4_ = auVar129._28_4_;
    auVar135._8_4_ = 0x3fc00000;
    auVar135._0_8_ = 0x3fc000003fc00000;
    auVar135._12_4_ = 0x3fc00000;
    auVar135._16_4_ = 0x3fc00000;
    auVar135._20_4_ = 0x3fc00000;
    auVar135._24_4_ = 0x3fc00000;
    auVar135._28_4_ = 0x3fc00000;
    auVar116 = vfmadd231ps_avx512vl(auVar49,auVar116,auVar135);
    auVar122 = vmulps_avx512vl(auVar106,auVar116);
    auVar123 = vmulps_avx512vl(auVar117,auVar116);
    auVar127 = vmulps_avx512vl(auVar118,auVar116);
    auVar239 = ZEXT1632(auVar92);
    auVar128 = vsubps_avx512vl(auVar137,auVar239);
    auVar129 = vsubps_avx512vl(auVar137,auVar104);
    auVar130 = vsubps_avx512vl(auVar137,auVar105);
    auVar131 = vmulps_avx512vl(auVar265._0_32_,auVar130);
    auVar131 = vfmadd231ps_avx512vl(auVar131,local_780,auVar129);
    auVar131 = vfmadd231ps_avx512vl(auVar131,local_760,auVar128);
    auVar132 = vmulps_avx512vl(auVar130,auVar130);
    auVar132 = vfmadd231ps_avx512vl(auVar132,auVar129,auVar129);
    auVar132 = vfmadd231ps_avx512vl(auVar132,auVar128,auVar128);
    auVar133 = vmulps_avx512vl(auVar265._0_32_,auVar127);
    auVar133 = vfmadd231ps_avx512vl(auVar133,auVar123,local_780);
    auVar133 = vfmadd231ps_avx512vl(auVar133,auVar122,local_760);
    auVar127 = vmulps_avx512vl(auVar130,auVar127);
    auVar123 = vfmadd231ps_avx512vl(auVar127,auVar129,auVar123);
    auVar122 = vfmadd231ps_avx512vl(auVar123,auVar128,auVar122);
    auVar123 = vmulps_avx512vl(auVar133,auVar133);
    auVar127 = vsubps_avx512vl(local_560,auVar123);
    auVar134 = vmulps_avx512vl(auVar133,auVar122);
    auVar131 = vsubps_avx512vl(auVar131,auVar134);
    auVar131 = vaddps_avx512vl(auVar131,auVar131);
    auVar134 = vmulps_avx512vl(auVar122,auVar122);
    auVar132 = vsubps_avx512vl(auVar132,auVar134);
    auVar115 = vsubps_avx512vl(auVar132,auVar115);
    local_7a0 = vmulps_avx512vl(auVar131,auVar131);
    auVar136._8_4_ = 0x40800000;
    auVar136._0_8_ = 0x4080000040800000;
    auVar136._12_4_ = 0x40800000;
    auVar136._16_4_ = 0x40800000;
    auVar136._20_4_ = 0x40800000;
    auVar136._24_4_ = 0x40800000;
    auVar136._28_4_ = 0x40800000;
    _local_7c0 = vmulps_avx512vl(auVar127,auVar136);
    auVar134 = vmulps_avx512vl(_local_7c0,auVar115);
    auVar134 = vsubps_avx512vl(local_7a0,auVar134);
    uVar83 = vcmpps_avx512vl(auVar134,auVar137,5);
    bVar75 = (byte)uVar83;
    fVar160 = (float)local_9c0._0_4_;
    fVar190 = (float)local_9c0._4_4_;
    fVar192 = fStack_9b8;
    fVar194 = fStack_9b4;
    fVar162 = fStack_9b0;
    fVar196 = fStack_9ac;
    fVar198 = fStack_9a8;
    fVar220 = fStack_9a4;
    if (bVar75 == 0) {
LAB_01d511b0:
      auVar265 = ZEXT3264(local_a00);
      auVar260 = ZEXT3264(local_aa0);
      auVar261 = ZEXT3264(local_ac0);
      auVar251 = ZEXT3264(local_860);
      auVar240 = ZEXT3264(local_9e0);
      auVar262 = ZEXT3264(local_ae0);
      auVar263 = ZEXT3264(local_b00);
      auVar264 = ZEXT3264(local_b20);
    }
    else {
      local_740._0_32_ = auVar132;
      auVar134 = vsqrtps_avx512vl(auVar134);
      auVar135 = vaddps_avx512vl(auVar127,auVar127);
      local_840 = vrcp14ps_avx512vl(auVar135);
      in_ZMM31 = ZEXT3264(local_840);
      auVar136 = vfnmadd213ps_avx512vl(local_840,auVar135,auVar266);
      auVar136 = vfmadd132ps_avx512vl(auVar136,local_840,local_840);
      auVar266._8_4_ = 0x80000000;
      auVar266._0_8_ = 0x8000000080000000;
      auVar266._12_4_ = 0x80000000;
      auVar266._16_4_ = 0x80000000;
      auVar266._20_4_ = 0x80000000;
      auVar266._24_4_ = 0x80000000;
      auVar266._28_4_ = 0x80000000;
      local_9a0 = vxorps_avx512vl(auVar131,auVar266);
      auVar137 = vsubps_avx512vl(local_9a0,auVar134);
      local_a40 = vmulps_avx512vl(auVar137,auVar136);
      auVar134 = vsubps_avx512vl(auVar134,auVar131);
      local_7e0 = vmulps_avx512vl(auVar134,auVar136);
      auVar134 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar136 = vblendmps_avx512vl(auVar134,local_a40);
      auVar138._0_4_ =
           (uint)(bVar75 & 1) * auVar136._0_4_ | (uint)!(bool)(bVar75 & 1) * auVar134._0_4_;
      bVar11 = (bool)((byte)(uVar83 >> 1) & 1);
      auVar138._4_4_ = (uint)bVar11 * auVar136._4_4_ | (uint)!bVar11 * auVar134._4_4_;
      bVar11 = (bool)((byte)(uVar83 >> 2) & 1);
      auVar138._8_4_ = (uint)bVar11 * auVar136._8_4_ | (uint)!bVar11 * auVar134._8_4_;
      bVar11 = (bool)((byte)(uVar83 >> 3) & 1);
      auVar138._12_4_ = (uint)bVar11 * auVar136._12_4_ | (uint)!bVar11 * auVar134._12_4_;
      bVar11 = (bool)((byte)(uVar83 >> 4) & 1);
      auVar138._16_4_ = (uint)bVar11 * auVar136._16_4_ | (uint)!bVar11 * auVar134._16_4_;
      bVar11 = (bool)((byte)(uVar83 >> 5) & 1);
      auVar138._20_4_ = (uint)bVar11 * auVar136._20_4_ | (uint)!bVar11 * auVar134._20_4_;
      bVar11 = (bool)((byte)(uVar83 >> 6) & 1);
      auVar138._24_4_ = (uint)bVar11 * auVar136._24_4_ | (uint)!bVar11 * auVar134._24_4_;
      bVar11 = SUB81(uVar83 >> 7,0);
      auVar138._28_4_ = (uint)bVar11 * auVar136._28_4_ | (uint)!bVar11 * auVar134._28_4_;
      auVar134 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar136 = vblendmps_avx512vl(auVar134,local_7e0);
      auVar139._0_4_ =
           (uint)(bVar75 & 1) * auVar136._0_4_ | (uint)!(bool)(bVar75 & 1) * auVar134._0_4_;
      bVar11 = (bool)((byte)(uVar83 >> 1) & 1);
      auVar139._4_4_ = (uint)bVar11 * auVar136._4_4_ | (uint)!bVar11 * auVar134._4_4_;
      bVar11 = (bool)((byte)(uVar83 >> 2) & 1);
      auVar139._8_4_ = (uint)bVar11 * auVar136._8_4_ | (uint)!bVar11 * auVar134._8_4_;
      bVar11 = (bool)((byte)(uVar83 >> 3) & 1);
      auVar139._12_4_ = (uint)bVar11 * auVar136._12_4_ | (uint)!bVar11 * auVar134._12_4_;
      bVar11 = (bool)((byte)(uVar83 >> 4) & 1);
      auVar139._16_4_ = (uint)bVar11 * auVar136._16_4_ | (uint)!bVar11 * auVar134._16_4_;
      bVar11 = (bool)((byte)(uVar83 >> 5) & 1);
      auVar139._20_4_ = (uint)bVar11 * auVar136._20_4_ | (uint)!bVar11 * auVar134._20_4_;
      bVar11 = (bool)((byte)(uVar83 >> 6) & 1);
      auVar139._24_4_ = (uint)bVar11 * auVar136._24_4_ | (uint)!bVar11 * auVar134._24_4_;
      bVar11 = SUB81(uVar83 >> 7,0);
      auVar139._28_4_ = (uint)bVar11 * auVar136._28_4_ | (uint)!bVar11 * auVar134._28_4_;
      auVar134 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar123,auVar134);
      local_800 = vmaxps_avx512vl(local_580,auVar134);
      auVar38._8_4_ = 0x36000000;
      auVar38._0_8_ = 0x3600000036000000;
      auVar38._12_4_ = 0x36000000;
      auVar38._16_4_ = 0x36000000;
      auVar38._20_4_ = 0x36000000;
      auVar38._24_4_ = 0x36000000;
      auVar38._28_4_ = 0x36000000;
      local_820 = vmulps_avx512vl(local_800,auVar38);
      vandps_avx512vl(auVar127,auVar134);
      uVar78 = vcmpps_avx512vl(local_820,local_820,1);
      uVar83 = uVar83 & uVar78;
      bVar79 = (byte)uVar83;
      if (bVar79 != 0) {
        uVar78 = vcmpps_avx512vl(auVar115,_DAT_01faff00,2);
        auVar115 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar123 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar127 = vblendmps_avx512vl(auVar115,auVar123);
        bVar80 = (byte)uVar78;
        uVar90 = (uint)(bVar80 & 1) * auVar127._0_4_ | (uint)!(bool)(bVar80 & 1) * local_820._0_4_;
        bVar11 = (bool)((byte)(uVar78 >> 1) & 1);
        uVar89 = (uint)bVar11 * auVar127._4_4_ | (uint)!bVar11 * local_820._4_4_;
        bVar11 = (bool)((byte)(uVar78 >> 2) & 1);
        uVar153 = (uint)bVar11 * auVar127._8_4_ | (uint)!bVar11 * local_820._8_4_;
        bVar11 = (bool)((byte)(uVar78 >> 3) & 1);
        uVar154 = (uint)bVar11 * auVar127._12_4_ | (uint)!bVar11 * local_820._12_4_;
        bVar11 = (bool)((byte)(uVar78 >> 4) & 1);
        uVar155 = (uint)bVar11 * auVar127._16_4_ | (uint)!bVar11 * local_820._16_4_;
        bVar11 = (bool)((byte)(uVar78 >> 5) & 1);
        uVar156 = (uint)bVar11 * auVar127._20_4_ | (uint)!bVar11 * local_820._20_4_;
        bVar11 = (bool)((byte)(uVar78 >> 6) & 1);
        uVar157 = (uint)bVar11 * auVar127._24_4_ | (uint)!bVar11 * local_820._24_4_;
        bVar11 = SUB81(uVar78 >> 7,0);
        uVar158 = (uint)bVar11 * auVar127._28_4_ | (uint)!bVar11 * local_820._28_4_;
        auVar138._0_4_ = (bVar79 & 1) * uVar90 | !(bool)(bVar79 & 1) * auVar138._0_4_;
        bVar11 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar138._4_4_ = bVar11 * uVar89 | !bVar11 * auVar138._4_4_;
        bVar11 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar138._8_4_ = bVar11 * uVar153 | !bVar11 * auVar138._8_4_;
        bVar11 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar138._12_4_ = bVar11 * uVar154 | !bVar11 * auVar138._12_4_;
        bVar11 = (bool)((byte)(uVar83 >> 4) & 1);
        auVar138._16_4_ = bVar11 * uVar155 | !bVar11 * auVar138._16_4_;
        bVar11 = (bool)((byte)(uVar83 >> 5) & 1);
        auVar138._20_4_ = bVar11 * uVar156 | !bVar11 * auVar138._20_4_;
        bVar11 = (bool)((byte)(uVar83 >> 6) & 1);
        auVar138._24_4_ = bVar11 * uVar157 | !bVar11 * auVar138._24_4_;
        bVar11 = SUB81(uVar83 >> 7,0);
        auVar138._28_4_ = bVar11 * uVar158 | !bVar11 * auVar138._28_4_;
        auVar115 = vblendmps_avx512vl(auVar123,auVar115);
        bVar11 = (bool)((byte)(uVar78 >> 1) & 1);
        bVar13 = (bool)((byte)(uVar78 >> 2) & 1);
        bVar14 = (bool)((byte)(uVar78 >> 3) & 1);
        bVar15 = (bool)((byte)(uVar78 >> 4) & 1);
        bVar16 = (bool)((byte)(uVar78 >> 5) & 1);
        bVar17 = (bool)((byte)(uVar78 >> 6) & 1);
        bVar18 = SUB81(uVar78 >> 7,0);
        auVar139._0_4_ =
             (uint)(bVar79 & 1) *
             ((uint)(bVar80 & 1) * auVar115._0_4_ | !(bool)(bVar80 & 1) * uVar90) |
             !(bool)(bVar79 & 1) * auVar139._0_4_;
        bVar12 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar139._4_4_ =
             (uint)bVar12 * ((uint)bVar11 * auVar115._4_4_ | !bVar11 * uVar89) |
             !bVar12 * auVar139._4_4_;
        bVar11 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar139._8_4_ =
             (uint)bVar11 * ((uint)bVar13 * auVar115._8_4_ | !bVar13 * uVar153) |
             !bVar11 * auVar139._8_4_;
        bVar11 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar139._12_4_ =
             (uint)bVar11 * ((uint)bVar14 * auVar115._12_4_ | !bVar14 * uVar154) |
             !bVar11 * auVar139._12_4_;
        bVar11 = (bool)((byte)(uVar83 >> 4) & 1);
        auVar139._16_4_ =
             (uint)bVar11 * ((uint)bVar15 * auVar115._16_4_ | !bVar15 * uVar155) |
             !bVar11 * auVar139._16_4_;
        bVar11 = (bool)((byte)(uVar83 >> 5) & 1);
        auVar139._20_4_ =
             (uint)bVar11 * ((uint)bVar16 * auVar115._20_4_ | !bVar16 * uVar156) |
             !bVar11 * auVar139._20_4_;
        bVar11 = (bool)((byte)(uVar83 >> 6) & 1);
        auVar139._24_4_ =
             (uint)bVar11 * ((uint)bVar17 * auVar115._24_4_ | !bVar17 * uVar157) |
             !bVar11 * auVar139._24_4_;
        bVar11 = SUB81(uVar83 >> 7,0);
        auVar139._28_4_ =
             (uint)bVar11 * ((uint)bVar18 * auVar115._28_4_ | !bVar18 * uVar158) |
             !bVar11 * auVar139._28_4_;
        bVar75 = (~bVar79 | bVar80) & bVar75;
      }
      if ((bVar75 & 0x7f) == 0) {
        auVar115 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar173 = ZEXT3264(auVar115);
        goto LAB_01d511b0;
      }
      auVar115 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar123 = vxorps_avx512vl(auVar126,auVar115);
      auVar124 = vxorps_avx512vl(auVar124,auVar115);
      uVar90 = *(uint *)(ray + k * 4 + 0x200);
      auVar125 = vxorps_avx512vl(auVar125,auVar115);
      auVar94 = vsubss_avx512f(ZEXT416(uVar90),ZEXT416((uint)local_970._0_4_));
      auVar126 = vbroadcastss_avx512vl(auVar94);
      auVar126 = vminps_avx512vl(auVar126,auVar139);
      auVar73._4_4_ = fStack_59c;
      auVar73._0_4_ = local_5a0;
      auVar73._8_4_ = fStack_598;
      auVar73._12_4_ = fStack_594;
      auVar73._16_4_ = fStack_590;
      auVar73._20_4_ = fStack_58c;
      auVar73._24_4_ = fStack_588;
      auVar73._28_4_ = fStack_584;
      auVar127 = vmaxps_avx512vl(auVar73,auVar138);
      auVar130 = vmulps_avx512vl(auVar130,auVar47);
      auVar129 = vfmadd213ps_avx512vl(auVar129,auVar259,auVar130);
      auVar94 = vfmadd213ps_fma(auVar128,auVar258,auVar129);
      in_ZMM31 = ZEXT3264(local_a00);
      auVar128 = vmulps_avx512vl(local_a00,auVar47);
      auVar128 = vfmadd231ps_avx512vl(auVar128,local_780,auVar259);
      auVar128 = vfmadd231ps_avx512vl(auVar128,local_760,auVar258);
      auVar129 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar128,auVar129);
      auVar130 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar26 = vcmpps_avx512vl(auVar129,auVar130,1);
      auVar134 = vxorps_avx512vl(ZEXT1632(auVar94),auVar115);
      auVar136 = vrcp14ps_avx512vl(auVar128);
      auVar137 = vxorps_avx512vl(auVar128,auVar115);
      auVar140 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar141 = vfnmadd213ps_avx512vl(auVar136,auVar128,auVar140);
      auVar94 = vfmadd132ps_fma(auVar141,auVar136,auVar136);
      fVar174 = auVar94._0_4_ * auVar134._0_4_;
      fVar191 = auVar94._4_4_ * auVar134._4_4_;
      auVar50._4_4_ = fVar191;
      auVar50._0_4_ = fVar174;
      fVar193 = auVar94._8_4_ * auVar134._8_4_;
      auVar50._8_4_ = fVar193;
      fVar195 = auVar94._12_4_ * auVar134._12_4_;
      auVar50._12_4_ = fVar195;
      fVar197 = auVar134._16_4_ * 0.0;
      auVar50._16_4_ = fVar197;
      fVar199 = auVar134._20_4_ * 0.0;
      auVar50._20_4_ = fVar199;
      fVar200 = auVar134._24_4_ * 0.0;
      auVar50._24_4_ = fVar200;
      auVar50._28_4_ = auVar134._28_4_;
      uVar27 = vcmpps_avx512vl(auVar128,auVar137,1);
      bVar79 = (byte)uVar26 | (byte)uVar27;
      auVar255._8_4_ = 0xff800000;
      auVar255._0_8_ = 0xff800000ff800000;
      auVar255._12_4_ = 0xff800000;
      auVar255._16_4_ = 0xff800000;
      auVar255._20_4_ = 0xff800000;
      auVar255._24_4_ = 0xff800000;
      auVar255._28_4_ = 0xff800000;
      auVar141 = vblendmps_avx512vl(auVar50,auVar255);
      auVar142._0_4_ =
           (uint)(bVar79 & 1) * auVar141._0_4_ | (uint)!(bool)(bVar79 & 1) * auVar136._0_4_;
      bVar11 = (bool)(bVar79 >> 1 & 1);
      auVar142._4_4_ = (uint)bVar11 * auVar141._4_4_ | (uint)!bVar11 * auVar136._4_4_;
      bVar11 = (bool)(bVar79 >> 2 & 1);
      auVar142._8_4_ = (uint)bVar11 * auVar141._8_4_ | (uint)!bVar11 * auVar136._8_4_;
      bVar11 = (bool)(bVar79 >> 3 & 1);
      auVar142._12_4_ = (uint)bVar11 * auVar141._12_4_ | (uint)!bVar11 * auVar136._12_4_;
      bVar11 = (bool)(bVar79 >> 4 & 1);
      auVar142._16_4_ = (uint)bVar11 * auVar141._16_4_ | (uint)!bVar11 * auVar136._16_4_;
      bVar11 = (bool)(bVar79 >> 5 & 1);
      auVar142._20_4_ = (uint)bVar11 * auVar141._20_4_ | (uint)!bVar11 * auVar136._20_4_;
      bVar11 = (bool)(bVar79 >> 6 & 1);
      auVar142._24_4_ = (uint)bVar11 * auVar141._24_4_ | (uint)!bVar11 * auVar136._24_4_;
      auVar142._28_4_ =
           (uint)(bVar79 >> 7) * auVar141._28_4_ | (uint)!(bool)(bVar79 >> 7) * auVar136._28_4_;
      auVar136 = vmaxps_avx512vl(auVar127,auVar142);
      uVar27 = vcmpps_avx512vl(auVar128,auVar137,6);
      bVar79 = (byte)uVar26 | (byte)uVar27;
      auVar143._0_4_ = (uint)(bVar79 & 1) * 0x7f800000 | (uint)!(bool)(bVar79 & 1) * (int)fVar174;
      bVar11 = (bool)(bVar79 >> 1 & 1);
      auVar143._4_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * (int)fVar191;
      bVar11 = (bool)(bVar79 >> 2 & 1);
      auVar143._8_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * (int)fVar193;
      bVar11 = (bool)(bVar79 >> 3 & 1);
      auVar143._12_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * (int)fVar195;
      bVar11 = (bool)(bVar79 >> 4 & 1);
      auVar143._16_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * (int)fVar197;
      bVar11 = (bool)(bVar79 >> 5 & 1);
      auVar143._20_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * (int)fVar199;
      bVar11 = (bool)(bVar79 >> 6 & 1);
      auVar143._24_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * (int)fVar200;
      auVar143._28_4_ =
           (uint)(bVar79 >> 7) * 0x7f800000 | (uint)!(bool)(bVar79 >> 7) * auVar134._28_4_;
      auVar126 = vminps_avx512vl(auVar126,auVar143);
      auVar94 = vxorps_avx512vl(auVar127._0_16_,auVar127._0_16_);
      auVar119 = vsubps_avx512vl(ZEXT1632(auVar94),auVar119);
      auVar120 = vsubps_avx512vl(ZEXT1632(auVar94),auVar120);
      auVar127 = ZEXT1632(auVar94);
      auVar121 = vsubps_avx512vl(auVar127,auVar121);
      auVar121 = vmulps_avx512vl(auVar121,auVar123);
      auVar120 = vfmadd231ps_avx512vl(auVar121,auVar125,auVar120);
      auVar119 = vfmadd231ps_avx512vl(auVar120,auVar124,auVar119);
      auVar120 = vmulps_avx512vl(local_a00,auVar123);
      auVar120 = vfmadd231ps_avx512vl(auVar120,local_780,auVar125);
      auVar120 = vfmadd231ps_avx512vl(auVar120,local_760,auVar124);
      vandps_avx512vl(auVar120,auVar129);
      uVar26 = vcmpps_avx512vl(auVar120,auVar130,1);
      auVar119 = vxorps_avx512vl(auVar119,auVar115);
      auVar121 = vrcp14ps_avx512vl(auVar120);
      auVar115 = vxorps_avx512vl(auVar120,auVar115);
      auVar123 = vfnmadd213ps_avx512vl(auVar121,auVar120,auVar140);
      auVar94 = vfmadd132ps_fma(auVar123,auVar121,auVar121);
      fVar174 = auVar94._0_4_ * auVar119._0_4_;
      fVar191 = auVar94._4_4_ * auVar119._4_4_;
      auVar51._4_4_ = fVar191;
      auVar51._0_4_ = fVar174;
      fVar193 = auVar94._8_4_ * auVar119._8_4_;
      auVar51._8_4_ = fVar193;
      fVar195 = auVar94._12_4_ * auVar119._12_4_;
      auVar51._12_4_ = fVar195;
      fVar197 = auVar119._16_4_ * 0.0;
      auVar51._16_4_ = fVar197;
      fVar199 = auVar119._20_4_ * 0.0;
      auVar51._20_4_ = fVar199;
      fVar200 = auVar119._24_4_ * 0.0;
      auVar51._24_4_ = fVar200;
      auVar51._28_4_ = auVar119._28_4_;
      uVar27 = vcmpps_avx512vl(auVar120,auVar115,1);
      bVar79 = (byte)uVar26 | (byte)uVar27;
      auVar123 = vblendmps_avx512vl(auVar51,auVar255);
      auVar144._0_4_ =
           (uint)(bVar79 & 1) * auVar123._0_4_ | (uint)!(bool)(bVar79 & 1) * auVar121._0_4_;
      bVar11 = (bool)(bVar79 >> 1 & 1);
      auVar144._4_4_ = (uint)bVar11 * auVar123._4_4_ | (uint)!bVar11 * auVar121._4_4_;
      bVar11 = (bool)(bVar79 >> 2 & 1);
      auVar144._8_4_ = (uint)bVar11 * auVar123._8_4_ | (uint)!bVar11 * auVar121._8_4_;
      bVar11 = (bool)(bVar79 >> 3 & 1);
      auVar144._12_4_ = (uint)bVar11 * auVar123._12_4_ | (uint)!bVar11 * auVar121._12_4_;
      bVar11 = (bool)(bVar79 >> 4 & 1);
      auVar144._16_4_ = (uint)bVar11 * auVar123._16_4_ | (uint)!bVar11 * auVar121._16_4_;
      bVar11 = (bool)(bVar79 >> 5 & 1);
      auVar144._20_4_ = (uint)bVar11 * auVar123._20_4_ | (uint)!bVar11 * auVar121._20_4_;
      bVar11 = (bool)(bVar79 >> 6 & 1);
      auVar144._24_4_ = (uint)bVar11 * auVar123._24_4_ | (uint)!bVar11 * auVar121._24_4_;
      auVar144._28_4_ =
           (uint)(bVar79 >> 7) * auVar123._28_4_ | (uint)!(bool)(bVar79 >> 7) * auVar121._28_4_;
      _local_900 = vmaxps_avx(auVar136,auVar144);
      uVar27 = vcmpps_avx512vl(auVar120,auVar115,6);
      bVar79 = (byte)uVar26 | (byte)uVar27;
      auVar145._0_4_ = (uint)(bVar79 & 1) * 0x7f800000 | (uint)!(bool)(bVar79 & 1) * (int)fVar174;
      bVar11 = (bool)(bVar79 >> 1 & 1);
      auVar145._4_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * (int)fVar191;
      bVar11 = (bool)(bVar79 >> 2 & 1);
      auVar145._8_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * (int)fVar193;
      bVar11 = (bool)(bVar79 >> 3 & 1);
      auVar145._12_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * (int)fVar195;
      bVar11 = (bool)(bVar79 >> 4 & 1);
      auVar145._16_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * (int)fVar197;
      bVar11 = (bool)(bVar79 >> 5 & 1);
      auVar145._20_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * (int)fVar199;
      bVar11 = (bool)(bVar79 >> 6 & 1);
      auVar145._24_4_ = (uint)bVar11 * 0x7f800000 | (uint)!bVar11 * (int)fVar200;
      auVar145._28_4_ =
           (uint)(bVar79 >> 7) * 0x7f800000 | (uint)!(bool)(bVar79 >> 7) * auVar119._28_4_;
      local_620 = vminps_avx(auVar126,auVar145);
      uVar26 = vcmpps_avx512vl(_local_900,local_620,2);
      bVar75 = bVar75 & 0x7f & (byte)uVar26;
      if (bVar75 == 0) {
        auVar173 = ZEXT3264(auVar140);
        goto LAB_01d511b0;
      }
      auVar119 = vmaxps_avx512vl(auVar127,local_a80);
      auVar115 = vfmadd213ps_avx512vl(local_a40,auVar133,auVar122);
      fVar174 = auVar116._0_4_;
      fVar191 = auVar116._4_4_;
      auVar52._4_4_ = fVar191 * auVar115._4_4_;
      auVar52._0_4_ = fVar174 * auVar115._0_4_;
      fVar193 = auVar116._8_4_;
      auVar52._8_4_ = fVar193 * auVar115._8_4_;
      fVar195 = auVar116._12_4_;
      auVar52._12_4_ = fVar195 * auVar115._12_4_;
      fVar197 = auVar116._16_4_;
      auVar52._16_4_ = fVar197 * auVar115._16_4_;
      fVar199 = auVar116._20_4_;
      auVar52._20_4_ = fVar199 * auVar115._20_4_;
      fVar200 = auVar116._24_4_;
      auVar52._24_4_ = fVar200 * auVar115._24_4_;
      auVar52._28_4_ = auVar115._28_4_;
      auVar115 = vfmadd213ps_avx512vl(local_7e0,auVar133,auVar122);
      auVar53._4_4_ = fVar191 * auVar115._4_4_;
      auVar53._0_4_ = fVar174 * auVar115._0_4_;
      auVar53._8_4_ = fVar193 * auVar115._8_4_;
      auVar53._12_4_ = fVar195 * auVar115._12_4_;
      auVar53._16_4_ = fVar197 * auVar115._16_4_;
      auVar53._20_4_ = fVar199 * auVar115._20_4_;
      auVar53._24_4_ = fVar200 * auVar115._24_4_;
      auVar53._28_4_ = auVar144._28_4_;
      auVar115 = vminps_avx512vl(auVar52,auVar140);
      auVar120 = ZEXT832(0) << 0x20;
      auVar115 = vmaxps_avx(auVar115,ZEXT832(0) << 0x20);
      auVar121 = vminps_avx512vl(auVar53,auVar140);
      auVar54._4_4_ = (auVar115._4_4_ + 1.0) * 0.125;
      auVar54._0_4_ = (auVar115._0_4_ + 0.0) * 0.125;
      auVar54._8_4_ = (auVar115._8_4_ + 2.0) * 0.125;
      auVar54._12_4_ = (auVar115._12_4_ + 3.0) * 0.125;
      auVar54._16_4_ = (auVar115._16_4_ + 4.0) * 0.125;
      auVar54._20_4_ = (auVar115._20_4_ + 5.0) * 0.125;
      auVar54._24_4_ = (auVar115._24_4_ + 6.0) * 0.125;
      auVar54._28_4_ = auVar115._28_4_ + 7.0;
      auVar94 = vfmadd213ps_fma(auVar54,auVar245,auVar234);
      local_4e0 = ZEXT1632(auVar94);
      auVar115 = vmaxps_avx(auVar121,ZEXT832(0) << 0x20);
      auVar55._4_4_ = (auVar115._4_4_ + 1.0) * 0.125;
      auVar55._0_4_ = (auVar115._0_4_ + 0.0) * 0.125;
      auVar55._8_4_ = (auVar115._8_4_ + 2.0) * 0.125;
      auVar55._12_4_ = (auVar115._12_4_ + 3.0) * 0.125;
      auVar55._16_4_ = (auVar115._16_4_ + 4.0) * 0.125;
      auVar55._20_4_ = (auVar115._20_4_ + 5.0) * 0.125;
      auVar55._24_4_ = (auVar115._24_4_ + 6.0) * 0.125;
      auVar55._28_4_ = auVar115._28_4_ + 7.0;
      auVar94 = vfmadd213ps_fma(auVar55,auVar245,auVar234);
      local_500 = ZEXT1632(auVar94);
      auVar56._4_4_ = auVar119._4_4_ * auVar119._4_4_;
      auVar56._0_4_ = auVar119._0_4_ * auVar119._0_4_;
      auVar56._8_4_ = auVar119._8_4_ * auVar119._8_4_;
      auVar56._12_4_ = auVar119._12_4_ * auVar119._12_4_;
      auVar56._16_4_ = auVar119._16_4_ * auVar119._16_4_;
      auVar56._20_4_ = auVar119._20_4_ * auVar119._20_4_;
      auVar56._24_4_ = auVar119._24_4_ * auVar119._24_4_;
      auVar56._28_4_ = auVar119._28_4_;
      auVar115 = vsubps_avx(auVar132,auVar56);
      auVar57._4_4_ = auVar115._4_4_ * (float)local_7c0._4_4_;
      auVar57._0_4_ = auVar115._0_4_ * (float)local_7c0._0_4_;
      auVar57._8_4_ = auVar115._8_4_ * fStack_7b8;
      auVar57._12_4_ = auVar115._12_4_ * fStack_7b4;
      auVar57._16_4_ = auVar115._16_4_ * fStack_7b0;
      auVar57._20_4_ = auVar115._20_4_ * fStack_7ac;
      auVar57._24_4_ = auVar115._24_4_ * fStack_7a8;
      auVar57._28_4_ = auVar119._28_4_;
      auVar119 = vsubps_avx(local_7a0,auVar57);
      uVar26 = vcmpps_avx512vl(auVar119,ZEXT832(0) << 0x20,5);
      bVar79 = (byte)uVar26;
      auVar264 = ZEXT3264(local_b20);
      if (bVar79 == 0) {
        bVar79 = 0;
        auVar116 = ZEXT832(0) << 0x20;
        auVar106 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar121 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar123 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar119 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar146._8_4_ = 0x7f800000;
        auVar146._0_8_ = 0x7f8000007f800000;
        auVar146._12_4_ = 0x7f800000;
        auVar146._16_4_ = 0x7f800000;
        auVar146._20_4_ = 0x7f800000;
        auVar146._24_4_ = 0x7f800000;
        auVar146._28_4_ = 0x7f800000;
        auVar147._8_4_ = 0xff800000;
        auVar147._0_8_ = 0xff800000ff800000;
        auVar147._12_4_ = 0xff800000;
        auVar147._16_4_ = 0xff800000;
        auVar147._20_4_ = 0xff800000;
        auVar147._24_4_ = 0xff800000;
        auVar147._28_4_ = 0xff800000;
      }
      else {
        uVar83 = vcmpps_avx512vl(auVar119,auVar127,5);
        auVar119 = vsqrtps_avx(auVar119);
        auVar120 = vfnmadd213ps_avx512vl(auVar135,local_840,auVar140);
        auVar123 = vfmadd132ps_avx512vl(auVar120,local_840,local_840);
        auVar120 = vsubps_avx(local_9a0,auVar119);
        auVar124 = vmulps_avx512vl(auVar120,auVar123);
        auVar119 = vsubps_avx512vl(auVar119,auVar131);
        auVar125 = vmulps_avx512vl(auVar119,auVar123);
        auVar119 = vfmadd213ps_avx512vl(auVar133,auVar124,auVar122);
        auVar58._4_4_ = fVar191 * auVar119._4_4_;
        auVar58._0_4_ = fVar174 * auVar119._0_4_;
        auVar58._8_4_ = fVar193 * auVar119._8_4_;
        auVar58._12_4_ = fVar195 * auVar119._12_4_;
        auVar58._16_4_ = fVar197 * auVar119._16_4_;
        auVar58._20_4_ = fVar199 * auVar119._20_4_;
        auVar58._24_4_ = fVar200 * auVar119._24_4_;
        auVar58._28_4_ = auVar121._28_4_;
        auVar119 = vmulps_avx512vl(local_760,auVar124);
        auVar120 = vmulps_avx512vl(local_780,auVar124);
        auVar126 = vmulps_avx512vl(local_a00,auVar124);
        auVar121 = vfmadd213ps_avx512vl(auVar106,auVar58,auVar239);
        auVar121 = vsubps_avx512vl(auVar119,auVar121);
        auVar119 = vfmadd213ps_avx512vl(auVar117,auVar58,auVar104);
        auVar123 = vsubps_avx512vl(auVar120,auVar119);
        auVar94 = vfmadd213ps_fma(auVar58,auVar118,auVar105);
        auVar119 = vsubps_avx(auVar126,ZEXT1632(auVar94));
        auVar120 = vfmadd213ps_avx512vl(auVar133,auVar125,auVar122);
        auVar122 = vmulps_avx512vl(auVar116,auVar120);
        auVar116 = vmulps_avx512vl(local_760,auVar125);
        auVar126 = vmulps_avx512vl(local_780,auVar125);
        auVar127 = vmulps_avx512vl(local_a00,auVar125);
        auVar94 = vfmadd213ps_fma(auVar106,auVar122,auVar239);
        auVar120 = vsubps_avx(auVar116,ZEXT1632(auVar94));
        auVar94 = vfmadd213ps_fma(auVar117,auVar122,auVar104);
        auVar116 = vsubps_avx512vl(auVar126,ZEXT1632(auVar94));
        auVar94 = vfmadd213ps_fma(auVar118,auVar122,auVar105);
        auVar106 = vsubps_avx512vl(auVar127,ZEXT1632(auVar94));
        auVar214._8_4_ = 0x7f800000;
        auVar214._0_8_ = 0x7f8000007f800000;
        auVar214._12_4_ = 0x7f800000;
        auVar214._16_4_ = 0x7f800000;
        auVar214._20_4_ = 0x7f800000;
        auVar214._24_4_ = 0x7f800000;
        auVar214._28_4_ = 0x7f800000;
        auVar117 = vblendmps_avx512vl(auVar214,auVar124);
        bVar11 = (bool)((byte)uVar83 & 1);
        auVar146._0_4_ = (uint)bVar11 * auVar117._0_4_ | (uint)!bVar11 * auVar92._0_4_;
        bVar11 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar146._4_4_ = (uint)bVar11 * auVar117._4_4_ | (uint)!bVar11 * auVar92._4_4_;
        bVar11 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar146._8_4_ = (uint)bVar11 * auVar117._8_4_ | (uint)!bVar11 * auVar92._8_4_;
        bVar11 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar146._12_4_ = (uint)bVar11 * auVar117._12_4_ | (uint)!bVar11 * auVar92._12_4_;
        iVar1 = (uint)((byte)(uVar83 >> 4) & 1) * auVar117._16_4_;
        auVar146._16_4_ = iVar1;
        iVar2 = (uint)((byte)(uVar83 >> 5) & 1) * auVar117._20_4_;
        auVar146._20_4_ = iVar2;
        iVar3 = (uint)((byte)(uVar83 >> 6) & 1) * auVar117._24_4_;
        auVar146._24_4_ = iVar3;
        iVar4 = (uint)(byte)(uVar83 >> 7) * auVar117._28_4_;
        auVar146._28_4_ = iVar4;
        auVar215._8_4_ = 0xff800000;
        auVar215._0_8_ = 0xff800000ff800000;
        auVar215._12_4_ = 0xff800000;
        auVar215._16_4_ = 0xff800000;
        auVar215._20_4_ = 0xff800000;
        auVar215._24_4_ = 0xff800000;
        auVar215._28_4_ = 0xff800000;
        auVar117 = vblendmps_avx512vl(auVar215,auVar125);
        bVar11 = (bool)((byte)uVar83 & 1);
        auVar147._0_4_ = (uint)bVar11 * auVar117._0_4_ | (uint)!bVar11 * -0x800000;
        bVar11 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar147._4_4_ = (uint)bVar11 * auVar117._4_4_ | (uint)!bVar11 * -0x800000;
        bVar11 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar147._8_4_ = (uint)bVar11 * auVar117._8_4_ | (uint)!bVar11 * -0x800000;
        bVar11 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar147._12_4_ = (uint)bVar11 * auVar117._12_4_ | (uint)!bVar11 * -0x800000;
        bVar11 = (bool)((byte)(uVar83 >> 4) & 1);
        auVar147._16_4_ = (uint)bVar11 * auVar117._16_4_ | (uint)!bVar11 * -0x800000;
        bVar11 = (bool)((byte)(uVar83 >> 5) & 1);
        auVar147._20_4_ = (uint)bVar11 * auVar117._20_4_ | (uint)!bVar11 * -0x800000;
        bVar11 = (bool)((byte)(uVar83 >> 6) & 1);
        auVar147._24_4_ = (uint)bVar11 * auVar117._24_4_ | (uint)!bVar11 * -0x800000;
        bVar11 = SUB81(uVar83 >> 7,0);
        auVar147._28_4_ = (uint)bVar11 * auVar117._28_4_ | (uint)!bVar11 * -0x800000;
        auVar39._8_4_ = 0x36000000;
        auVar39._0_8_ = 0x3600000036000000;
        auVar39._12_4_ = 0x36000000;
        auVar39._16_4_ = 0x36000000;
        auVar39._20_4_ = 0x36000000;
        auVar39._24_4_ = 0x36000000;
        auVar39._28_4_ = 0x36000000;
        auVar117 = vmulps_avx512vl(local_800,auVar39);
        uVar78 = vcmpps_avx512vl(auVar117,local_820,0xe);
        uVar83 = uVar83 & uVar78;
        bVar80 = (byte)uVar83;
        if (bVar80 != 0) {
          uVar78 = vcmpps_avx512vl(auVar115,ZEXT1632(ZEXT816(0) << 0x40),2);
          auVar254._8_4_ = 0x7f800000;
          auVar254._0_8_ = 0x7f8000007f800000;
          auVar254._12_4_ = 0x7f800000;
          auVar254._16_4_ = 0x7f800000;
          auVar254._20_4_ = 0x7f800000;
          auVar254._24_4_ = 0x7f800000;
          auVar254._28_4_ = 0x7f800000;
          auVar256._8_4_ = 0xff800000;
          auVar256._0_8_ = 0xff800000ff800000;
          auVar256._12_4_ = 0xff800000;
          auVar256._16_4_ = 0xff800000;
          auVar256._20_4_ = 0xff800000;
          auVar256._24_4_ = 0xff800000;
          auVar256._28_4_ = 0xff800000;
          auVar115 = vblendmps_avx512vl(auVar254,auVar256);
          bVar86 = (byte)uVar78;
          uVar89 = (uint)(bVar86 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar86 & 1) * auVar117._0_4_;
          bVar11 = (bool)((byte)(uVar78 >> 1) & 1);
          uVar153 = (uint)bVar11 * auVar115._4_4_ | (uint)!bVar11 * auVar117._4_4_;
          bVar11 = (bool)((byte)(uVar78 >> 2) & 1);
          uVar154 = (uint)bVar11 * auVar115._8_4_ | (uint)!bVar11 * auVar117._8_4_;
          bVar11 = (bool)((byte)(uVar78 >> 3) & 1);
          uVar155 = (uint)bVar11 * auVar115._12_4_ | (uint)!bVar11 * auVar117._12_4_;
          bVar11 = (bool)((byte)(uVar78 >> 4) & 1);
          uVar156 = (uint)bVar11 * auVar115._16_4_ | (uint)!bVar11 * auVar117._16_4_;
          bVar11 = (bool)((byte)(uVar78 >> 5) & 1);
          uVar157 = (uint)bVar11 * auVar115._20_4_ | (uint)!bVar11 * auVar117._20_4_;
          bVar11 = (bool)((byte)(uVar78 >> 6) & 1);
          uVar158 = (uint)bVar11 * auVar115._24_4_ | (uint)!bVar11 * auVar117._24_4_;
          bVar11 = SUB81(uVar78 >> 7,0);
          uVar159 = (uint)bVar11 * auVar115._28_4_ | (uint)!bVar11 * auVar117._28_4_;
          auVar146._0_4_ = (bVar80 & 1) * uVar89 | !(bool)(bVar80 & 1) * auVar146._0_4_;
          bVar11 = (bool)((byte)(uVar83 >> 1) & 1);
          auVar146._4_4_ = bVar11 * uVar153 | !bVar11 * auVar146._4_4_;
          bVar11 = (bool)((byte)(uVar83 >> 2) & 1);
          auVar146._8_4_ = bVar11 * uVar154 | !bVar11 * auVar146._8_4_;
          bVar11 = (bool)((byte)(uVar83 >> 3) & 1);
          auVar146._12_4_ = bVar11 * uVar155 | !bVar11 * auVar146._12_4_;
          bVar11 = (bool)((byte)(uVar83 >> 4) & 1);
          auVar146._16_4_ = bVar11 * uVar156 | (uint)!bVar11 * iVar1;
          bVar11 = (bool)((byte)(uVar83 >> 5) & 1);
          auVar146._20_4_ = bVar11 * uVar157 | (uint)!bVar11 * iVar2;
          bVar11 = (bool)((byte)(uVar83 >> 6) & 1);
          auVar146._24_4_ = bVar11 * uVar158 | (uint)!bVar11 * iVar3;
          bVar11 = SUB81(uVar83 >> 7,0);
          auVar146._28_4_ = bVar11 * uVar159 | (uint)!bVar11 * iVar4;
          auVar115 = vblendmps_avx512vl(auVar256,auVar254);
          bVar11 = (bool)((byte)(uVar78 >> 1) & 1);
          bVar13 = (bool)((byte)(uVar78 >> 2) & 1);
          bVar14 = (bool)((byte)(uVar78 >> 3) & 1);
          bVar15 = (bool)((byte)(uVar78 >> 4) & 1);
          bVar16 = (bool)((byte)(uVar78 >> 5) & 1);
          bVar17 = (bool)((byte)(uVar78 >> 6) & 1);
          bVar18 = SUB81(uVar78 >> 7,0);
          auVar147._0_4_ =
               (uint)(bVar80 & 1) *
               ((uint)(bVar86 & 1) * auVar115._0_4_ | !(bool)(bVar86 & 1) * uVar89) |
               !(bool)(bVar80 & 1) * auVar147._0_4_;
          bVar12 = (bool)((byte)(uVar83 >> 1) & 1);
          auVar147._4_4_ =
               (uint)bVar12 * ((uint)bVar11 * auVar115._4_4_ | !bVar11 * uVar153) |
               !bVar12 * auVar147._4_4_;
          bVar11 = (bool)((byte)(uVar83 >> 2) & 1);
          auVar147._8_4_ =
               (uint)bVar11 * ((uint)bVar13 * auVar115._8_4_ | !bVar13 * uVar154) |
               !bVar11 * auVar147._8_4_;
          bVar11 = (bool)((byte)(uVar83 >> 3) & 1);
          auVar147._12_4_ =
               (uint)bVar11 * ((uint)bVar14 * auVar115._12_4_ | !bVar14 * uVar155) |
               !bVar11 * auVar147._12_4_;
          bVar11 = (bool)((byte)(uVar83 >> 4) & 1);
          auVar147._16_4_ =
               (uint)bVar11 * ((uint)bVar15 * auVar115._16_4_ | !bVar15 * uVar156) |
               !bVar11 * auVar147._16_4_;
          bVar11 = (bool)((byte)(uVar83 >> 5) & 1);
          auVar147._20_4_ =
               (uint)bVar11 * ((uint)bVar16 * auVar115._20_4_ | !bVar16 * uVar157) |
               !bVar11 * auVar147._20_4_;
          bVar11 = (bool)((byte)(uVar83 >> 6) & 1);
          auVar147._24_4_ =
               (uint)bVar11 * ((uint)bVar17 * auVar115._24_4_ | !bVar17 * uVar158) |
               !bVar11 * auVar147._24_4_;
          bVar11 = SUB81(uVar83 >> 7,0);
          auVar147._28_4_ =
               (uint)bVar11 * ((uint)bVar18 * auVar115._28_4_ | !bVar18 * uVar159) |
               !bVar11 * auVar147._28_4_;
          bVar79 = (~bVar80 | bVar86) & bVar79;
        }
      }
      auVar265 = ZEXT3264(local_a00);
      auVar115 = vmulps_avx512vl(local_a00,auVar106);
      auVar94 = vfmadd231ps_fma(auVar115,local_780,auVar116);
      auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),local_760,auVar120);
      _local_540 = _local_900;
      local_520 = vminps_avx(local_620,auVar146);
      auVar250._8_4_ = 0x7fffffff;
      auVar250._0_8_ = 0x7fffffff7fffffff;
      auVar250._12_4_ = 0x7fffffff;
      auVar250._16_4_ = 0x7fffffff;
      auVar250._20_4_ = 0x7fffffff;
      auVar250._24_4_ = 0x7fffffff;
      auVar250._28_4_ = 0x7fffffff;
      auVar115 = vandps_avx(ZEXT1632(auVar94),auVar250);
      auVar116 = vmaxps_avx(_local_900,auVar147);
      auVar217._8_4_ = 0x3e99999a;
      auVar217._0_8_ = 0x3e99999a3e99999a;
      auVar217._12_4_ = 0x3e99999a;
      auVar217._16_4_ = 0x3e99999a;
      auVar217._20_4_ = 0x3e99999a;
      auVar217._24_4_ = 0x3e99999a;
      auVar217._28_4_ = 0x3e99999a;
      uVar26 = vcmpps_avx512vl(auVar115,auVar217,1);
      local_6c0._0_2_ = (short)uVar26;
      uVar26 = vcmpps_avx512vl(_local_900,local_520,2);
      bVar80 = (byte)uVar26 & bVar75;
      uVar27 = vcmpps_avx512vl(auVar116,local_620,2);
      auVar260 = ZEXT3264(local_aa0);
      auVar261 = ZEXT3264(local_ac0);
      auVar262 = ZEXT3264(local_ae0);
      auVar263 = ZEXT3264(local_b00);
      if ((bVar75 & ((byte)uVar27 | (byte)uVar26)) == 0) {
        auVar115 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar173 = ZEXT3264(auVar115);
        auVar251 = ZEXT3264(local_860);
        auVar240 = ZEXT3264(local_9e0);
      }
      else {
        auVar115 = vmulps_avx512vl(local_a00,auVar119);
        auVar94 = vfmadd213ps_fma(auVar123,local_780,auVar115);
        auVar94 = vfmadd213ps_fma(auVar121,local_760,ZEXT1632(auVar94));
        auVar115 = vandps_avx(ZEXT1632(auVar94),auVar250);
        uVar26 = vcmpps_avx512vl(auVar115,auVar217,1);
        bVar86 = (byte)uVar26 | ~bVar79;
        auVar169._8_4_ = 2;
        auVar169._0_8_ = 0x200000002;
        auVar169._12_4_ = 2;
        auVar169._16_4_ = 2;
        auVar169._20_4_ = 2;
        auVar169._24_4_ = 2;
        auVar169._28_4_ = 2;
        auVar40._8_4_ = 3;
        auVar40._0_8_ = 0x300000003;
        auVar40._12_4_ = 3;
        auVar40._16_4_ = 3;
        auVar40._20_4_ = 3;
        auVar40._24_4_ = 3;
        auVar40._28_4_ = 3;
        auVar115 = vpblendmd_avx512vl(auVar169,auVar40);
        local_5e0._0_4_ = (uint)(bVar86 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar86 & 1) * 2;
        bVar11 = (bool)(bVar86 >> 1 & 1);
        local_5e0._4_4_ = (uint)bVar11 * auVar115._4_4_ | (uint)!bVar11 * 2;
        bVar11 = (bool)(bVar86 >> 2 & 1);
        local_5e0._8_4_ = (uint)bVar11 * auVar115._8_4_ | (uint)!bVar11 * 2;
        bVar11 = (bool)(bVar86 >> 3 & 1);
        local_5e0._12_4_ = (uint)bVar11 * auVar115._12_4_ | (uint)!bVar11 * 2;
        bVar11 = (bool)(bVar86 >> 4 & 1);
        local_5e0._16_4_ = (uint)bVar11 * auVar115._16_4_ | (uint)!bVar11 * 2;
        bVar11 = (bool)(bVar86 >> 5 & 1);
        local_5e0._20_4_ = (uint)bVar11 * auVar115._20_4_ | (uint)!bVar11 * 2;
        bVar11 = (bool)(bVar86 >> 6 & 1);
        local_5e0._24_4_ = (uint)bVar11 * auVar115._24_4_ | (uint)!bVar11 * 2;
        local_5e0._28_4_ = (uint)(bVar86 >> 7) * auVar115._28_4_ | (uint)!(bool)(bVar86 >> 7) * 2;
        local_660 = vpbroadcastd_avx512vl();
        uVar26 = vpcmpd_avx512vl(local_660,local_5e0,5);
        bVar86 = (byte)uVar26 & bVar80;
        local_640 = auVar116;
        if (bVar86 == 0) {
          auVar171._4_4_ = uVar90;
          auVar171._0_4_ = uVar90;
          auVar171._8_4_ = uVar90;
          auVar171._12_4_ = uVar90;
          auVar171._16_4_ = uVar90;
          auVar171._20_4_ = uVar90;
          auVar171._24_4_ = uVar90;
          auVar171._28_4_ = uVar90;
        }
        else {
          local_600 = auVar116;
          auVar5 = vminps_avx(local_880._0_16_,local_8c0._0_16_);
          auVar94 = vmaxps_avx(local_880._0_16_,local_8c0._0_16_);
          auVar91 = vminps_avx(local_8a0._0_16_,local_8e0._0_16_);
          auVar99 = vminps_avx(auVar5,auVar91);
          auVar5 = vmaxps_avx(local_8a0._0_16_,local_8e0._0_16_);
          auVar91 = vmaxps_avx(auVar94,auVar5);
          auVar102._8_4_ = 0x7fffffff;
          auVar102._0_8_ = 0x7fffffff7fffffff;
          auVar102._12_4_ = 0x7fffffff;
          auVar94 = vandps_avx(auVar99,auVar102);
          auVar5 = vandps_avx(auVar91,auVar102);
          auVar94 = vmaxps_avx(auVar94,auVar5);
          auVar5 = vmovshdup_avx(auVar94);
          auVar5 = vmaxss_avx(auVar5,auVar94);
          auVar94 = vshufpd_avx(auVar94,auVar94,1);
          auVar94 = vmaxss_avx(auVar94,auVar5);
          fVar160 = auVar94._0_4_ * 1.9073486e-06;
          local_960 = vshufps_avx(auVar91,auVar91,0xff);
          local_6a0 = (float)local_9c0._0_4_ + (float)local_900._0_4_;
          fStack_69c = (float)local_9c0._4_4_ + (float)local_900._4_4_;
          fStack_698 = fStack_9b8 + fStack_8f8;
          fStack_694 = fStack_9b4 + fStack_8f4;
          fStack_690 = fStack_9b0 + fStack_8f0;
          fStack_68c = fStack_9ac + fStack_8ec;
          fStack_688 = fStack_9a8 + fStack_8e8;
          fStack_684 = fStack_9a4 + fStack_8e4;
          do {
            auVar170._8_4_ = 0x7f800000;
            auVar170._0_8_ = 0x7f8000007f800000;
            auVar170._12_4_ = 0x7f800000;
            auVar170._16_4_ = 0x7f800000;
            auVar170._20_4_ = 0x7f800000;
            auVar170._24_4_ = 0x7f800000;
            auVar170._28_4_ = 0x7f800000;
            auVar115 = vblendmps_avx512vl(auVar170,_local_900);
            auVar149._0_4_ =
                 (uint)(bVar86 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar86 & 1) * 0x7f800000;
            bVar11 = (bool)(bVar86 >> 1 & 1);
            auVar149._4_4_ = (uint)bVar11 * auVar115._4_4_ | (uint)!bVar11 * 0x7f800000;
            bVar11 = (bool)(bVar86 >> 2 & 1);
            auVar149._8_4_ = (uint)bVar11 * auVar115._8_4_ | (uint)!bVar11 * 0x7f800000;
            bVar11 = (bool)(bVar86 >> 3 & 1);
            auVar149._12_4_ = (uint)bVar11 * auVar115._12_4_ | (uint)!bVar11 * 0x7f800000;
            bVar11 = (bool)(bVar86 >> 4 & 1);
            auVar149._16_4_ = (uint)bVar11 * auVar115._16_4_ | (uint)!bVar11 * 0x7f800000;
            bVar11 = (bool)(bVar86 >> 5 & 1);
            auVar149._20_4_ = (uint)bVar11 * auVar115._20_4_ | (uint)!bVar11 * 0x7f800000;
            auVar149._24_4_ =
                 (uint)(bVar86 >> 6) * auVar115._24_4_ | (uint)!(bool)(bVar86 >> 6) * 0x7f800000;
            auVar149._28_4_ = 0x7f800000;
            auVar115 = vshufps_avx(auVar149,auVar149,0xb1);
            auVar115 = vminps_avx(auVar149,auVar115);
            auVar116 = vshufpd_avx(auVar115,auVar115,5);
            auVar115 = vminps_avx(auVar115,auVar116);
            auVar116 = vpermpd_avx2(auVar115,0x4e);
            auVar115 = vminps_avx(auVar115,auVar116);
            uVar26 = vcmpps_avx512vl(auVar149,auVar115,0);
            bVar76 = (byte)uVar26 & bVar86;
            bVar77 = bVar86;
            if (bVar76 != 0) {
              bVar77 = bVar76;
            }
            iVar2 = 0;
            for (uVar90 = (uint)bVar77; (uVar90 & 1) == 0; uVar90 = uVar90 >> 1 | 0x80000000) {
              iVar2 = iVar2 + 1;
            }
            uVar90 = *(uint *)(local_4e0 + (uint)(iVar2 << 2));
            fVar190 = auVar25._0_4_;
            auVar94 = ZEXT416(*(uint *)(local_540 + (uint)(iVar2 << 2)));
            if ((float)local_a20._0_4_ < 0.0) {
              local_a80._0_16_ = ZEXT416(*(uint *)(local_540 + (uint)(iVar2 << 2)));
              fVar190 = sqrtf((float)local_a20._0_4_);
              auVar94 = local_a80._0_16_;
            }
            auVar94 = vinsertps_avx(auVar94,ZEXT416(uVar90),0x10);
            auVar173 = ZEXT1664(auVar94);
            lVar85 = 5;
            do {
              uVar161 = auVar173._0_4_;
              auVar163._4_4_ = uVar161;
              auVar163._0_4_ = uVar161;
              auVar163._8_4_ = uVar161;
              auVar163._12_4_ = uVar161;
              auVar5 = vfmadd132ps_fma(auVar163,ZEXT816(0) << 0x40,local_a10);
              auVar91 = auVar173._0_16_;
              auVar94 = vmovshdup_avx(auVar91);
              local_7e0._0_16_ = auVar94;
              fVar198 = 1.0 - auVar94._0_4_;
              auVar94 = vshufps_avx(auVar91,auVar91,0x55);
              fVar192 = auVar94._0_4_;
              auVar201._0_4_ = local_8c0._0_4_ * fVar192;
              fVar194 = auVar94._4_4_;
              auVar201._4_4_ = local_8c0._4_4_ * fVar194;
              fVar162 = auVar94._8_4_;
              auVar201._8_4_ = local_8c0._8_4_ * fVar162;
              fVar196 = auVar94._12_4_;
              auVar201._12_4_ = local_8c0._12_4_ * fVar196;
              _local_7c0 = ZEXT416((uint)fVar198);
              auVar222._4_4_ = fVar198;
              auVar222._0_4_ = fVar198;
              auVar222._8_4_ = fVar198;
              auVar222._12_4_ = fVar198;
              auVar94 = vfmadd231ps_fma(auVar201,auVar222,local_880._0_16_);
              auVar235._0_4_ = local_8a0._0_4_ * fVar192;
              auVar235._4_4_ = local_8a0._4_4_ * fVar194;
              auVar235._8_4_ = local_8a0._8_4_ * fVar162;
              auVar235._12_4_ = local_8a0._12_4_ * fVar196;
              auVar91 = vfmadd231ps_fma(auVar235,auVar222,local_8c0._0_16_);
              auVar241._0_4_ = fVar192 * (float)local_8e0._0_4_;
              auVar241._4_4_ = fVar194 * (float)local_8e0._4_4_;
              auVar241._8_4_ = fVar162 * fStack_8d8;
              auVar241._12_4_ = fVar196 * fStack_8d4;
              auVar99 = vfmadd231ps_fma(auVar241,auVar222,local_8a0._0_16_);
              auVar247._0_4_ = fVar192 * auVar91._0_4_;
              auVar247._4_4_ = fVar194 * auVar91._4_4_;
              auVar247._8_4_ = fVar162 * auVar91._8_4_;
              auVar247._12_4_ = fVar196 * auVar91._12_4_;
              auVar94 = vfmadd231ps_fma(auVar247,auVar222,auVar94);
              auVar202._0_4_ = fVar192 * auVar99._0_4_;
              auVar202._4_4_ = fVar194 * auVar99._4_4_;
              auVar202._8_4_ = fVar162 * auVar99._8_4_;
              auVar202._12_4_ = fVar196 * auVar99._12_4_;
              auVar91 = vfmadd231ps_fma(auVar202,auVar222,auVar91);
              auVar236._0_4_ = fVar192 * auVar91._0_4_;
              auVar236._4_4_ = fVar194 * auVar91._4_4_;
              auVar236._8_4_ = fVar162 * auVar91._8_4_;
              auVar236._12_4_ = fVar196 * auVar91._12_4_;
              auVar99 = vfmadd231ps_fma(auVar236,auVar94,auVar222);
              auVar94 = vsubps_avx(auVar91,auVar94);
              auVar103._8_4_ = 0x40400000;
              auVar103._0_8_ = 0x4040000040400000;
              auVar103._12_4_ = 0x40400000;
              auVar91 = vmulps_avx512vl(auVar94,auVar103);
              local_7a0._0_16_ = auVar99;
              auVar5 = vsubps_avx(auVar5,auVar99);
              auVar94 = vdpps_avx(auVar5,auVar5,0x7f);
              local_a80._0_16_ = auVar94;
              local_740 = auVar173;
              if (auVar94._0_4_ < 0.0) {
                auVar173._0_4_ = sqrtf(auVar94._0_4_);
                auVar173._4_60_ = extraout_var;
                auVar94 = auVar173._0_16_;
              }
              else {
                auVar94 = vsqrtss_avx(auVar94,auVar94);
              }
              local_800._0_16_ = vdpps_avx(auVar91,auVar91,0x7f);
              fVar192 = local_800._0_4_;
              auVar203._4_12_ = ZEXT812(0) << 0x20;
              auVar203._0_4_ = fVar192;
              local_a40._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar203);
              fVar194 = local_a40._0_4_;
              local_820._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar203);
              auVar29._8_4_ = 0x80000000;
              auVar29._0_8_ = 0x8000000080000000;
              auVar29._12_4_ = 0x80000000;
              auVar95 = vxorps_avx512vl(local_800._0_16_,auVar29);
              auVar99 = vfnmadd213ss_fma(local_820._0_16_,local_800._0_16_,ZEXT416(0x40000000));
              local_840._0_4_ = auVar99._0_4_;
              local_9a0._0_4_ = auVar94._0_4_;
              if (fVar192 < auVar95._0_4_) {
                fVar162 = sqrtf(fVar192);
                auVar94 = ZEXT416((uint)local_9a0._0_4_);
              }
              else {
                auVar99 = vsqrtss_avx(local_800._0_16_,local_800._0_16_);
                fVar162 = auVar99._0_4_;
              }
              fVar196 = local_a40._0_4_;
              fVar192 = fVar194 * 1.5 + fVar192 * -0.5 * fVar196 * fVar196 * fVar196;
              auVar164._0_4_ = auVar91._0_4_ * fVar192;
              auVar164._4_4_ = auVar91._4_4_ * fVar192;
              auVar164._8_4_ = auVar91._8_4_ * fVar192;
              auVar164._12_4_ = auVar91._12_4_ * fVar192;
              local_a40._0_16_ = vdpps_avx(auVar5,auVar164,0x7f);
              auVar92 = vaddss_avx512f(auVar94,ZEXT416(0x3f800000));
              auVar165._0_4_ = local_a40._0_4_ * local_a40._0_4_;
              auVar165._4_4_ = local_a40._4_4_ * local_a40._4_4_;
              auVar165._8_4_ = local_a40._8_4_ * local_a40._8_4_;
              auVar165._12_4_ = local_a40._12_4_ * local_a40._12_4_;
              auVar99 = vsubps_avx(local_a80._0_16_,auVar165);
              fVar194 = auVar99._0_4_;
              auVar176._4_12_ = ZEXT812(0) << 0x20;
              auVar176._0_4_ = fVar194;
              auVar95 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar176);
              auVar96 = vmulss_avx512f(auVar95,ZEXT416(0x3fc00000));
              auVar97 = vmulss_avx512f(auVar99,ZEXT416(0xbf000000));
              uVar88 = fVar194 == 0.0;
              uVar87 = fVar194 < 0.0;
              if ((bool)uVar87) {
                local_920._0_4_ = fVar162;
                local_940._0_4_ = auVar96._0_4_;
                local_950._4_4_ = fVar192;
                local_950._0_4_ = fVar192;
                fStack_948 = fVar192;
                fStack_944 = fVar192;
                local_930 = auVar95;
                fVar194 = sqrtf(fVar194);
                auVar97 = ZEXT416(auVar97._0_4_);
                auVar96 = ZEXT416((uint)local_940._0_4_);
                auVar94 = ZEXT416((uint)local_9a0._0_4_);
                auVar92 = ZEXT416(auVar92._0_4_);
                auVar95 = local_930;
                fVar192 = (float)local_950._0_4_;
                fVar196 = (float)local_950._4_4_;
                fVar198 = fStack_948;
                fVar220 = fStack_944;
                fVar162 = (float)local_920._0_4_;
              }
              else {
                auVar99 = vsqrtss_avx(auVar99,auVar99);
                fVar194 = auVar99._0_4_;
                fVar196 = fVar192;
                fVar198 = fVar192;
                fVar220 = fVar192;
              }
              auVar260 = ZEXT3264(local_aa0);
              auVar261 = ZEXT3264(local_ac0);
              auVar262 = ZEXT3264(local_ae0);
              auVar263 = ZEXT3264(local_b00);
              auVar264 = ZEXT3264(local_b20);
              auVar100 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),_local_7c0,local_7e0._0_16_)
              ;
              auVar99 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_7e0._0_16_,_local_7c0);
              fVar174 = auVar99._0_4_ * 6.0;
              fVar191 = local_7e0._0_4_ * 6.0;
              auVar223._0_4_ = fVar191 * (float)local_8e0._0_4_;
              auVar223._4_4_ = fVar191 * (float)local_8e0._4_4_;
              auVar223._8_4_ = fVar191 * fStack_8d8;
              auVar223._12_4_ = fVar191 * fStack_8d4;
              auVar204._4_4_ = fVar174;
              auVar204._0_4_ = fVar174;
              auVar204._8_4_ = fVar174;
              auVar204._12_4_ = fVar174;
              auVar99 = vfmadd132ps_fma(auVar204,auVar223,local_8a0._0_16_);
              fVar174 = auVar100._0_4_ * 6.0;
              auVar177._4_4_ = fVar174;
              auVar177._0_4_ = fVar174;
              auVar177._8_4_ = fVar174;
              auVar177._12_4_ = fVar174;
              auVar99 = vfmadd132ps_fma(auVar177,auVar99,local_8c0._0_16_);
              fVar174 = local_7c0._0_4_ * 6.0;
              auVar205._4_4_ = fVar174;
              auVar205._0_4_ = fVar174;
              auVar205._8_4_ = fVar174;
              auVar205._12_4_ = fVar174;
              auVar99 = vfmadd132ps_fma(auVar205,auVar99,local_880._0_16_);
              auVar178._0_4_ = auVar99._0_4_ * (float)local_800._0_4_;
              auVar178._4_4_ = auVar99._4_4_ * (float)local_800._0_4_;
              auVar178._8_4_ = auVar99._8_4_ * (float)local_800._0_4_;
              auVar178._12_4_ = auVar99._12_4_ * (float)local_800._0_4_;
              auVar99 = vdpps_avx(auVar91,auVar99,0x7f);
              fVar174 = auVar99._0_4_;
              auVar206._0_4_ = auVar91._0_4_ * fVar174;
              auVar206._4_4_ = auVar91._4_4_ * fVar174;
              auVar206._8_4_ = auVar91._8_4_ * fVar174;
              auVar206._12_4_ = auVar91._12_4_ * fVar174;
              auVar99 = vsubps_avx(auVar178,auVar206);
              fVar174 = (float)local_840._0_4_ * (float)local_820._0_4_;
              auVar100 = vmaxss_avx(ZEXT416((uint)fVar160),
                                    ZEXT416((uint)(local_740._0_4_ * fVar190 * 1.9073486e-06)));
              auVar30._8_4_ = 0x80000000;
              auVar30._0_8_ = 0x8000000080000000;
              auVar30._12_4_ = 0x80000000;
              auVar98 = vxorps_avx512vl(auVar91,auVar30);
              auVar179._0_4_ = fVar192 * auVar99._0_4_ * fVar174;
              auVar179._4_4_ = fVar196 * auVar99._4_4_ * fVar174;
              auVar179._8_4_ = fVar198 * auVar99._8_4_ * fVar174;
              auVar179._12_4_ = fVar220 * auVar99._12_4_ * fVar174;
              auVar99 = vdpps_avx(auVar98,auVar164,0x7f);
              auVar101 = vfmadd213ss_fma(auVar94,ZEXT416((uint)fVar160),auVar100);
              auVar94 = vdpps_avx(auVar5,auVar179,0x7f);
              vfmadd213ss_avx512f(auVar92,ZEXT416((uint)(fVar160 / fVar162)),auVar101);
              fVar192 = auVar99._0_4_ + auVar94._0_4_;
              auVar94 = vdpps_avx(local_a10,auVar164,0x7f);
              auVar99 = vdpps_avx(auVar5,auVar98,0x7f);
              auVar92 = vmulss_avx512f(auVar97,auVar95);
              auVar95 = vmulss_avx512f(auVar95,auVar95);
              auVar96 = vaddss_avx512f(auVar96,ZEXT416((uint)(auVar92._0_4_ * auVar95._0_4_)));
              auVar95 = vdpps_avx(auVar5,local_a10,0x7f);
              auVar97 = vfnmadd231ss_avx512f(auVar99,local_a40._0_16_,ZEXT416((uint)fVar192));
              auVar95 = vfnmadd231ss_avx512f(auVar95,local_a40._0_16_,auVar94);
              auVar99 = vpermilps_avx(local_7a0._0_16_,0xff);
              fVar194 = fVar194 - auVar99._0_4_;
              auVar92 = vshufps_avx(auVar91,auVar91,0xff);
              auVar99 = vfmsub213ss_fma(auVar97,auVar96,auVar92);
              auVar252._0_8_ = auVar99._0_8_ ^ 0x8000000080000000;
              auVar252._8_4_ = auVar99._8_4_ ^ 0x80000000;
              auVar252._12_4_ = auVar99._12_4_ ^ 0x80000000;
              auVar95 = ZEXT416((uint)(auVar95._0_4_ * auVar96._0_4_));
              auVar96 = vfmsub231ss_fma(ZEXT416((uint)(auVar94._0_4_ * auVar99._0_4_)),
                                        ZEXT416((uint)fVar192),auVar95);
              auVar99 = vinsertps_avx(auVar252,auVar95,0x1c);
              auVar242._0_8_ = auVar94._0_8_ ^ 0x8000000080000000;
              auVar242._8_4_ = auVar94._8_4_ ^ 0x80000000;
              auVar242._12_4_ = auVar94._12_4_ ^ 0x80000000;
              auVar95 = vinsertps_avx(ZEXT416((uint)fVar192),auVar242,0x10);
              auVar224._0_4_ = auVar96._0_4_;
              auVar224._4_4_ = auVar224._0_4_;
              auVar224._8_4_ = auVar224._0_4_;
              auVar224._12_4_ = auVar224._0_4_;
              auVar94 = vdivps_avx(auVar99,auVar224);
              auVar99 = vdivps_avx(auVar95,auVar224);
              auVar95 = vbroadcastss_avx512vl(local_a40._0_16_);
              auVar225._0_4_ = auVar95._0_4_ * auVar94._0_4_ + fVar194 * auVar99._0_4_;
              auVar225._4_4_ = auVar95._4_4_ * auVar94._4_4_ + fVar194 * auVar99._4_4_;
              auVar225._8_4_ = auVar95._8_4_ * auVar94._8_4_ + fVar194 * auVar99._8_4_;
              auVar225._12_4_ = auVar95._12_4_ * auVar94._12_4_ + fVar194 * auVar99._12_4_;
              auVar94 = vsubps_avx(local_740._0_16_,auVar225);
              auVar173 = ZEXT1664(auVar94);
              auVar31._8_4_ = 0x7fffffff;
              auVar31._0_8_ = 0x7fffffff7fffffff;
              auVar31._12_4_ = 0x7fffffff;
              auVar99 = vandps_avx512vl(local_a40._0_16_,auVar31);
              auVar99 = vucomiss_avx512f(auVar99);
              if (!(bool)uVar87 && !(bool)uVar88) {
                auVar99 = vaddss_avx512f(auVar100,auVar99);
                auVar99 = vfmadd231ss_fma(auVar99,local_960,ZEXT416(0x36000000));
                auVar32._8_4_ = 0x7fffffff;
                auVar32._0_8_ = 0x7fffffff7fffffff;
                auVar32._12_4_ = 0x7fffffff;
                auVar95 = vandps_avx512vl(ZEXT416((uint)fVar194),auVar32);
                if (auVar95._0_4_ < auVar99._0_4_) {
                  fVar190 = auVar94._0_4_ + (float)local_970._0_4_;
                  if ((fVar190 < fVar221) ||
                     (fVar192 = *(float *)(ray + k * 4 + 0x200), fVar192 < fVar190)) break;
                  auVar94 = vmovshdup_avx(auVar94);
                  fVar194 = auVar94._0_4_;
                  if ((fVar194 < 0.0) || (1.0 < fVar194)) break;
                  auVar94 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_a80._0_4_));
                  fVar162 = auVar94._0_4_;
                  pGVar8 = (context->scene->geometries).items[uVar84].ptr;
                  if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) break;
                  fVar162 = fVar162 * 1.5 +
                            (float)local_a80._0_4_ * -0.5 * fVar162 * fVar162 * fVar162;
                  auVar226._0_4_ = auVar5._0_4_ * fVar162;
                  auVar226._4_4_ = auVar5._4_4_ * fVar162;
                  auVar226._8_4_ = auVar5._8_4_ * fVar162;
                  auVar226._12_4_ = auVar5._12_4_ * fVar162;
                  auVar99 = vfmadd213ps_fma(auVar92,auVar226,auVar91);
                  auVar94 = vshufps_avx(auVar226,auVar226,0xc9);
                  auVar5 = vshufps_avx(auVar91,auVar91,0xc9);
                  auVar227._0_4_ = auVar226._0_4_ * auVar5._0_4_;
                  auVar227._4_4_ = auVar226._4_4_ * auVar5._4_4_;
                  auVar227._8_4_ = auVar226._8_4_ * auVar5._8_4_;
                  auVar227._12_4_ = auVar226._12_4_ * auVar5._12_4_;
                  auVar91 = vfmsub231ps_fma(auVar227,auVar91,auVar94);
                  auVar94 = vshufps_avx(auVar91,auVar91,0xc9);
                  auVar5 = vshufps_avx(auVar99,auVar99,0xc9);
                  auVar91 = vshufps_avx(auVar91,auVar91,0xd2);
                  auVar180._0_4_ = auVar99._0_4_ * auVar91._0_4_;
                  auVar180._4_4_ = auVar99._4_4_ * auVar91._4_4_;
                  auVar180._8_4_ = auVar99._8_4_ * auVar91._8_4_;
                  auVar180._12_4_ = auVar99._12_4_ * auVar91._12_4_;
                  auVar94 = vfmsub231ps_fma(auVar180,auVar94,auVar5);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x200) = fVar190;
                    uVar161 = vextractps_avx(auVar94,1);
                    *(undefined4 *)(ray + k * 4 + 0x300) = uVar161;
                    uVar161 = vextractps_avx(auVar94,2);
                    *(undefined4 *)(ray + k * 4 + 0x340) = uVar161;
                    *(int *)(ray + k * 4 + 0x380) = auVar94._0_4_;
                    *(float *)(ray + k * 4 + 0x3c0) = fVar194;
                    *(undefined4 *)(ray + k * 4 + 0x400) = 0;
                    *(uint *)(ray + k * 4 + 0x440) = uVar7;
                    *(uint *)(ray + k * 4 + 0x480) = uVar84;
                    *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                    break;
                  }
                  pRVar10 = context->user;
                  auVar240 = vbroadcastss_avx512f(ZEXT416(1));
                  local_340 = vpermps_avx512f(auVar240,auVar173);
                  auVar173 = vpermps_avx512f(auVar240,ZEXT1664(auVar94));
                  auVar240 = vbroadcastss_avx512f(ZEXT416(2));
                  local_3c0 = vpermps_avx512f(auVar240,ZEXT1664(auVar94));
                  local_380 = vbroadcastss_avx512f(auVar94);
                  local_400[0] = (RTCHitN)auVar173[0];
                  local_400[1] = (RTCHitN)auVar173[1];
                  local_400[2] = (RTCHitN)auVar173[2];
                  local_400[3] = (RTCHitN)auVar173[3];
                  local_400[4] = (RTCHitN)auVar173[4];
                  local_400[5] = (RTCHitN)auVar173[5];
                  local_400[6] = (RTCHitN)auVar173[6];
                  local_400[7] = (RTCHitN)auVar173[7];
                  local_400[8] = (RTCHitN)auVar173[8];
                  local_400[9] = (RTCHitN)auVar173[9];
                  local_400[10] = (RTCHitN)auVar173[10];
                  local_400[0xb] = (RTCHitN)auVar173[0xb];
                  local_400[0xc] = (RTCHitN)auVar173[0xc];
                  local_400[0xd] = (RTCHitN)auVar173[0xd];
                  local_400[0xe] = (RTCHitN)auVar173[0xe];
                  local_400[0xf] = (RTCHitN)auVar173[0xf];
                  local_400[0x10] = (RTCHitN)auVar173[0x10];
                  local_400[0x11] = (RTCHitN)auVar173[0x11];
                  local_400[0x12] = (RTCHitN)auVar173[0x12];
                  local_400[0x13] = (RTCHitN)auVar173[0x13];
                  local_400[0x14] = (RTCHitN)auVar173[0x14];
                  local_400[0x15] = (RTCHitN)auVar173[0x15];
                  local_400[0x16] = (RTCHitN)auVar173[0x16];
                  local_400[0x17] = (RTCHitN)auVar173[0x17];
                  local_400[0x18] = (RTCHitN)auVar173[0x18];
                  local_400[0x19] = (RTCHitN)auVar173[0x19];
                  local_400[0x1a] = (RTCHitN)auVar173[0x1a];
                  local_400[0x1b] = (RTCHitN)auVar173[0x1b];
                  local_400[0x1c] = (RTCHitN)auVar173[0x1c];
                  local_400[0x1d] = (RTCHitN)auVar173[0x1d];
                  local_400[0x1e] = (RTCHitN)auVar173[0x1e];
                  local_400[0x1f] = (RTCHitN)auVar173[0x1f];
                  local_400[0x20] = (RTCHitN)auVar173[0x20];
                  local_400[0x21] = (RTCHitN)auVar173[0x21];
                  local_400[0x22] = (RTCHitN)auVar173[0x22];
                  local_400[0x23] = (RTCHitN)auVar173[0x23];
                  local_400[0x24] = (RTCHitN)auVar173[0x24];
                  local_400[0x25] = (RTCHitN)auVar173[0x25];
                  local_400[0x26] = (RTCHitN)auVar173[0x26];
                  local_400[0x27] = (RTCHitN)auVar173[0x27];
                  local_400[0x28] = (RTCHitN)auVar173[0x28];
                  local_400[0x29] = (RTCHitN)auVar173[0x29];
                  local_400[0x2a] = (RTCHitN)auVar173[0x2a];
                  local_400[0x2b] = (RTCHitN)auVar173[0x2b];
                  local_400[0x2c] = (RTCHitN)auVar173[0x2c];
                  local_400[0x2d] = (RTCHitN)auVar173[0x2d];
                  local_400[0x2e] = (RTCHitN)auVar173[0x2e];
                  local_400[0x2f] = (RTCHitN)auVar173[0x2f];
                  local_400[0x30] = (RTCHitN)auVar173[0x30];
                  local_400[0x31] = (RTCHitN)auVar173[0x31];
                  local_400[0x32] = (RTCHitN)auVar173[0x32];
                  local_400[0x33] = (RTCHitN)auVar173[0x33];
                  local_400[0x34] = (RTCHitN)auVar173[0x34];
                  local_400[0x35] = (RTCHitN)auVar173[0x35];
                  local_400[0x36] = (RTCHitN)auVar173[0x36];
                  local_400[0x37] = (RTCHitN)auVar173[0x37];
                  local_400[0x38] = (RTCHitN)auVar173[0x38];
                  local_400[0x39] = (RTCHitN)auVar173[0x39];
                  local_400[0x3a] = (RTCHitN)auVar173[0x3a];
                  local_400[0x3b] = (RTCHitN)auVar173[0x3b];
                  local_400[0x3c] = (RTCHitN)auVar173[0x3c];
                  local_400[0x3d] = (RTCHitN)auVar173[0x3d];
                  local_400[0x3e] = (RTCHitN)auVar173[0x3e];
                  local_400[0x3f] = (RTCHitN)auVar173[0x3f];
                  local_300 = 0;
                  uStack_2f8 = 0;
                  uStack_2f0 = 0;
                  uStack_2e8 = 0;
                  uStack_2e0 = 0;
                  uStack_2d8 = 0;
                  uStack_2d0 = 0;
                  uStack_2c8 = 0;
                  local_2c0 = local_480._0_8_;
                  uStack_2b8 = local_480._8_8_;
                  uStack_2b0 = local_480._16_8_;
                  uStack_2a8 = local_480._24_8_;
                  uStack_2a0 = local_480._32_8_;
                  uStack_298 = local_480._40_8_;
                  uStack_290 = local_480._48_8_;
                  uStack_288 = local_480._56_8_;
                  auVar173 = vmovdqa64_avx512f(local_440);
                  local_280 = vmovdqa64_avx512f(auVar173);
                  auVar115 = vpcmpeqd_avx2(auVar173._0_32_,auVar173._0_32_);
                  local_a48[3] = auVar115;
                  local_a48[2] = auVar115;
                  local_a48[1] = auVar115;
                  *local_a48 = auVar115;
                  local_240 = vbroadcastss_avx512f(ZEXT416(pRVar10->instID[0]));
                  local_200 = vbroadcastss_avx512f(ZEXT416(pRVar10->instPrimID[0]));
                  *(float *)(ray + k * 4 + 0x200) = fVar190;
                  auVar173 = vmovdqa64_avx512f(local_4c0);
                  local_700 = vmovdqa64_avx512f(auVar173);
                  local_b50.valid = (int *)local_700;
                  local_b50.geometryUserPtr = pGVar8->userPtr;
                  local_b50.context = context->user;
                  local_b50.hit = local_400;
                  local_b50.N = 0x10;
                  local_b50.ray = (RTCRayN *)ray;
                  if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar8->intersectionFilterN)(&local_b50);
                    auVar264 = ZEXT3264(local_b20);
                    auVar263 = ZEXT3264(local_b00);
                    auVar262 = ZEXT3264(local_ae0);
                    auVar261 = ZEXT3264(local_ac0);
                    auVar260 = ZEXT3264(local_aa0);
                    auVar173 = vmovdqa64_avx512f(local_700);
                  }
                  uVar26 = vptestmd_avx512f(auVar173,auVar173);
                  if ((short)uVar26 != 0) {
                    p_Var9 = context->args->filter;
                    if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var9)(&local_b50);
                      auVar264 = ZEXT3264(local_b20);
                      auVar263 = ZEXT3264(local_b00);
                      auVar262 = ZEXT3264(local_ae0);
                      auVar261 = ZEXT3264(local_ac0);
                      auVar260 = ZEXT3264(local_aa0);
                      auVar173 = vmovdqa64_avx512f(local_700);
                    }
                    uVar83 = vptestmd_avx512f(auVar173,auVar173);
                    if ((short)uVar83 != 0) {
                      iVar3 = *(int *)(local_b50.hit + 4);
                      iVar4 = *(int *)(local_b50.hit + 8);
                      iVar1 = *(int *)(local_b50.hit + 0xc);
                      iVar59 = *(int *)(local_b50.hit + 0x10);
                      iVar60 = *(int *)(local_b50.hit + 0x14);
                      iVar61 = *(int *)(local_b50.hit + 0x18);
                      iVar62 = *(int *)(local_b50.hit + 0x1c);
                      iVar63 = *(int *)(local_b50.hit + 0x20);
                      iVar64 = *(int *)(local_b50.hit + 0x24);
                      iVar65 = *(int *)(local_b50.hit + 0x28);
                      iVar66 = *(int *)(local_b50.hit + 0x2c);
                      iVar67 = *(int *)(local_b50.hit + 0x30);
                      iVar68 = *(int *)(local_b50.hit + 0x34);
                      iVar69 = *(int *)(local_b50.hit + 0x38);
                      iVar70 = *(int *)(local_b50.hit + 0x3c);
                      bVar77 = (byte)uVar83;
                      bVar11 = (bool)((byte)(uVar83 >> 1) & 1);
                      bVar12 = (bool)((byte)(uVar83 >> 2) & 1);
                      bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
                      bVar14 = (bool)((byte)(uVar83 >> 4) & 1);
                      bVar15 = (bool)((byte)(uVar83 >> 5) & 1);
                      bVar16 = (bool)((byte)(uVar83 >> 6) & 1);
                      bVar17 = (bool)((byte)(uVar83 >> 7) & 1);
                      bVar76 = (byte)(uVar83 >> 8);
                      bVar18 = (bool)((byte)(uVar83 >> 9) & 1);
                      bVar19 = (bool)((byte)(uVar83 >> 10) & 1);
                      bVar20 = (bool)((byte)(uVar83 >> 0xb) & 1);
                      bVar21 = (bool)((byte)(uVar83 >> 0xc) & 1);
                      bVar22 = (bool)((byte)(uVar83 >> 0xd) & 1);
                      bVar23 = (bool)((byte)(uVar83 >> 0xe) & 1);
                      bVar24 = SUB81(uVar83 >> 0xf,0);
                      *(uint *)(local_b50.ray + 0x300) =
                           (uint)(bVar77 & 1) * *(int *)local_b50.hit |
                           (uint)!(bool)(bVar77 & 1) * *(int *)(local_b50.ray + 0x300);
                      *(uint *)(local_b50.ray + 0x304) =
                           (uint)bVar11 * iVar3 | (uint)!bVar11 * *(int *)(local_b50.ray + 0x304);
                      *(uint *)(local_b50.ray + 0x308) =
                           (uint)bVar12 * iVar4 | (uint)!bVar12 * *(int *)(local_b50.ray + 0x308);
                      *(uint *)(local_b50.ray + 0x30c) =
                           (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_b50.ray + 0x30c);
                      *(uint *)(local_b50.ray + 0x310) =
                           (uint)bVar14 * iVar59 | (uint)!bVar14 * *(int *)(local_b50.ray + 0x310);
                      *(uint *)(local_b50.ray + 0x314) =
                           (uint)bVar15 * iVar60 | (uint)!bVar15 * *(int *)(local_b50.ray + 0x314);
                      *(uint *)(local_b50.ray + 0x318) =
                           (uint)bVar16 * iVar61 | (uint)!bVar16 * *(int *)(local_b50.ray + 0x318);
                      *(uint *)(local_b50.ray + 0x31c) =
                           (uint)bVar17 * iVar62 | (uint)!bVar17 * *(int *)(local_b50.ray + 0x31c);
                      *(uint *)(local_b50.ray + 800) =
                           (uint)(bVar76 & 1) * iVar63 |
                           (uint)!(bool)(bVar76 & 1) * *(int *)(local_b50.ray + 800);
                      *(uint *)(local_b50.ray + 0x324) =
                           (uint)bVar18 * iVar64 | (uint)!bVar18 * *(int *)(local_b50.ray + 0x324);
                      *(uint *)(local_b50.ray + 0x328) =
                           (uint)bVar19 * iVar65 | (uint)!bVar19 * *(int *)(local_b50.ray + 0x328);
                      *(uint *)(local_b50.ray + 0x32c) =
                           (uint)bVar20 * iVar66 | (uint)!bVar20 * *(int *)(local_b50.ray + 0x32c);
                      *(uint *)(local_b50.ray + 0x330) =
                           (uint)bVar21 * iVar67 | (uint)!bVar21 * *(int *)(local_b50.ray + 0x330);
                      *(uint *)(local_b50.ray + 0x334) =
                           (uint)bVar22 * iVar68 | (uint)!bVar22 * *(int *)(local_b50.ray + 0x334);
                      *(uint *)(local_b50.ray + 0x338) =
                           (uint)bVar23 * iVar69 | (uint)!bVar23 * *(int *)(local_b50.ray + 0x338);
                      *(uint *)(local_b50.ray + 0x33c) =
                           (uint)bVar24 * iVar70 | (uint)!bVar24 * *(int *)(local_b50.ray + 0x33c);
                      iVar3 = *(int *)(local_b50.hit + 0x44);
                      iVar4 = *(int *)(local_b50.hit + 0x48);
                      iVar1 = *(int *)(local_b50.hit + 0x4c);
                      iVar59 = *(int *)(local_b50.hit + 0x50);
                      iVar60 = *(int *)(local_b50.hit + 0x54);
                      iVar61 = *(int *)(local_b50.hit + 0x58);
                      iVar62 = *(int *)(local_b50.hit + 0x5c);
                      iVar63 = *(int *)(local_b50.hit + 0x60);
                      iVar64 = *(int *)(local_b50.hit + 100);
                      iVar65 = *(int *)(local_b50.hit + 0x68);
                      iVar66 = *(int *)(local_b50.hit + 0x6c);
                      iVar67 = *(int *)(local_b50.hit + 0x70);
                      iVar68 = *(int *)(local_b50.hit + 0x74);
                      iVar69 = *(int *)(local_b50.hit + 0x78);
                      iVar70 = *(int *)(local_b50.hit + 0x7c);
                      bVar11 = (bool)((byte)(uVar83 >> 1) & 1);
                      bVar12 = (bool)((byte)(uVar83 >> 2) & 1);
                      bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
                      bVar14 = (bool)((byte)(uVar83 >> 4) & 1);
                      bVar15 = (bool)((byte)(uVar83 >> 5) & 1);
                      bVar16 = (bool)((byte)(uVar83 >> 6) & 1);
                      bVar17 = (bool)((byte)(uVar83 >> 7) & 1);
                      bVar18 = (bool)((byte)(uVar83 >> 9) & 1);
                      bVar19 = (bool)((byte)(uVar83 >> 10) & 1);
                      bVar20 = (bool)((byte)(uVar83 >> 0xb) & 1);
                      bVar21 = (bool)((byte)(uVar83 >> 0xc) & 1);
                      bVar22 = (bool)((byte)(uVar83 >> 0xd) & 1);
                      bVar23 = (bool)((byte)(uVar83 >> 0xe) & 1);
                      bVar24 = SUB81(uVar83 >> 0xf,0);
                      *(uint *)(local_b50.ray + 0x340) =
                           (uint)(bVar77 & 1) * *(int *)(local_b50.hit + 0x40) |
                           (uint)!(bool)(bVar77 & 1) * *(int *)(local_b50.ray + 0x340);
                      *(uint *)(local_b50.ray + 0x344) =
                           (uint)bVar11 * iVar3 | (uint)!bVar11 * *(int *)(local_b50.ray + 0x344);
                      *(uint *)(local_b50.ray + 0x348) =
                           (uint)bVar12 * iVar4 | (uint)!bVar12 * *(int *)(local_b50.ray + 0x348);
                      *(uint *)(local_b50.ray + 0x34c) =
                           (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_b50.ray + 0x34c);
                      *(uint *)(local_b50.ray + 0x350) =
                           (uint)bVar14 * iVar59 | (uint)!bVar14 * *(int *)(local_b50.ray + 0x350);
                      *(uint *)(local_b50.ray + 0x354) =
                           (uint)bVar15 * iVar60 | (uint)!bVar15 * *(int *)(local_b50.ray + 0x354);
                      *(uint *)(local_b50.ray + 0x358) =
                           (uint)bVar16 * iVar61 | (uint)!bVar16 * *(int *)(local_b50.ray + 0x358);
                      *(uint *)(local_b50.ray + 0x35c) =
                           (uint)bVar17 * iVar62 | (uint)!bVar17 * *(int *)(local_b50.ray + 0x35c);
                      *(uint *)(local_b50.ray + 0x360) =
                           (uint)(bVar76 & 1) * iVar63 |
                           (uint)!(bool)(bVar76 & 1) * *(int *)(local_b50.ray + 0x360);
                      *(uint *)(local_b50.ray + 0x364) =
                           (uint)bVar18 * iVar64 | (uint)!bVar18 * *(int *)(local_b50.ray + 0x364);
                      *(uint *)(local_b50.ray + 0x368) =
                           (uint)bVar19 * iVar65 | (uint)!bVar19 * *(int *)(local_b50.ray + 0x368);
                      *(uint *)(local_b50.ray + 0x36c) =
                           (uint)bVar20 * iVar66 | (uint)!bVar20 * *(int *)(local_b50.ray + 0x36c);
                      *(uint *)(local_b50.ray + 0x370) =
                           (uint)bVar21 * iVar67 | (uint)!bVar21 * *(int *)(local_b50.ray + 0x370);
                      *(uint *)(local_b50.ray + 0x374) =
                           (uint)bVar22 * iVar68 | (uint)!bVar22 * *(int *)(local_b50.ray + 0x374);
                      *(uint *)(local_b50.ray + 0x378) =
                           (uint)bVar23 * iVar69 | (uint)!bVar23 * *(int *)(local_b50.ray + 0x378);
                      *(uint *)(local_b50.ray + 0x37c) =
                           (uint)bVar24 * iVar70 | (uint)!bVar24 * *(int *)(local_b50.ray + 0x37c);
                      iVar3 = *(int *)(local_b50.hit + 0x84);
                      iVar4 = *(int *)(local_b50.hit + 0x88);
                      iVar1 = *(int *)(local_b50.hit + 0x8c);
                      iVar59 = *(int *)(local_b50.hit + 0x90);
                      iVar60 = *(int *)(local_b50.hit + 0x94);
                      iVar61 = *(int *)(local_b50.hit + 0x98);
                      iVar62 = *(int *)(local_b50.hit + 0x9c);
                      iVar63 = *(int *)(local_b50.hit + 0xa0);
                      iVar64 = *(int *)(local_b50.hit + 0xa4);
                      iVar65 = *(int *)(local_b50.hit + 0xa8);
                      iVar66 = *(int *)(local_b50.hit + 0xac);
                      iVar67 = *(int *)(local_b50.hit + 0xb0);
                      iVar68 = *(int *)(local_b50.hit + 0xb4);
                      iVar69 = *(int *)(local_b50.hit + 0xb8);
                      iVar70 = *(int *)(local_b50.hit + 0xbc);
                      bVar11 = (bool)((byte)(uVar83 >> 1) & 1);
                      bVar12 = (bool)((byte)(uVar83 >> 2) & 1);
                      bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
                      bVar14 = (bool)((byte)(uVar83 >> 4) & 1);
                      bVar15 = (bool)((byte)(uVar83 >> 5) & 1);
                      bVar16 = (bool)((byte)(uVar83 >> 6) & 1);
                      bVar17 = (bool)((byte)(uVar83 >> 7) & 1);
                      bVar18 = (bool)((byte)(uVar83 >> 9) & 1);
                      bVar19 = (bool)((byte)(uVar83 >> 10) & 1);
                      bVar20 = (bool)((byte)(uVar83 >> 0xb) & 1);
                      bVar21 = (bool)((byte)(uVar83 >> 0xc) & 1);
                      bVar22 = (bool)((byte)(uVar83 >> 0xd) & 1);
                      bVar23 = (bool)((byte)(uVar83 >> 0xe) & 1);
                      bVar24 = SUB81(uVar83 >> 0xf,0);
                      *(uint *)(local_b50.ray + 0x380) =
                           (uint)(bVar77 & 1) * *(int *)(local_b50.hit + 0x80) |
                           (uint)!(bool)(bVar77 & 1) * *(int *)(local_b50.ray + 0x380);
                      *(uint *)(local_b50.ray + 900) =
                           (uint)bVar11 * iVar3 | (uint)!bVar11 * *(int *)(local_b50.ray + 900);
                      *(uint *)(local_b50.ray + 0x388) =
                           (uint)bVar12 * iVar4 | (uint)!bVar12 * *(int *)(local_b50.ray + 0x388);
                      *(uint *)(local_b50.ray + 0x38c) =
                           (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_b50.ray + 0x38c);
                      *(uint *)(local_b50.ray + 0x390) =
                           (uint)bVar14 * iVar59 | (uint)!bVar14 * *(int *)(local_b50.ray + 0x390);
                      *(uint *)(local_b50.ray + 0x394) =
                           (uint)bVar15 * iVar60 | (uint)!bVar15 * *(int *)(local_b50.ray + 0x394);
                      *(uint *)(local_b50.ray + 0x398) =
                           (uint)bVar16 * iVar61 | (uint)!bVar16 * *(int *)(local_b50.ray + 0x398);
                      *(uint *)(local_b50.ray + 0x39c) =
                           (uint)bVar17 * iVar62 | (uint)!bVar17 * *(int *)(local_b50.ray + 0x39c);
                      *(uint *)(local_b50.ray + 0x3a0) =
                           (uint)(bVar76 & 1) * iVar63 |
                           (uint)!(bool)(bVar76 & 1) * *(int *)(local_b50.ray + 0x3a0);
                      *(uint *)(local_b50.ray + 0x3a4) =
                           (uint)bVar18 * iVar64 | (uint)!bVar18 * *(int *)(local_b50.ray + 0x3a4);
                      *(uint *)(local_b50.ray + 0x3a8) =
                           (uint)bVar19 * iVar65 | (uint)!bVar19 * *(int *)(local_b50.ray + 0x3a8);
                      *(uint *)(local_b50.ray + 0x3ac) =
                           (uint)bVar20 * iVar66 | (uint)!bVar20 * *(int *)(local_b50.ray + 0x3ac);
                      *(uint *)(local_b50.ray + 0x3b0) =
                           (uint)bVar21 * iVar67 | (uint)!bVar21 * *(int *)(local_b50.ray + 0x3b0);
                      *(uint *)(local_b50.ray + 0x3b4) =
                           (uint)bVar22 * iVar68 | (uint)!bVar22 * *(int *)(local_b50.ray + 0x3b4);
                      *(uint *)(local_b50.ray + 0x3b8) =
                           (uint)bVar23 * iVar69 | (uint)!bVar23 * *(int *)(local_b50.ray + 0x3b8);
                      *(uint *)(local_b50.ray + 0x3bc) =
                           (uint)bVar24 * iVar70 | (uint)!bVar24 * *(int *)(local_b50.ray + 0x3bc);
                      iVar3 = *(int *)(local_b50.hit + 0xc4);
                      iVar4 = *(int *)(local_b50.hit + 200);
                      iVar1 = *(int *)(local_b50.hit + 0xcc);
                      iVar59 = *(int *)(local_b50.hit + 0xd0);
                      iVar60 = *(int *)(local_b50.hit + 0xd4);
                      iVar61 = *(int *)(local_b50.hit + 0xd8);
                      iVar62 = *(int *)(local_b50.hit + 0xdc);
                      iVar63 = *(int *)(local_b50.hit + 0xe0);
                      iVar64 = *(int *)(local_b50.hit + 0xe4);
                      iVar65 = *(int *)(local_b50.hit + 0xe8);
                      iVar66 = *(int *)(local_b50.hit + 0xec);
                      iVar67 = *(int *)(local_b50.hit + 0xf0);
                      iVar68 = *(int *)(local_b50.hit + 0xf4);
                      iVar69 = *(int *)(local_b50.hit + 0xf8);
                      iVar70 = *(int *)(local_b50.hit + 0xfc);
                      bVar11 = (bool)((byte)(uVar83 >> 1) & 1);
                      bVar12 = (bool)((byte)(uVar83 >> 2) & 1);
                      bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
                      bVar14 = (bool)((byte)(uVar83 >> 4) & 1);
                      bVar15 = (bool)((byte)(uVar83 >> 5) & 1);
                      bVar16 = (bool)((byte)(uVar83 >> 6) & 1);
                      bVar17 = (bool)((byte)(uVar83 >> 7) & 1);
                      bVar18 = (bool)((byte)(uVar83 >> 9) & 1);
                      bVar19 = (bool)((byte)(uVar83 >> 10) & 1);
                      bVar20 = (bool)((byte)(uVar83 >> 0xb) & 1);
                      bVar21 = (bool)((byte)(uVar83 >> 0xc) & 1);
                      bVar22 = (bool)((byte)(uVar83 >> 0xd) & 1);
                      bVar23 = (bool)((byte)(uVar83 >> 0xe) & 1);
                      bVar24 = SUB81(uVar83 >> 0xf,0);
                      *(uint *)(local_b50.ray + 0x3c0) =
                           (uint)(bVar77 & 1) * *(int *)(local_b50.hit + 0xc0) |
                           (uint)!(bool)(bVar77 & 1) * *(int *)(local_b50.ray + 0x3c0);
                      *(uint *)(local_b50.ray + 0x3c4) =
                           (uint)bVar11 * iVar3 | (uint)!bVar11 * *(int *)(local_b50.ray + 0x3c4);
                      *(uint *)(local_b50.ray + 0x3c8) =
                           (uint)bVar12 * iVar4 | (uint)!bVar12 * *(int *)(local_b50.ray + 0x3c8);
                      *(uint *)(local_b50.ray + 0x3cc) =
                           (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_b50.ray + 0x3cc);
                      *(uint *)(local_b50.ray + 0x3d0) =
                           (uint)bVar14 * iVar59 | (uint)!bVar14 * *(int *)(local_b50.ray + 0x3d0);
                      *(uint *)(local_b50.ray + 0x3d4) =
                           (uint)bVar15 * iVar60 | (uint)!bVar15 * *(int *)(local_b50.ray + 0x3d4);
                      *(uint *)(local_b50.ray + 0x3d8) =
                           (uint)bVar16 * iVar61 | (uint)!bVar16 * *(int *)(local_b50.ray + 0x3d8);
                      *(uint *)(local_b50.ray + 0x3dc) =
                           (uint)bVar17 * iVar62 | (uint)!bVar17 * *(int *)(local_b50.ray + 0x3dc);
                      *(uint *)(local_b50.ray + 0x3e0) =
                           (uint)(bVar76 & 1) * iVar63 |
                           (uint)!(bool)(bVar76 & 1) * *(int *)(local_b50.ray + 0x3e0);
                      *(uint *)(local_b50.ray + 0x3e4) =
                           (uint)bVar18 * iVar64 | (uint)!bVar18 * *(int *)(local_b50.ray + 0x3e4);
                      *(uint *)(local_b50.ray + 1000) =
                           (uint)bVar19 * iVar65 | (uint)!bVar19 * *(int *)(local_b50.ray + 1000);
                      *(uint *)(local_b50.ray + 0x3ec) =
                           (uint)bVar20 * iVar66 | (uint)!bVar20 * *(int *)(local_b50.ray + 0x3ec);
                      *(uint *)(local_b50.ray + 0x3f0) =
                           (uint)bVar21 * iVar67 | (uint)!bVar21 * *(int *)(local_b50.ray + 0x3f0);
                      *(uint *)(local_b50.ray + 0x3f4) =
                           (uint)bVar22 * iVar68 | (uint)!bVar22 * *(int *)(local_b50.ray + 0x3f4);
                      *(uint *)(local_b50.ray + 0x3f8) =
                           (uint)bVar23 * iVar69 | (uint)!bVar23 * *(int *)(local_b50.ray + 0x3f8);
                      *(uint *)(local_b50.ray + 0x3fc) =
                           (uint)bVar24 * iVar70 | (uint)!bVar24 * *(int *)(local_b50.ray + 0x3fc);
                      iVar3 = *(int *)(local_b50.hit + 0x104);
                      iVar4 = *(int *)(local_b50.hit + 0x108);
                      iVar1 = *(int *)(local_b50.hit + 0x10c);
                      iVar59 = *(int *)(local_b50.hit + 0x110);
                      iVar60 = *(int *)(local_b50.hit + 0x114);
                      iVar61 = *(int *)(local_b50.hit + 0x118);
                      iVar62 = *(int *)(local_b50.hit + 0x11c);
                      iVar63 = *(int *)(local_b50.hit + 0x120);
                      iVar64 = *(int *)(local_b50.hit + 0x124);
                      iVar65 = *(int *)(local_b50.hit + 0x128);
                      iVar66 = *(int *)(local_b50.hit + 300);
                      iVar67 = *(int *)(local_b50.hit + 0x130);
                      iVar68 = *(int *)(local_b50.hit + 0x134);
                      iVar69 = *(int *)(local_b50.hit + 0x138);
                      iVar70 = *(int *)(local_b50.hit + 0x13c);
                      bVar11 = (bool)((byte)(uVar83 >> 1) & 1);
                      bVar12 = (bool)((byte)(uVar83 >> 2) & 1);
                      bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
                      bVar14 = (bool)((byte)(uVar83 >> 4) & 1);
                      bVar15 = (bool)((byte)(uVar83 >> 5) & 1);
                      bVar16 = (bool)((byte)(uVar83 >> 6) & 1);
                      bVar17 = (bool)((byte)(uVar83 >> 7) & 1);
                      bVar18 = (bool)((byte)(uVar83 >> 9) & 1);
                      bVar19 = (bool)((byte)(uVar83 >> 10) & 1);
                      bVar20 = (bool)((byte)(uVar83 >> 0xb) & 1);
                      bVar21 = (bool)((byte)(uVar83 >> 0xc) & 1);
                      bVar22 = (bool)((byte)(uVar83 >> 0xd) & 1);
                      bVar23 = (bool)((byte)(uVar83 >> 0xe) & 1);
                      bVar24 = SUB81(uVar83 >> 0xf,0);
                      *(uint *)(local_b50.ray + 0x400) =
                           (uint)(bVar77 & 1) * *(int *)(local_b50.hit + 0x100) |
                           (uint)!(bool)(bVar77 & 1) * *(int *)(local_b50.ray + 0x400);
                      *(uint *)(local_b50.ray + 0x404) =
                           (uint)bVar11 * iVar3 | (uint)!bVar11 * *(int *)(local_b50.ray + 0x404);
                      *(uint *)(local_b50.ray + 0x408) =
                           (uint)bVar12 * iVar4 | (uint)!bVar12 * *(int *)(local_b50.ray + 0x408);
                      *(uint *)(local_b50.ray + 0x40c) =
                           (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_b50.ray + 0x40c);
                      *(uint *)(local_b50.ray + 0x410) =
                           (uint)bVar14 * iVar59 | (uint)!bVar14 * *(int *)(local_b50.ray + 0x410);
                      *(uint *)(local_b50.ray + 0x414) =
                           (uint)bVar15 * iVar60 | (uint)!bVar15 * *(int *)(local_b50.ray + 0x414);
                      *(uint *)(local_b50.ray + 0x418) =
                           (uint)bVar16 * iVar61 | (uint)!bVar16 * *(int *)(local_b50.ray + 0x418);
                      *(uint *)(local_b50.ray + 0x41c) =
                           (uint)bVar17 * iVar62 | (uint)!bVar17 * *(int *)(local_b50.ray + 0x41c);
                      *(uint *)(local_b50.ray + 0x420) =
                           (uint)(bVar76 & 1) * iVar63 |
                           (uint)!(bool)(bVar76 & 1) * *(int *)(local_b50.ray + 0x420);
                      *(uint *)(local_b50.ray + 0x424) =
                           (uint)bVar18 * iVar64 | (uint)!bVar18 * *(int *)(local_b50.ray + 0x424);
                      *(uint *)(local_b50.ray + 0x428) =
                           (uint)bVar19 * iVar65 | (uint)!bVar19 * *(int *)(local_b50.ray + 0x428);
                      *(uint *)(local_b50.ray + 0x42c) =
                           (uint)bVar20 * iVar66 | (uint)!bVar20 * *(int *)(local_b50.ray + 0x42c);
                      *(uint *)(local_b50.ray + 0x430) =
                           (uint)bVar21 * iVar67 | (uint)!bVar21 * *(int *)(local_b50.ray + 0x430);
                      *(uint *)(local_b50.ray + 0x434) =
                           (uint)bVar22 * iVar68 | (uint)!bVar22 * *(int *)(local_b50.ray + 0x434);
                      *(uint *)(local_b50.ray + 0x438) =
                           (uint)bVar23 * iVar69 | (uint)!bVar23 * *(int *)(local_b50.ray + 0x438);
                      *(uint *)(local_b50.ray + 0x43c) =
                           (uint)bVar24 * iVar70 | (uint)!bVar24 * *(int *)(local_b50.ray + 0x43c);
                      auVar173 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b50.hit + 0x140));
                      auVar173 = vmovdqu32_avx512f(auVar173);
                      *(undefined1 (*) [64])(local_b50.ray + 0x440) = auVar173;
                      auVar173 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b50.hit + 0x180));
                      auVar173 = vmovdqu32_avx512f(auVar173);
                      *(undefined1 (*) [64])(local_b50.ray + 0x480) = auVar173;
                      auVar173 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b50.hit + 0x1c0));
                      auVar173 = vmovdqa32_avx512f(auVar173);
                      *(undefined1 (*) [64])(local_b50.ray + 0x4c0) = auVar173;
                      auVar173 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b50.hit + 0x200));
                      auVar173 = vmovdqa32_avx512f(auVar173);
                      *(undefined1 (*) [64])(local_b50.ray + 0x500) = auVar173;
                      break;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x200) = fVar192;
                  break;
                }
              }
              lVar85 = lVar85 + -1;
            } while (lVar85 != 0);
            uVar161 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar171._4_4_ = uVar161;
            auVar171._0_4_ = uVar161;
            auVar171._8_4_ = uVar161;
            auVar171._12_4_ = uVar161;
            auVar171._16_4_ = uVar161;
            auVar171._20_4_ = uVar161;
            auVar171._24_4_ = uVar161;
            auVar171._28_4_ = uVar161;
            auVar71._4_4_ = fStack_69c;
            auVar71._0_4_ = local_6a0;
            auVar71._8_4_ = fStack_698;
            auVar71._12_4_ = fStack_694;
            auVar71._16_4_ = fStack_690;
            auVar71._20_4_ = fStack_68c;
            auVar71._24_4_ = fStack_688;
            auVar71._28_4_ = fStack_684;
            uVar26 = vcmpps_avx512vl(auVar171,auVar71,0xd);
            bVar86 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar86 & (byte)uVar26;
          } while (bVar86 != 0);
          auVar265 = ZEXT3264(local_a00);
          auVar116 = local_600;
        }
        bVar79 = local_6c0[0] | ~bVar79;
        auVar188._0_4_ = (float)local_9c0._0_4_ + auVar116._0_4_;
        auVar188._4_4_ = (float)local_9c0._4_4_ + auVar116._4_4_;
        auVar188._8_4_ = fStack_9b8 + auVar116._8_4_;
        auVar188._12_4_ = fStack_9b4 + auVar116._12_4_;
        auVar188._16_4_ = fStack_9b0 + auVar116._16_4_;
        auVar188._20_4_ = fStack_9ac + auVar116._20_4_;
        auVar188._24_4_ = fStack_9a8 + auVar116._24_4_;
        auVar188._28_4_ = fStack_9a4 + auVar116._28_4_;
        uVar26 = vcmpps_avx512vl(auVar188,auVar171,2);
        bVar75 = (byte)uVar27 & bVar75 & (byte)uVar26;
        auVar189._8_4_ = 2;
        auVar189._0_8_ = 0x200000002;
        auVar189._12_4_ = 2;
        auVar189._16_4_ = 2;
        auVar189._20_4_ = 2;
        auVar189._24_4_ = 2;
        auVar189._28_4_ = 2;
        auVar41._8_4_ = 3;
        auVar41._0_8_ = 0x300000003;
        auVar41._12_4_ = 3;
        auVar41._16_4_ = 3;
        auVar41._20_4_ = 3;
        auVar41._24_4_ = 3;
        auVar41._28_4_ = 3;
        auVar115 = vpblendmd_avx512vl(auVar189,auVar41);
        auVar150._0_4_ = (uint)(bVar79 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar79 & 1) * 2;
        bVar11 = (bool)(bVar79 >> 1 & 1);
        auVar150._4_4_ = (uint)bVar11 * auVar115._4_4_ | (uint)!bVar11 * 2;
        bVar11 = (bool)(bVar79 >> 2 & 1);
        auVar150._8_4_ = (uint)bVar11 * auVar115._8_4_ | (uint)!bVar11 * 2;
        bVar11 = (bool)(bVar79 >> 3 & 1);
        auVar150._12_4_ = (uint)bVar11 * auVar115._12_4_ | (uint)!bVar11 * 2;
        bVar11 = (bool)(bVar79 >> 4 & 1);
        auVar150._16_4_ = (uint)bVar11 * auVar115._16_4_ | (uint)!bVar11 * 2;
        bVar11 = (bool)(bVar79 >> 5 & 1);
        auVar150._20_4_ = (uint)bVar11 * auVar115._20_4_ | (uint)!bVar11 * 2;
        bVar11 = (bool)(bVar79 >> 6 & 1);
        auVar150._24_4_ = (uint)bVar11 * auVar115._24_4_ | (uint)!bVar11 * 2;
        auVar150._28_4_ = (uint)(bVar79 >> 7) * auVar115._28_4_ | (uint)!(bool)(bVar79 >> 7) * 2;
        uVar26 = vpcmpd_avx512vl(local_660,auVar150,5);
        bVar79 = (byte)uVar26 & bVar75;
        fVar160 = (float)local_9c0._0_4_;
        fVar190 = (float)local_9c0._4_4_;
        fVar192 = fStack_9b8;
        fVar194 = fStack_9b4;
        fVar162 = fStack_9b0;
        fVar196 = fStack_9ac;
        fVar198 = fStack_9a8;
        fVar220 = fStack_9a4;
        if (bVar79 != 0) {
          auVar5 = vminps_avx(local_880._0_16_,local_8c0._0_16_);
          auVar94 = vmaxps_avx(local_880._0_16_,local_8c0._0_16_);
          auVar91 = vminps_avx(local_8a0._0_16_,local_8e0._0_16_);
          auVar99 = vminps_avx(auVar5,auVar91);
          auVar5 = vmaxps_avx(local_8a0._0_16_,local_8e0._0_16_);
          auVar91 = vmaxps_avx(auVar94,auVar5);
          auVar207._8_4_ = 0x7fffffff;
          auVar207._0_8_ = 0x7fffffff7fffffff;
          auVar207._12_4_ = 0x7fffffff;
          auVar94 = vandps_avx(auVar99,auVar207);
          auVar5 = vandps_avx(auVar91,auVar207);
          auVar94 = vmaxps_avx(auVar94,auVar5);
          auVar5 = vmovshdup_avx(auVar94);
          auVar5 = vmaxss_avx(auVar5,auVar94);
          auVar94 = vshufpd_avx(auVar94,auVar94,1);
          auVar94 = vmaxss_avx(auVar94,auVar5);
          fVar160 = auVar94._0_4_ * 1.9073486e-06;
          local_960 = vshufps_avx(auVar91,auVar91,0xff);
          local_6a0 = (float)local_9c0._0_4_ + local_640._0_4_;
          fStack_69c = (float)local_9c0._4_4_ + local_640._4_4_;
          fStack_698 = fStack_9b8 + local_640._8_4_;
          fStack_694 = fStack_9b4 + local_640._12_4_;
          fStack_690 = fStack_9b0 + local_640._16_4_;
          fStack_68c = fStack_9ac + local_640._20_4_;
          fStack_688 = fStack_9a8 + local_640._24_4_;
          fStack_684 = fStack_9a4 + local_640._28_4_;
          _local_900 = local_640;
          local_6c0 = auVar150;
          do {
            auVar172._8_4_ = 0x7f800000;
            auVar172._0_8_ = 0x7f8000007f800000;
            auVar172._12_4_ = 0x7f800000;
            auVar172._16_4_ = 0x7f800000;
            auVar172._20_4_ = 0x7f800000;
            auVar172._24_4_ = 0x7f800000;
            auVar172._28_4_ = 0x7f800000;
            auVar115 = vblendmps_avx512vl(auVar172,_local_900);
            auVar151._0_4_ =
                 (uint)(bVar79 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar79 & 1) * 0x7f800000;
            bVar11 = (bool)(bVar79 >> 1 & 1);
            auVar151._4_4_ = (uint)bVar11 * auVar115._4_4_ | (uint)!bVar11 * 0x7f800000;
            bVar11 = (bool)(bVar79 >> 2 & 1);
            auVar151._8_4_ = (uint)bVar11 * auVar115._8_4_ | (uint)!bVar11 * 0x7f800000;
            bVar11 = (bool)(bVar79 >> 3 & 1);
            auVar151._12_4_ = (uint)bVar11 * auVar115._12_4_ | (uint)!bVar11 * 0x7f800000;
            bVar11 = (bool)(bVar79 >> 4 & 1);
            auVar151._16_4_ = (uint)bVar11 * auVar115._16_4_ | (uint)!bVar11 * 0x7f800000;
            bVar11 = (bool)(bVar79 >> 5 & 1);
            auVar151._20_4_ = (uint)bVar11 * auVar115._20_4_ | (uint)!bVar11 * 0x7f800000;
            auVar151._24_4_ =
                 (uint)(bVar79 >> 6) * auVar115._24_4_ | (uint)!(bool)(bVar79 >> 6) * 0x7f800000;
            auVar151._28_4_ = 0x7f800000;
            auVar115 = vshufps_avx(auVar151,auVar151,0xb1);
            auVar115 = vminps_avx(auVar151,auVar115);
            auVar116 = vshufpd_avx(auVar115,auVar115,5);
            auVar115 = vminps_avx(auVar115,auVar116);
            auVar116 = vpermpd_avx2(auVar115,0x4e);
            auVar115 = vminps_avx(auVar115,auVar116);
            uVar26 = vcmpps_avx512vl(auVar151,auVar115,0);
            bVar77 = (byte)uVar26 & bVar79;
            bVar86 = bVar79;
            if (bVar77 != 0) {
              bVar86 = bVar77;
            }
            iVar2 = 0;
            for (uVar90 = (uint)bVar86; (uVar90 & 1) == 0; uVar90 = uVar90 >> 1 | 0x80000000) {
              iVar2 = iVar2 + 1;
            }
            uVar90 = *(uint *)(local_500 + (uint)(iVar2 << 2));
            fVar190 = auVar93._0_4_;
            auVar94 = ZEXT416(*(uint *)(local_620 + (uint)(iVar2 << 2)));
            if ((float)local_a20._0_4_ < 0.0) {
              local_a80._0_16_ = ZEXT416(*(uint *)(local_620 + (uint)(iVar2 << 2)));
              fVar190 = sqrtf((float)local_a20._0_4_);
              auVar94 = local_a80._0_16_;
            }
            auVar94 = vinsertps_avx(auVar94,ZEXT416(uVar90),0x10);
            auVar173 = ZEXT1664(auVar94);
            lVar85 = 5;
            do {
              uVar161 = auVar173._0_4_;
              auVar166._4_4_ = uVar161;
              auVar166._0_4_ = uVar161;
              auVar166._8_4_ = uVar161;
              auVar166._12_4_ = uVar161;
              auVar5 = vfmadd132ps_fma(auVar166,ZEXT816(0) << 0x40,local_a10);
              auVar91 = auVar173._0_16_;
              auVar94 = vmovshdup_avx(auVar91);
              local_7e0._0_16_ = auVar94;
              fVar198 = 1.0 - auVar94._0_4_;
              auVar94 = vshufps_avx(auVar91,auVar91,0x55);
              fVar192 = auVar94._0_4_;
              auVar208._0_4_ = local_8c0._0_4_ * fVar192;
              fVar194 = auVar94._4_4_;
              auVar208._4_4_ = local_8c0._4_4_ * fVar194;
              fVar162 = auVar94._8_4_;
              auVar208._8_4_ = local_8c0._8_4_ * fVar162;
              fVar196 = auVar94._12_4_;
              auVar208._12_4_ = local_8c0._12_4_ * fVar196;
              _local_7c0 = ZEXT416((uint)fVar198);
              auVar228._4_4_ = fVar198;
              auVar228._0_4_ = fVar198;
              auVar228._8_4_ = fVar198;
              auVar228._12_4_ = fVar198;
              auVar94 = vfmadd231ps_fma(auVar208,auVar228,local_880._0_16_);
              auVar237._0_4_ = local_8a0._0_4_ * fVar192;
              auVar237._4_4_ = local_8a0._4_4_ * fVar194;
              auVar237._8_4_ = local_8a0._8_4_ * fVar162;
              auVar237._12_4_ = local_8a0._12_4_ * fVar196;
              auVar91 = vfmadd231ps_fma(auVar237,auVar228,local_8c0._0_16_);
              auVar243._0_4_ = fVar192 * (float)local_8e0._0_4_;
              auVar243._4_4_ = fVar194 * (float)local_8e0._4_4_;
              auVar243._8_4_ = fVar162 * fStack_8d8;
              auVar243._12_4_ = fVar196 * fStack_8d4;
              auVar99 = vfmadd231ps_fma(auVar243,auVar228,local_8a0._0_16_);
              auVar248._0_4_ = fVar192 * auVar91._0_4_;
              auVar248._4_4_ = fVar194 * auVar91._4_4_;
              auVar248._8_4_ = fVar162 * auVar91._8_4_;
              auVar248._12_4_ = fVar196 * auVar91._12_4_;
              auVar94 = vfmadd231ps_fma(auVar248,auVar228,auVar94);
              auVar209._0_4_ = fVar192 * auVar99._0_4_;
              auVar209._4_4_ = fVar194 * auVar99._4_4_;
              auVar209._8_4_ = fVar162 * auVar99._8_4_;
              auVar209._12_4_ = fVar196 * auVar99._12_4_;
              auVar91 = vfmadd231ps_fma(auVar209,auVar228,auVar91);
              auVar238._0_4_ = fVar192 * auVar91._0_4_;
              auVar238._4_4_ = fVar194 * auVar91._4_4_;
              auVar238._8_4_ = fVar162 * auVar91._8_4_;
              auVar238._12_4_ = fVar196 * auVar91._12_4_;
              auVar99 = vfmadd231ps_fma(auVar238,auVar94,auVar228);
              auVar94 = vsubps_avx(auVar91,auVar94);
              auVar33._8_4_ = 0x40400000;
              auVar33._0_8_ = 0x4040000040400000;
              auVar33._12_4_ = 0x40400000;
              auVar91 = vmulps_avx512vl(auVar94,auVar33);
              local_7a0._0_16_ = auVar99;
              auVar5 = vsubps_avx(auVar5,auVar99);
              auVar94 = vdpps_avx(auVar5,auVar5,0x7f);
              local_a80._0_16_ = auVar94;
              local_740 = auVar173;
              if (auVar94._0_4_ < 0.0) {
                auVar240._0_4_ = sqrtf(auVar94._0_4_);
                auVar240._4_60_ = extraout_var_00;
                auVar94 = auVar240._0_16_;
              }
              else {
                auVar94 = vsqrtss_avx(auVar94,auVar94);
              }
              local_800._0_16_ = vdpps_avx(auVar91,auVar91,0x7f);
              fVar192 = local_800._0_4_;
              auVar210._4_12_ = ZEXT812(0) << 0x20;
              auVar210._0_4_ = fVar192;
              local_a40._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar210);
              fVar194 = local_a40._0_4_;
              local_820._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar210);
              auVar34._8_4_ = 0x80000000;
              auVar34._0_8_ = 0x8000000080000000;
              auVar34._12_4_ = 0x80000000;
              auVar95 = vxorps_avx512vl(local_800._0_16_,auVar34);
              auVar99 = vfnmadd213ss_fma(local_820._0_16_,local_800._0_16_,ZEXT416(0x40000000));
              local_840._0_4_ = auVar99._0_4_;
              local_9a0._0_4_ = auVar94._0_4_;
              if (fVar192 < auVar95._0_4_) {
                fVar162 = sqrtf(fVar192);
                auVar94 = ZEXT416((uint)local_9a0._0_4_);
              }
              else {
                auVar99 = vsqrtss_avx(local_800._0_16_,local_800._0_16_);
                fVar162 = auVar99._0_4_;
              }
              fVar196 = local_a40._0_4_;
              auVar92 = vbroadcastss_avx512vl
                                  (ZEXT416((uint)(fVar194 * 1.5 +
                                                 fVar192 * -0.5 * fVar196 * fVar196 * fVar196)));
              auVar95 = vmulps_avx512vl(auVar91,auVar92);
              local_a40._0_16_ = vdpps_avx(auVar5,auVar95,0x7f);
              auVar97 = vaddss_avx512f(auVar94,ZEXT416(0x3f800000));
              auVar167._0_4_ = local_a40._0_4_ * local_a40._0_4_;
              auVar167._4_4_ = local_a40._4_4_ * local_a40._4_4_;
              auVar167._8_4_ = local_a40._8_4_ * local_a40._8_4_;
              auVar167._12_4_ = local_a40._12_4_ * local_a40._12_4_;
              auVar99 = vsubps_avx(local_a80._0_16_,auVar167);
              fVar192 = auVar99._0_4_;
              auVar181._4_12_ = ZEXT812(0) << 0x20;
              auVar181._0_4_ = fVar192;
              auVar96 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar181);
              auVar100 = vmulss_avx512f(auVar96,ZEXT416(0x3fc00000));
              auVar101 = vmulss_avx512f(auVar99,ZEXT416(0xbf000000));
              uVar88 = fVar192 == 0.0;
              uVar87 = fVar192 < 0.0;
              if ((bool)uVar87) {
                local_930._0_4_ = auVar100._0_4_;
                _local_950 = auVar92;
                local_940 = auVar95;
                local_920 = auVar96;
                fVar192 = sqrtf(fVar192);
                auVar101 = ZEXT416(auVar101._0_4_);
                auVar100 = ZEXT416((uint)local_930._0_4_);
                auVar94 = ZEXT416((uint)local_9a0._0_4_);
                auVar97 = ZEXT416(auVar97._0_4_);
                auVar95 = local_940;
                auVar96 = local_920;
                auVar92 = _local_950;
              }
              else {
                auVar99 = vsqrtss_avx(auVar99,auVar99);
                fVar192 = auVar99._0_4_;
              }
              in_ZMM31 = ZEXT1664(auVar92);
              auVar260 = ZEXT3264(local_aa0);
              auVar261 = ZEXT3264(local_ac0);
              auVar262 = ZEXT3264(local_ae0);
              auVar263 = ZEXT3264(local_b00);
              auVar264 = ZEXT3264(local_b20);
              auVar98 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),_local_7c0,local_7e0._0_16_);
              auVar99 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_7e0._0_16_,_local_7c0);
              fVar194 = auVar99._0_4_ * 6.0;
              fVar196 = local_7e0._0_4_ * 6.0;
              auVar229._0_4_ = fVar196 * (float)local_8e0._0_4_;
              auVar229._4_4_ = fVar196 * (float)local_8e0._4_4_;
              auVar229._8_4_ = fVar196 * fStack_8d8;
              auVar229._12_4_ = fVar196 * fStack_8d4;
              auVar211._4_4_ = fVar194;
              auVar211._0_4_ = fVar194;
              auVar211._8_4_ = fVar194;
              auVar211._12_4_ = fVar194;
              auVar99 = vfmadd132ps_fma(auVar211,auVar229,local_8a0._0_16_);
              fVar194 = auVar98._0_4_ * 6.0;
              auVar182._4_4_ = fVar194;
              auVar182._0_4_ = fVar194;
              auVar182._8_4_ = fVar194;
              auVar182._12_4_ = fVar194;
              auVar99 = vfmadd132ps_fma(auVar182,auVar99,local_8c0._0_16_);
              fVar194 = local_7c0._0_4_ * 6.0;
              auVar212._4_4_ = fVar194;
              auVar212._0_4_ = fVar194;
              auVar212._8_4_ = fVar194;
              auVar212._12_4_ = fVar194;
              auVar99 = vfmadd132ps_fma(auVar212,auVar99,local_880._0_16_);
              auVar183._0_4_ = auVar99._0_4_ * (float)local_800._0_4_;
              auVar183._4_4_ = auVar99._4_4_ * (float)local_800._0_4_;
              auVar183._8_4_ = auVar99._8_4_ * (float)local_800._0_4_;
              auVar183._12_4_ = auVar99._12_4_ * (float)local_800._0_4_;
              auVar99 = vdpps_avx(auVar91,auVar99,0x7f);
              fVar194 = auVar99._0_4_;
              auVar213._0_4_ = auVar91._0_4_ * fVar194;
              auVar213._4_4_ = auVar91._4_4_ * fVar194;
              auVar213._8_4_ = auVar91._8_4_ * fVar194;
              auVar213._12_4_ = auVar91._12_4_ * fVar194;
              auVar99 = vsubps_avx(auVar183,auVar213);
              fVar194 = (float)local_840._0_4_ * (float)local_820._0_4_;
              auVar98 = vmaxss_avx(ZEXT416((uint)fVar160),
                                   ZEXT416((uint)(local_740._0_4_ * fVar190 * 1.9073486e-06)));
              auVar184._0_4_ = auVar99._0_4_ * fVar194;
              auVar184._4_4_ = auVar99._4_4_ * fVar194;
              auVar184._8_4_ = auVar99._8_4_ * fVar194;
              auVar184._12_4_ = auVar99._12_4_ * fVar194;
              auVar35._8_4_ = 0x80000000;
              auVar35._0_8_ = 0x8000000080000000;
              auVar35._12_4_ = 0x80000000;
              auVar102 = vxorps_avx512vl(auVar91,auVar35);
              auVar103 = vmulps_avx512vl(auVar92,auVar184);
              auVar99 = vdpps_avx(auVar102,auVar95,0x7f);
              auVar92 = vfmadd213ss_fma(auVar94,ZEXT416((uint)fVar160),auVar98);
              auVar94 = vdpps_avx(auVar5,auVar103,0x7f);
              vfmadd213ss_avx512f(auVar97,ZEXT416((uint)(fVar160 / fVar162)),auVar92);
              fVar194 = auVar99._0_4_ + auVar94._0_4_;
              auVar94 = vdpps_avx(local_a10,auVar95,0x7f);
              auVar99 = vdpps_avx(auVar5,auVar102,0x7f);
              auVar95 = vmulss_avx512f(auVar101,auVar96);
              auVar92 = vmulss_avx512f(auVar96,auVar96);
              auVar96 = vaddss_avx512f(auVar100,ZEXT416((uint)(auVar95._0_4_ * auVar92._0_4_)));
              auVar95 = vdpps_avx(auVar5,local_a10,0x7f);
              auVar97 = vfnmadd231ss_avx512f(auVar99,local_a40._0_16_,ZEXT416((uint)fVar194));
              auVar95 = vfnmadd231ss_avx512f(auVar95,local_a40._0_16_,auVar94);
              auVar99 = vpermilps_avx(local_7a0._0_16_,0xff);
              fVar192 = fVar192 - auVar99._0_4_;
              auVar92 = vshufps_avx(auVar91,auVar91,0xff);
              auVar99 = vfmsub213ss_fma(auVar97,auVar96,auVar92);
              auVar253._0_8_ = auVar99._0_8_ ^ 0x8000000080000000;
              auVar253._8_4_ = auVar99._8_4_ ^ 0x80000000;
              auVar253._12_4_ = auVar99._12_4_ ^ 0x80000000;
              auVar95 = ZEXT416((uint)(auVar95._0_4_ * auVar96._0_4_));
              auVar96 = vfmsub231ss_fma(ZEXT416((uint)(auVar94._0_4_ * auVar99._0_4_)),
                                        ZEXT416((uint)fVar194),auVar95);
              auVar99 = vinsertps_avx(auVar253,auVar95,0x1c);
              auVar244._0_8_ = auVar94._0_8_ ^ 0x8000000080000000;
              auVar244._8_4_ = auVar94._8_4_ ^ 0x80000000;
              auVar244._12_4_ = auVar94._12_4_ ^ 0x80000000;
              auVar95 = vinsertps_avx(ZEXT416((uint)fVar194),auVar244,0x10);
              auVar230._0_4_ = auVar96._0_4_;
              auVar230._4_4_ = auVar230._0_4_;
              auVar230._8_4_ = auVar230._0_4_;
              auVar230._12_4_ = auVar230._0_4_;
              auVar94 = vdivps_avx(auVar99,auVar230);
              auVar99 = vdivps_avx(auVar95,auVar230);
              auVar95 = vbroadcastss_avx512vl(local_a40._0_16_);
              auVar231._0_4_ = auVar95._0_4_ * auVar94._0_4_ + fVar192 * auVar99._0_4_;
              auVar231._4_4_ = auVar95._4_4_ * auVar94._4_4_ + fVar192 * auVar99._4_4_;
              auVar231._8_4_ = auVar95._8_4_ * auVar94._8_4_ + fVar192 * auVar99._8_4_;
              auVar231._12_4_ = auVar95._12_4_ * auVar94._12_4_ + fVar192 * auVar99._12_4_;
              auVar94 = vsubps_avx(local_740._0_16_,auVar231);
              auVar173 = ZEXT1664(auVar94);
              auVar36._8_4_ = 0x7fffffff;
              auVar36._0_8_ = 0x7fffffff7fffffff;
              auVar36._12_4_ = 0x7fffffff;
              auVar99 = vandps_avx512vl(local_a40._0_16_,auVar36);
              auVar99 = vucomiss_avx512f(auVar99);
              if (!(bool)uVar87 && !(bool)uVar88) {
                auVar99 = vaddss_avx512f(auVar98,auVar99);
                auVar99 = vfmadd231ss_fma(auVar99,local_960,ZEXT416(0x36000000));
                auVar37._8_4_ = 0x7fffffff;
                auVar37._0_8_ = 0x7fffffff7fffffff;
                auVar37._12_4_ = 0x7fffffff;
                auVar95 = vandps_avx512vl(ZEXT416((uint)fVar192),auVar37);
                if (auVar95._0_4_ < auVar99._0_4_) {
                  fVar190 = auVar94._0_4_ + (float)local_970._0_4_;
                  if ((fVar190 < fVar221) ||
                     (fVar192 = *(float *)(ray + k * 4 + 0x200), fVar192 < fVar190)) break;
                  auVar94 = vmovshdup_avx(auVar94);
                  fVar194 = auVar94._0_4_;
                  if ((fVar194 < 0.0) || (1.0 < fVar194)) break;
                  auVar94 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_a80._0_4_));
                  fVar162 = auVar94._0_4_;
                  pGVar8 = (context->scene->geometries).items[uVar84].ptr;
                  if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) break;
                  fVar162 = fVar162 * 1.5 +
                            (float)local_a80._0_4_ * -0.5 * fVar162 * fVar162 * fVar162;
                  auVar232._0_4_ = auVar5._0_4_ * fVar162;
                  auVar232._4_4_ = auVar5._4_4_ * fVar162;
                  auVar232._8_4_ = auVar5._8_4_ * fVar162;
                  auVar232._12_4_ = auVar5._12_4_ * fVar162;
                  auVar99 = vfmadd213ps_fma(auVar92,auVar232,auVar91);
                  auVar94 = vshufps_avx(auVar232,auVar232,0xc9);
                  auVar5 = vshufps_avx(auVar91,auVar91,0xc9);
                  auVar233._0_4_ = auVar232._0_4_ * auVar5._0_4_;
                  auVar233._4_4_ = auVar232._4_4_ * auVar5._4_4_;
                  auVar233._8_4_ = auVar232._8_4_ * auVar5._8_4_;
                  auVar233._12_4_ = auVar232._12_4_ * auVar5._12_4_;
                  auVar91 = vfmsub231ps_fma(auVar233,auVar91,auVar94);
                  auVar94 = vshufps_avx(auVar91,auVar91,0xc9);
                  auVar5 = vshufps_avx(auVar99,auVar99,0xc9);
                  auVar91 = vshufps_avx(auVar91,auVar91,0xd2);
                  auVar185._0_4_ = auVar99._0_4_ * auVar91._0_4_;
                  auVar185._4_4_ = auVar99._4_4_ * auVar91._4_4_;
                  auVar185._8_4_ = auVar99._8_4_ * auVar91._8_4_;
                  auVar185._12_4_ = auVar99._12_4_ * auVar91._12_4_;
                  auVar94 = vfmsub231ps_fma(auVar185,auVar94,auVar5);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x200) = fVar190;
                    uVar161 = vextractps_avx(auVar94,1);
                    *(undefined4 *)(ray + k * 4 + 0x300) = uVar161;
                    uVar161 = vextractps_avx(auVar94,2);
                    *(undefined4 *)(ray + k * 4 + 0x340) = uVar161;
                    *(int *)(ray + k * 4 + 0x380) = auVar94._0_4_;
                    *(float *)(ray + k * 4 + 0x3c0) = fVar194;
                    *(undefined4 *)(ray + k * 4 + 0x400) = 0;
                    *(uint *)(ray + k * 4 + 0x440) = uVar7;
                    *(uint *)(ray + k * 4 + 0x480) = uVar84;
                    *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                    break;
                  }
                  pRVar10 = context->user;
                  auVar240 = vbroadcastss_avx512f(ZEXT416(1));
                  local_340 = vpermps_avx512f(auVar240,auVar173);
                  auVar173 = vpermps_avx512f(auVar240,ZEXT1664(auVar94));
                  auVar240 = vbroadcastss_avx512f(ZEXT416(2));
                  local_3c0 = vpermps_avx512f(auVar240,ZEXT1664(auVar94));
                  local_380 = vbroadcastss_avx512f(auVar94);
                  local_400[0] = (RTCHitN)auVar173[0];
                  local_400[1] = (RTCHitN)auVar173[1];
                  local_400[2] = (RTCHitN)auVar173[2];
                  local_400[3] = (RTCHitN)auVar173[3];
                  local_400[4] = (RTCHitN)auVar173[4];
                  local_400[5] = (RTCHitN)auVar173[5];
                  local_400[6] = (RTCHitN)auVar173[6];
                  local_400[7] = (RTCHitN)auVar173[7];
                  local_400[8] = (RTCHitN)auVar173[8];
                  local_400[9] = (RTCHitN)auVar173[9];
                  local_400[10] = (RTCHitN)auVar173[10];
                  local_400[0xb] = (RTCHitN)auVar173[0xb];
                  local_400[0xc] = (RTCHitN)auVar173[0xc];
                  local_400[0xd] = (RTCHitN)auVar173[0xd];
                  local_400[0xe] = (RTCHitN)auVar173[0xe];
                  local_400[0xf] = (RTCHitN)auVar173[0xf];
                  local_400[0x10] = (RTCHitN)auVar173[0x10];
                  local_400[0x11] = (RTCHitN)auVar173[0x11];
                  local_400[0x12] = (RTCHitN)auVar173[0x12];
                  local_400[0x13] = (RTCHitN)auVar173[0x13];
                  local_400[0x14] = (RTCHitN)auVar173[0x14];
                  local_400[0x15] = (RTCHitN)auVar173[0x15];
                  local_400[0x16] = (RTCHitN)auVar173[0x16];
                  local_400[0x17] = (RTCHitN)auVar173[0x17];
                  local_400[0x18] = (RTCHitN)auVar173[0x18];
                  local_400[0x19] = (RTCHitN)auVar173[0x19];
                  local_400[0x1a] = (RTCHitN)auVar173[0x1a];
                  local_400[0x1b] = (RTCHitN)auVar173[0x1b];
                  local_400[0x1c] = (RTCHitN)auVar173[0x1c];
                  local_400[0x1d] = (RTCHitN)auVar173[0x1d];
                  local_400[0x1e] = (RTCHitN)auVar173[0x1e];
                  local_400[0x1f] = (RTCHitN)auVar173[0x1f];
                  local_400[0x20] = (RTCHitN)auVar173[0x20];
                  local_400[0x21] = (RTCHitN)auVar173[0x21];
                  local_400[0x22] = (RTCHitN)auVar173[0x22];
                  local_400[0x23] = (RTCHitN)auVar173[0x23];
                  local_400[0x24] = (RTCHitN)auVar173[0x24];
                  local_400[0x25] = (RTCHitN)auVar173[0x25];
                  local_400[0x26] = (RTCHitN)auVar173[0x26];
                  local_400[0x27] = (RTCHitN)auVar173[0x27];
                  local_400[0x28] = (RTCHitN)auVar173[0x28];
                  local_400[0x29] = (RTCHitN)auVar173[0x29];
                  local_400[0x2a] = (RTCHitN)auVar173[0x2a];
                  local_400[0x2b] = (RTCHitN)auVar173[0x2b];
                  local_400[0x2c] = (RTCHitN)auVar173[0x2c];
                  local_400[0x2d] = (RTCHitN)auVar173[0x2d];
                  local_400[0x2e] = (RTCHitN)auVar173[0x2e];
                  local_400[0x2f] = (RTCHitN)auVar173[0x2f];
                  local_400[0x30] = (RTCHitN)auVar173[0x30];
                  local_400[0x31] = (RTCHitN)auVar173[0x31];
                  local_400[0x32] = (RTCHitN)auVar173[0x32];
                  local_400[0x33] = (RTCHitN)auVar173[0x33];
                  local_400[0x34] = (RTCHitN)auVar173[0x34];
                  local_400[0x35] = (RTCHitN)auVar173[0x35];
                  local_400[0x36] = (RTCHitN)auVar173[0x36];
                  local_400[0x37] = (RTCHitN)auVar173[0x37];
                  local_400[0x38] = (RTCHitN)auVar173[0x38];
                  local_400[0x39] = (RTCHitN)auVar173[0x39];
                  local_400[0x3a] = (RTCHitN)auVar173[0x3a];
                  local_400[0x3b] = (RTCHitN)auVar173[0x3b];
                  local_400[0x3c] = (RTCHitN)auVar173[0x3c];
                  local_400[0x3d] = (RTCHitN)auVar173[0x3d];
                  local_400[0x3e] = (RTCHitN)auVar173[0x3e];
                  local_400[0x3f] = (RTCHitN)auVar173[0x3f];
                  local_300 = 0;
                  uStack_2f8 = 0;
                  uStack_2f0 = 0;
                  uStack_2e8 = 0;
                  uStack_2e0 = 0;
                  uStack_2d8 = 0;
                  uStack_2d0 = 0;
                  uStack_2c8 = 0;
                  local_2c0 = local_480._0_8_;
                  uStack_2b8 = local_480._8_8_;
                  uStack_2b0 = local_480._16_8_;
                  uStack_2a8 = local_480._24_8_;
                  uStack_2a0 = local_480._32_8_;
                  uStack_298 = local_480._40_8_;
                  uStack_290 = local_480._48_8_;
                  uStack_288 = local_480._56_8_;
                  auVar173 = vmovdqa64_avx512f(local_440);
                  local_280 = vmovdqa64_avx512f(auVar173);
                  auVar115 = vpcmpeqd_avx2(auVar173._0_32_,auVar173._0_32_);
                  local_a48[3] = auVar115;
                  local_a48[2] = auVar115;
                  local_a48[1] = auVar115;
                  *local_a48 = auVar115;
                  local_240 = vbroadcastss_avx512f(ZEXT416(pRVar10->instID[0]));
                  local_200 = vbroadcastss_avx512f(ZEXT416(pRVar10->instPrimID[0]));
                  *(float *)(ray + k * 4 + 0x200) = fVar190;
                  auVar173 = vmovdqa64_avx512f(local_4c0);
                  local_700 = vmovdqa64_avx512f(auVar173);
                  local_b50.valid = (int *)local_700;
                  local_b50.geometryUserPtr = pGVar8->userPtr;
                  local_b50.context = context->user;
                  local_b50.hit = local_400;
                  local_b50.N = 0x10;
                  local_b50.ray = (RTCRayN *)ray;
                  if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar8->intersectionFilterN)(&local_b50);
                    auVar264 = ZEXT3264(local_b20);
                    auVar263 = ZEXT3264(local_b00);
                    auVar262 = ZEXT3264(local_ae0);
                    auVar261 = ZEXT3264(local_ac0);
                    auVar260 = ZEXT3264(local_aa0);
                    auVar173 = vmovdqa64_avx512f(local_700);
                  }
                  uVar26 = vptestmd_avx512f(auVar173,auVar173);
                  if ((short)uVar26 != 0) {
                    p_Var9 = context->args->filter;
                    if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var9)(&local_b50);
                      auVar264 = ZEXT3264(local_b20);
                      auVar263 = ZEXT3264(local_b00);
                      auVar262 = ZEXT3264(local_ae0);
                      auVar261 = ZEXT3264(local_ac0);
                      auVar260 = ZEXT3264(local_aa0);
                      auVar173 = vmovdqa64_avx512f(local_700);
                    }
                    uVar83 = vptestmd_avx512f(auVar173,auVar173);
                    if ((short)uVar83 != 0) {
                      iVar3 = *(int *)(local_b50.hit + 4);
                      iVar4 = *(int *)(local_b50.hit + 8);
                      iVar1 = *(int *)(local_b50.hit + 0xc);
                      iVar59 = *(int *)(local_b50.hit + 0x10);
                      iVar60 = *(int *)(local_b50.hit + 0x14);
                      iVar61 = *(int *)(local_b50.hit + 0x18);
                      iVar62 = *(int *)(local_b50.hit + 0x1c);
                      iVar63 = *(int *)(local_b50.hit + 0x20);
                      iVar64 = *(int *)(local_b50.hit + 0x24);
                      iVar65 = *(int *)(local_b50.hit + 0x28);
                      iVar66 = *(int *)(local_b50.hit + 0x2c);
                      iVar67 = *(int *)(local_b50.hit + 0x30);
                      iVar68 = *(int *)(local_b50.hit + 0x34);
                      iVar69 = *(int *)(local_b50.hit + 0x38);
                      iVar70 = *(int *)(local_b50.hit + 0x3c);
                      bVar86 = (byte)uVar83;
                      bVar11 = (bool)((byte)(uVar83 >> 1) & 1);
                      bVar12 = (bool)((byte)(uVar83 >> 2) & 1);
                      bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
                      bVar14 = (bool)((byte)(uVar83 >> 4) & 1);
                      bVar15 = (bool)((byte)(uVar83 >> 5) & 1);
                      bVar16 = (bool)((byte)(uVar83 >> 6) & 1);
                      bVar17 = (bool)((byte)(uVar83 >> 7) & 1);
                      bVar77 = (byte)(uVar83 >> 8);
                      bVar18 = (bool)((byte)(uVar83 >> 9) & 1);
                      bVar19 = (bool)((byte)(uVar83 >> 10) & 1);
                      bVar20 = (bool)((byte)(uVar83 >> 0xb) & 1);
                      bVar21 = (bool)((byte)(uVar83 >> 0xc) & 1);
                      bVar22 = (bool)((byte)(uVar83 >> 0xd) & 1);
                      bVar23 = (bool)((byte)(uVar83 >> 0xe) & 1);
                      bVar24 = SUB81(uVar83 >> 0xf,0);
                      *(uint *)(local_b50.ray + 0x300) =
                           (uint)(bVar86 & 1) * *(int *)local_b50.hit |
                           (uint)!(bool)(bVar86 & 1) * *(int *)(local_b50.ray + 0x300);
                      *(uint *)(local_b50.ray + 0x304) =
                           (uint)bVar11 * iVar3 | (uint)!bVar11 * *(int *)(local_b50.ray + 0x304);
                      *(uint *)(local_b50.ray + 0x308) =
                           (uint)bVar12 * iVar4 | (uint)!bVar12 * *(int *)(local_b50.ray + 0x308);
                      *(uint *)(local_b50.ray + 0x30c) =
                           (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_b50.ray + 0x30c);
                      *(uint *)(local_b50.ray + 0x310) =
                           (uint)bVar14 * iVar59 | (uint)!bVar14 * *(int *)(local_b50.ray + 0x310);
                      *(uint *)(local_b50.ray + 0x314) =
                           (uint)bVar15 * iVar60 | (uint)!bVar15 * *(int *)(local_b50.ray + 0x314);
                      *(uint *)(local_b50.ray + 0x318) =
                           (uint)bVar16 * iVar61 | (uint)!bVar16 * *(int *)(local_b50.ray + 0x318);
                      *(uint *)(local_b50.ray + 0x31c) =
                           (uint)bVar17 * iVar62 | (uint)!bVar17 * *(int *)(local_b50.ray + 0x31c);
                      *(uint *)(local_b50.ray + 800) =
                           (uint)(bVar77 & 1) * iVar63 |
                           (uint)!(bool)(bVar77 & 1) * *(int *)(local_b50.ray + 800);
                      *(uint *)(local_b50.ray + 0x324) =
                           (uint)bVar18 * iVar64 | (uint)!bVar18 * *(int *)(local_b50.ray + 0x324);
                      *(uint *)(local_b50.ray + 0x328) =
                           (uint)bVar19 * iVar65 | (uint)!bVar19 * *(int *)(local_b50.ray + 0x328);
                      *(uint *)(local_b50.ray + 0x32c) =
                           (uint)bVar20 * iVar66 | (uint)!bVar20 * *(int *)(local_b50.ray + 0x32c);
                      *(uint *)(local_b50.ray + 0x330) =
                           (uint)bVar21 * iVar67 | (uint)!bVar21 * *(int *)(local_b50.ray + 0x330);
                      *(uint *)(local_b50.ray + 0x334) =
                           (uint)bVar22 * iVar68 | (uint)!bVar22 * *(int *)(local_b50.ray + 0x334);
                      *(uint *)(local_b50.ray + 0x338) =
                           (uint)bVar23 * iVar69 | (uint)!bVar23 * *(int *)(local_b50.ray + 0x338);
                      *(uint *)(local_b50.ray + 0x33c) =
                           (uint)bVar24 * iVar70 | (uint)!bVar24 * *(int *)(local_b50.ray + 0x33c);
                      iVar3 = *(int *)(local_b50.hit + 0x44);
                      iVar4 = *(int *)(local_b50.hit + 0x48);
                      iVar1 = *(int *)(local_b50.hit + 0x4c);
                      iVar59 = *(int *)(local_b50.hit + 0x50);
                      iVar60 = *(int *)(local_b50.hit + 0x54);
                      iVar61 = *(int *)(local_b50.hit + 0x58);
                      iVar62 = *(int *)(local_b50.hit + 0x5c);
                      iVar63 = *(int *)(local_b50.hit + 0x60);
                      iVar64 = *(int *)(local_b50.hit + 100);
                      iVar65 = *(int *)(local_b50.hit + 0x68);
                      iVar66 = *(int *)(local_b50.hit + 0x6c);
                      iVar67 = *(int *)(local_b50.hit + 0x70);
                      iVar68 = *(int *)(local_b50.hit + 0x74);
                      iVar69 = *(int *)(local_b50.hit + 0x78);
                      iVar70 = *(int *)(local_b50.hit + 0x7c);
                      bVar11 = (bool)((byte)(uVar83 >> 1) & 1);
                      bVar12 = (bool)((byte)(uVar83 >> 2) & 1);
                      bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
                      bVar14 = (bool)((byte)(uVar83 >> 4) & 1);
                      bVar15 = (bool)((byte)(uVar83 >> 5) & 1);
                      bVar16 = (bool)((byte)(uVar83 >> 6) & 1);
                      bVar17 = (bool)((byte)(uVar83 >> 7) & 1);
                      bVar18 = (bool)((byte)(uVar83 >> 9) & 1);
                      bVar19 = (bool)((byte)(uVar83 >> 10) & 1);
                      bVar20 = (bool)((byte)(uVar83 >> 0xb) & 1);
                      bVar21 = (bool)((byte)(uVar83 >> 0xc) & 1);
                      bVar22 = (bool)((byte)(uVar83 >> 0xd) & 1);
                      bVar23 = (bool)((byte)(uVar83 >> 0xe) & 1);
                      bVar24 = SUB81(uVar83 >> 0xf,0);
                      *(uint *)(local_b50.ray + 0x340) =
                           (uint)(bVar86 & 1) * *(int *)(local_b50.hit + 0x40) |
                           (uint)!(bool)(bVar86 & 1) * *(int *)(local_b50.ray + 0x340);
                      *(uint *)(local_b50.ray + 0x344) =
                           (uint)bVar11 * iVar3 | (uint)!bVar11 * *(int *)(local_b50.ray + 0x344);
                      *(uint *)(local_b50.ray + 0x348) =
                           (uint)bVar12 * iVar4 | (uint)!bVar12 * *(int *)(local_b50.ray + 0x348);
                      *(uint *)(local_b50.ray + 0x34c) =
                           (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_b50.ray + 0x34c);
                      *(uint *)(local_b50.ray + 0x350) =
                           (uint)bVar14 * iVar59 | (uint)!bVar14 * *(int *)(local_b50.ray + 0x350);
                      *(uint *)(local_b50.ray + 0x354) =
                           (uint)bVar15 * iVar60 | (uint)!bVar15 * *(int *)(local_b50.ray + 0x354);
                      *(uint *)(local_b50.ray + 0x358) =
                           (uint)bVar16 * iVar61 | (uint)!bVar16 * *(int *)(local_b50.ray + 0x358);
                      *(uint *)(local_b50.ray + 0x35c) =
                           (uint)bVar17 * iVar62 | (uint)!bVar17 * *(int *)(local_b50.ray + 0x35c);
                      *(uint *)(local_b50.ray + 0x360) =
                           (uint)(bVar77 & 1) * iVar63 |
                           (uint)!(bool)(bVar77 & 1) * *(int *)(local_b50.ray + 0x360);
                      *(uint *)(local_b50.ray + 0x364) =
                           (uint)bVar18 * iVar64 | (uint)!bVar18 * *(int *)(local_b50.ray + 0x364);
                      *(uint *)(local_b50.ray + 0x368) =
                           (uint)bVar19 * iVar65 | (uint)!bVar19 * *(int *)(local_b50.ray + 0x368);
                      *(uint *)(local_b50.ray + 0x36c) =
                           (uint)bVar20 * iVar66 | (uint)!bVar20 * *(int *)(local_b50.ray + 0x36c);
                      *(uint *)(local_b50.ray + 0x370) =
                           (uint)bVar21 * iVar67 | (uint)!bVar21 * *(int *)(local_b50.ray + 0x370);
                      *(uint *)(local_b50.ray + 0x374) =
                           (uint)bVar22 * iVar68 | (uint)!bVar22 * *(int *)(local_b50.ray + 0x374);
                      *(uint *)(local_b50.ray + 0x378) =
                           (uint)bVar23 * iVar69 | (uint)!bVar23 * *(int *)(local_b50.ray + 0x378);
                      *(uint *)(local_b50.ray + 0x37c) =
                           (uint)bVar24 * iVar70 | (uint)!bVar24 * *(int *)(local_b50.ray + 0x37c);
                      iVar3 = *(int *)(local_b50.hit + 0x84);
                      iVar4 = *(int *)(local_b50.hit + 0x88);
                      iVar1 = *(int *)(local_b50.hit + 0x8c);
                      iVar59 = *(int *)(local_b50.hit + 0x90);
                      iVar60 = *(int *)(local_b50.hit + 0x94);
                      iVar61 = *(int *)(local_b50.hit + 0x98);
                      iVar62 = *(int *)(local_b50.hit + 0x9c);
                      iVar63 = *(int *)(local_b50.hit + 0xa0);
                      iVar64 = *(int *)(local_b50.hit + 0xa4);
                      iVar65 = *(int *)(local_b50.hit + 0xa8);
                      iVar66 = *(int *)(local_b50.hit + 0xac);
                      iVar67 = *(int *)(local_b50.hit + 0xb0);
                      iVar68 = *(int *)(local_b50.hit + 0xb4);
                      iVar69 = *(int *)(local_b50.hit + 0xb8);
                      iVar70 = *(int *)(local_b50.hit + 0xbc);
                      bVar11 = (bool)((byte)(uVar83 >> 1) & 1);
                      bVar12 = (bool)((byte)(uVar83 >> 2) & 1);
                      bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
                      bVar14 = (bool)((byte)(uVar83 >> 4) & 1);
                      bVar15 = (bool)((byte)(uVar83 >> 5) & 1);
                      bVar16 = (bool)((byte)(uVar83 >> 6) & 1);
                      bVar17 = (bool)((byte)(uVar83 >> 7) & 1);
                      bVar18 = (bool)((byte)(uVar83 >> 9) & 1);
                      bVar19 = (bool)((byte)(uVar83 >> 10) & 1);
                      bVar20 = (bool)((byte)(uVar83 >> 0xb) & 1);
                      bVar21 = (bool)((byte)(uVar83 >> 0xc) & 1);
                      bVar22 = (bool)((byte)(uVar83 >> 0xd) & 1);
                      bVar23 = (bool)((byte)(uVar83 >> 0xe) & 1);
                      bVar24 = SUB81(uVar83 >> 0xf,0);
                      *(uint *)(local_b50.ray + 0x380) =
                           (uint)(bVar86 & 1) * *(int *)(local_b50.hit + 0x80) |
                           (uint)!(bool)(bVar86 & 1) * *(int *)(local_b50.ray + 0x380);
                      *(uint *)(local_b50.ray + 900) =
                           (uint)bVar11 * iVar3 | (uint)!bVar11 * *(int *)(local_b50.ray + 900);
                      *(uint *)(local_b50.ray + 0x388) =
                           (uint)bVar12 * iVar4 | (uint)!bVar12 * *(int *)(local_b50.ray + 0x388);
                      *(uint *)(local_b50.ray + 0x38c) =
                           (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_b50.ray + 0x38c);
                      *(uint *)(local_b50.ray + 0x390) =
                           (uint)bVar14 * iVar59 | (uint)!bVar14 * *(int *)(local_b50.ray + 0x390);
                      *(uint *)(local_b50.ray + 0x394) =
                           (uint)bVar15 * iVar60 | (uint)!bVar15 * *(int *)(local_b50.ray + 0x394);
                      *(uint *)(local_b50.ray + 0x398) =
                           (uint)bVar16 * iVar61 | (uint)!bVar16 * *(int *)(local_b50.ray + 0x398);
                      *(uint *)(local_b50.ray + 0x39c) =
                           (uint)bVar17 * iVar62 | (uint)!bVar17 * *(int *)(local_b50.ray + 0x39c);
                      *(uint *)(local_b50.ray + 0x3a0) =
                           (uint)(bVar77 & 1) * iVar63 |
                           (uint)!(bool)(bVar77 & 1) * *(int *)(local_b50.ray + 0x3a0);
                      *(uint *)(local_b50.ray + 0x3a4) =
                           (uint)bVar18 * iVar64 | (uint)!bVar18 * *(int *)(local_b50.ray + 0x3a4);
                      *(uint *)(local_b50.ray + 0x3a8) =
                           (uint)bVar19 * iVar65 | (uint)!bVar19 * *(int *)(local_b50.ray + 0x3a8);
                      *(uint *)(local_b50.ray + 0x3ac) =
                           (uint)bVar20 * iVar66 | (uint)!bVar20 * *(int *)(local_b50.ray + 0x3ac);
                      *(uint *)(local_b50.ray + 0x3b0) =
                           (uint)bVar21 * iVar67 | (uint)!bVar21 * *(int *)(local_b50.ray + 0x3b0);
                      *(uint *)(local_b50.ray + 0x3b4) =
                           (uint)bVar22 * iVar68 | (uint)!bVar22 * *(int *)(local_b50.ray + 0x3b4);
                      *(uint *)(local_b50.ray + 0x3b8) =
                           (uint)bVar23 * iVar69 | (uint)!bVar23 * *(int *)(local_b50.ray + 0x3b8);
                      *(uint *)(local_b50.ray + 0x3bc) =
                           (uint)bVar24 * iVar70 | (uint)!bVar24 * *(int *)(local_b50.ray + 0x3bc);
                      iVar3 = *(int *)(local_b50.hit + 0xc4);
                      iVar4 = *(int *)(local_b50.hit + 200);
                      iVar1 = *(int *)(local_b50.hit + 0xcc);
                      iVar59 = *(int *)(local_b50.hit + 0xd0);
                      iVar60 = *(int *)(local_b50.hit + 0xd4);
                      iVar61 = *(int *)(local_b50.hit + 0xd8);
                      iVar62 = *(int *)(local_b50.hit + 0xdc);
                      iVar63 = *(int *)(local_b50.hit + 0xe0);
                      iVar64 = *(int *)(local_b50.hit + 0xe4);
                      iVar65 = *(int *)(local_b50.hit + 0xe8);
                      iVar66 = *(int *)(local_b50.hit + 0xec);
                      iVar67 = *(int *)(local_b50.hit + 0xf0);
                      iVar68 = *(int *)(local_b50.hit + 0xf4);
                      iVar69 = *(int *)(local_b50.hit + 0xf8);
                      iVar70 = *(int *)(local_b50.hit + 0xfc);
                      bVar11 = (bool)((byte)(uVar83 >> 1) & 1);
                      bVar12 = (bool)((byte)(uVar83 >> 2) & 1);
                      bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
                      bVar14 = (bool)((byte)(uVar83 >> 4) & 1);
                      bVar15 = (bool)((byte)(uVar83 >> 5) & 1);
                      bVar16 = (bool)((byte)(uVar83 >> 6) & 1);
                      bVar17 = (bool)((byte)(uVar83 >> 7) & 1);
                      bVar18 = (bool)((byte)(uVar83 >> 9) & 1);
                      bVar19 = (bool)((byte)(uVar83 >> 10) & 1);
                      bVar20 = (bool)((byte)(uVar83 >> 0xb) & 1);
                      bVar21 = (bool)((byte)(uVar83 >> 0xc) & 1);
                      bVar22 = (bool)((byte)(uVar83 >> 0xd) & 1);
                      bVar23 = (bool)((byte)(uVar83 >> 0xe) & 1);
                      bVar24 = SUB81(uVar83 >> 0xf,0);
                      *(uint *)(local_b50.ray + 0x3c0) =
                           (uint)(bVar86 & 1) * *(int *)(local_b50.hit + 0xc0) |
                           (uint)!(bool)(bVar86 & 1) * *(int *)(local_b50.ray + 0x3c0);
                      *(uint *)(local_b50.ray + 0x3c4) =
                           (uint)bVar11 * iVar3 | (uint)!bVar11 * *(int *)(local_b50.ray + 0x3c4);
                      *(uint *)(local_b50.ray + 0x3c8) =
                           (uint)bVar12 * iVar4 | (uint)!bVar12 * *(int *)(local_b50.ray + 0x3c8);
                      *(uint *)(local_b50.ray + 0x3cc) =
                           (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_b50.ray + 0x3cc);
                      *(uint *)(local_b50.ray + 0x3d0) =
                           (uint)bVar14 * iVar59 | (uint)!bVar14 * *(int *)(local_b50.ray + 0x3d0);
                      *(uint *)(local_b50.ray + 0x3d4) =
                           (uint)bVar15 * iVar60 | (uint)!bVar15 * *(int *)(local_b50.ray + 0x3d4);
                      *(uint *)(local_b50.ray + 0x3d8) =
                           (uint)bVar16 * iVar61 | (uint)!bVar16 * *(int *)(local_b50.ray + 0x3d8);
                      *(uint *)(local_b50.ray + 0x3dc) =
                           (uint)bVar17 * iVar62 | (uint)!bVar17 * *(int *)(local_b50.ray + 0x3dc);
                      *(uint *)(local_b50.ray + 0x3e0) =
                           (uint)(bVar77 & 1) * iVar63 |
                           (uint)!(bool)(bVar77 & 1) * *(int *)(local_b50.ray + 0x3e0);
                      *(uint *)(local_b50.ray + 0x3e4) =
                           (uint)bVar18 * iVar64 | (uint)!bVar18 * *(int *)(local_b50.ray + 0x3e4);
                      *(uint *)(local_b50.ray + 1000) =
                           (uint)bVar19 * iVar65 | (uint)!bVar19 * *(int *)(local_b50.ray + 1000);
                      *(uint *)(local_b50.ray + 0x3ec) =
                           (uint)bVar20 * iVar66 | (uint)!bVar20 * *(int *)(local_b50.ray + 0x3ec);
                      *(uint *)(local_b50.ray + 0x3f0) =
                           (uint)bVar21 * iVar67 | (uint)!bVar21 * *(int *)(local_b50.ray + 0x3f0);
                      *(uint *)(local_b50.ray + 0x3f4) =
                           (uint)bVar22 * iVar68 | (uint)!bVar22 * *(int *)(local_b50.ray + 0x3f4);
                      *(uint *)(local_b50.ray + 0x3f8) =
                           (uint)bVar23 * iVar69 | (uint)!bVar23 * *(int *)(local_b50.ray + 0x3f8);
                      *(uint *)(local_b50.ray + 0x3fc) =
                           (uint)bVar24 * iVar70 | (uint)!bVar24 * *(int *)(local_b50.ray + 0x3fc);
                      iVar3 = *(int *)(local_b50.hit + 0x104);
                      iVar4 = *(int *)(local_b50.hit + 0x108);
                      iVar1 = *(int *)(local_b50.hit + 0x10c);
                      iVar59 = *(int *)(local_b50.hit + 0x110);
                      iVar60 = *(int *)(local_b50.hit + 0x114);
                      iVar61 = *(int *)(local_b50.hit + 0x118);
                      iVar62 = *(int *)(local_b50.hit + 0x11c);
                      iVar63 = *(int *)(local_b50.hit + 0x120);
                      iVar64 = *(int *)(local_b50.hit + 0x124);
                      iVar65 = *(int *)(local_b50.hit + 0x128);
                      iVar66 = *(int *)(local_b50.hit + 300);
                      iVar67 = *(int *)(local_b50.hit + 0x130);
                      iVar68 = *(int *)(local_b50.hit + 0x134);
                      iVar69 = *(int *)(local_b50.hit + 0x138);
                      iVar70 = *(int *)(local_b50.hit + 0x13c);
                      bVar11 = (bool)((byte)(uVar83 >> 1) & 1);
                      bVar12 = (bool)((byte)(uVar83 >> 2) & 1);
                      bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
                      bVar14 = (bool)((byte)(uVar83 >> 4) & 1);
                      bVar15 = (bool)((byte)(uVar83 >> 5) & 1);
                      bVar16 = (bool)((byte)(uVar83 >> 6) & 1);
                      bVar17 = (bool)((byte)(uVar83 >> 7) & 1);
                      bVar18 = (bool)((byte)(uVar83 >> 9) & 1);
                      bVar19 = (bool)((byte)(uVar83 >> 10) & 1);
                      bVar20 = (bool)((byte)(uVar83 >> 0xb) & 1);
                      bVar21 = (bool)((byte)(uVar83 >> 0xc) & 1);
                      bVar22 = (bool)((byte)(uVar83 >> 0xd) & 1);
                      bVar23 = (bool)((byte)(uVar83 >> 0xe) & 1);
                      bVar24 = SUB81(uVar83 >> 0xf,0);
                      *(uint *)(local_b50.ray + 0x400) =
                           (uint)(bVar86 & 1) * *(int *)(local_b50.hit + 0x100) |
                           (uint)!(bool)(bVar86 & 1) * *(int *)(local_b50.ray + 0x400);
                      *(uint *)(local_b50.ray + 0x404) =
                           (uint)bVar11 * iVar3 | (uint)!bVar11 * *(int *)(local_b50.ray + 0x404);
                      *(uint *)(local_b50.ray + 0x408) =
                           (uint)bVar12 * iVar4 | (uint)!bVar12 * *(int *)(local_b50.ray + 0x408);
                      *(uint *)(local_b50.ray + 0x40c) =
                           (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_b50.ray + 0x40c);
                      *(uint *)(local_b50.ray + 0x410) =
                           (uint)bVar14 * iVar59 | (uint)!bVar14 * *(int *)(local_b50.ray + 0x410);
                      *(uint *)(local_b50.ray + 0x414) =
                           (uint)bVar15 * iVar60 | (uint)!bVar15 * *(int *)(local_b50.ray + 0x414);
                      *(uint *)(local_b50.ray + 0x418) =
                           (uint)bVar16 * iVar61 | (uint)!bVar16 * *(int *)(local_b50.ray + 0x418);
                      *(uint *)(local_b50.ray + 0x41c) =
                           (uint)bVar17 * iVar62 | (uint)!bVar17 * *(int *)(local_b50.ray + 0x41c);
                      *(uint *)(local_b50.ray + 0x420) =
                           (uint)(bVar77 & 1) * iVar63 |
                           (uint)!(bool)(bVar77 & 1) * *(int *)(local_b50.ray + 0x420);
                      *(uint *)(local_b50.ray + 0x424) =
                           (uint)bVar18 * iVar64 | (uint)!bVar18 * *(int *)(local_b50.ray + 0x424);
                      *(uint *)(local_b50.ray + 0x428) =
                           (uint)bVar19 * iVar65 | (uint)!bVar19 * *(int *)(local_b50.ray + 0x428);
                      *(uint *)(local_b50.ray + 0x42c) =
                           (uint)bVar20 * iVar66 | (uint)!bVar20 * *(int *)(local_b50.ray + 0x42c);
                      *(uint *)(local_b50.ray + 0x430) =
                           (uint)bVar21 * iVar67 | (uint)!bVar21 * *(int *)(local_b50.ray + 0x430);
                      *(uint *)(local_b50.ray + 0x434) =
                           (uint)bVar22 * iVar68 | (uint)!bVar22 * *(int *)(local_b50.ray + 0x434);
                      *(uint *)(local_b50.ray + 0x438) =
                           (uint)bVar23 * iVar69 | (uint)!bVar23 * *(int *)(local_b50.ray + 0x438);
                      *(uint *)(local_b50.ray + 0x43c) =
                           (uint)bVar24 * iVar70 | (uint)!bVar24 * *(int *)(local_b50.ray + 0x43c);
                      auVar173 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b50.hit + 0x140));
                      auVar173 = vmovdqu32_avx512f(auVar173);
                      *(undefined1 (*) [64])(local_b50.ray + 0x440) = auVar173;
                      auVar173 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b50.hit + 0x180));
                      auVar173 = vmovdqu32_avx512f(auVar173);
                      *(undefined1 (*) [64])(local_b50.ray + 0x480) = auVar173;
                      auVar173 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b50.hit + 0x1c0));
                      auVar173 = vmovdqa32_avx512f(auVar173);
                      *(undefined1 (*) [64])(local_b50.ray + 0x4c0) = auVar173;
                      auVar173 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_b50.hit + 0x200));
                      auVar173 = vmovdqa32_avx512f(auVar173);
                      *(undefined1 (*) [64])(local_b50.ray + 0x500) = auVar173;
                      break;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x200) = fVar192;
                  break;
                }
              }
              lVar85 = lVar85 + -1;
            } while (lVar85 != 0);
            uVar161 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar171._4_4_ = uVar161;
            auVar171._0_4_ = uVar161;
            auVar171._8_4_ = uVar161;
            auVar171._12_4_ = uVar161;
            auVar171._16_4_ = uVar161;
            auVar171._20_4_ = uVar161;
            auVar171._24_4_ = uVar161;
            auVar171._28_4_ = uVar161;
            auVar72._4_4_ = fStack_69c;
            auVar72._0_4_ = local_6a0;
            auVar72._8_4_ = fStack_698;
            auVar72._12_4_ = fStack_694;
            auVar72._16_4_ = fStack_690;
            auVar72._20_4_ = fStack_68c;
            auVar72._24_4_ = fStack_688;
            auVar72._28_4_ = fStack_684;
            uVar26 = vcmpps_avx512vl(auVar171,auVar72,0xd);
            bVar79 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar79 & (byte)uVar26;
          } while (bVar79 != 0);
          auVar265 = ZEXT3264(local_a00);
          auVar150 = local_6c0;
          fVar160 = (float)local_9c0._0_4_;
          fVar190 = (float)local_9c0._4_4_;
          fVar192 = fStack_9b8;
          fVar194 = fStack_9b4;
          fVar162 = fStack_9b0;
          fVar196 = fStack_9ac;
          fVar198 = fStack_9a8;
          fVar220 = fStack_9a4;
        }
        auVar240 = ZEXT3264(local_9e0);
        uVar27 = vpcmpgtd_avx512vl(auVar150,local_660);
        uVar28 = vpcmpd_avx512vl(local_660,local_5e0,1);
        auVar218._0_4_ = fVar160 + (float)local_540._0_4_;
        auVar218._4_4_ = fVar190 + (float)local_540._4_4_;
        auVar218._8_4_ = fVar192 + fStack_538;
        auVar218._12_4_ = fVar194 + fStack_534;
        auVar218._16_4_ = fVar162 + fStack_530;
        auVar218._20_4_ = fVar196 + fStack_52c;
        auVar218._24_4_ = fVar198 + fStack_528;
        auVar218._28_4_ = fVar220 + fStack_524;
        uVar26 = vcmpps_avx512vl(auVar218,auVar171,2);
        bVar80 = bVar80 & (byte)uVar28 & (byte)uVar26;
        auVar219._0_4_ = fVar160 + local_640._0_4_;
        auVar219._4_4_ = fVar190 + local_640._4_4_;
        auVar219._8_4_ = fVar192 + local_640._8_4_;
        auVar219._12_4_ = fVar194 + local_640._12_4_;
        auVar219._16_4_ = fVar162 + local_640._16_4_;
        auVar219._20_4_ = fVar196 + local_640._20_4_;
        auVar219._24_4_ = fVar198 + local_640._24_4_;
        auVar219._28_4_ = fVar220 + local_640._28_4_;
        uVar26 = vcmpps_avx512vl(auVar219,auVar171,2);
        bVar75 = bVar75 & (byte)uVar27 & (byte)uVar26 | bVar80;
        auVar115 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar173 = ZEXT3264(auVar115);
        auVar251 = ZEXT3264(local_860);
        prim = local_910;
        if (bVar75 != 0) {
          abStack_1a0[uVar81 * 0x60] = bVar75;
          auVar152._0_4_ =
               (uint)(bVar80 & 1) * local_540._0_4_ |
               (uint)!(bool)(bVar80 & 1) * (int)local_640._0_4_;
          bVar11 = (bool)(bVar80 >> 1 & 1);
          auVar152._4_4_ = (uint)bVar11 * local_540._4_4_ | (uint)!bVar11 * (int)local_640._4_4_;
          bVar11 = (bool)(bVar80 >> 2 & 1);
          auVar152._8_4_ = (uint)bVar11 * (int)fStack_538 | (uint)!bVar11 * (int)local_640._8_4_;
          bVar11 = (bool)(bVar80 >> 3 & 1);
          auVar152._12_4_ = (uint)bVar11 * (int)fStack_534 | (uint)!bVar11 * (int)local_640._12_4_;
          bVar11 = (bool)(bVar80 >> 4 & 1);
          auVar152._16_4_ = (uint)bVar11 * (int)fStack_530 | (uint)!bVar11 * (int)local_640._16_4_;
          bVar11 = (bool)(bVar80 >> 5 & 1);
          auVar152._20_4_ = (uint)bVar11 * (int)fStack_52c | (uint)!bVar11 * (int)local_640._20_4_;
          auVar152._24_4_ =
               (uint)(bVar80 >> 6) * (int)fStack_528 |
               (uint)!(bool)(bVar80 >> 6) * (int)local_640._24_4_;
          auVar152._28_4_ = local_640._28_4_;
          *(undefined1 (*) [32])(auStack_180 + uVar81 * 0x60) = auVar152;
          uVar83 = vmovlps_avx(local_670);
          (&uStack_160)[uVar81 * 0xc] = uVar83;
          aiStack_158[uVar81 * 0x18] = iVar82 + 1;
          uVar81 = (ulong)((int)uVar81 + 1);
        }
      }
    }
    do {
      uVar90 = (uint)uVar81;
      uVar81 = (ulong)(uVar90 - 1);
      if (uVar90 == 0) {
        uVar161 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar43._4_4_ = uVar161;
        auVar43._0_4_ = uVar161;
        auVar43._8_4_ = uVar161;
        auVar43._12_4_ = uVar161;
        auVar43._16_4_ = uVar161;
        auVar43._20_4_ = uVar161;
        auVar43._24_4_ = uVar161;
        auVar43._28_4_ = uVar161;
        uVar26 = vcmpps_avx512vl(local_5c0,auVar43,2);
        uVar84 = (uint)local_908 & (uint)uVar26;
        local_908 = (ulong)uVar84;
        if (uVar84 == 0) {
          return;
        }
        goto LAB_01d50510;
      }
      lVar85 = uVar81 * 0x60;
      auVar115 = *(undefined1 (*) [32])(auStack_180 + lVar85);
      auVar186._0_4_ = fVar160 + auVar115._0_4_;
      auVar186._4_4_ = fVar190 + auVar115._4_4_;
      auVar186._8_4_ = fVar192 + auVar115._8_4_;
      auVar186._12_4_ = fVar194 + auVar115._12_4_;
      auVar186._16_4_ = fVar162 + auVar115._16_4_;
      auVar186._20_4_ = fVar196 + auVar115._20_4_;
      auVar186._24_4_ = fVar198 + auVar115._24_4_;
      auVar186._28_4_ = fVar220 + auVar115._28_4_;
      uVar161 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar42._4_4_ = uVar161;
      auVar42._0_4_ = uVar161;
      auVar42._8_4_ = uVar161;
      auVar42._12_4_ = uVar161;
      auVar42._16_4_ = uVar161;
      auVar42._20_4_ = uVar161;
      auVar42._24_4_ = uVar161;
      auVar42._28_4_ = uVar161;
      uVar26 = vcmpps_avx512vl(auVar186,auVar42,2);
      uVar89 = (uint)uVar26 & (uint)abStack_1a0[lVar85];
    } while (uVar89 == 0);
    uVar83 = (&uStack_160)[uVar81 * 0xc];
    auVar175._8_8_ = 0;
    auVar175._0_8_ = uVar83;
    auVar216._8_4_ = 0x7f800000;
    auVar216._0_8_ = 0x7f8000007f800000;
    auVar216._12_4_ = 0x7f800000;
    auVar216._16_4_ = 0x7f800000;
    auVar216._20_4_ = 0x7f800000;
    auVar216._24_4_ = 0x7f800000;
    auVar216._28_4_ = 0x7f800000;
    auVar116 = vblendmps_avx512vl(auVar216,auVar115);
    bVar75 = (byte)uVar89;
    auVar148._0_4_ =
         (uint)(bVar75 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar75 & 1) * (int)auVar115._0_4_;
    bVar11 = (bool)((byte)(uVar89 >> 1) & 1);
    auVar148._4_4_ = (uint)bVar11 * auVar116._4_4_ | (uint)!bVar11 * (int)auVar115._4_4_;
    bVar11 = (bool)((byte)(uVar89 >> 2) & 1);
    auVar148._8_4_ = (uint)bVar11 * auVar116._8_4_ | (uint)!bVar11 * (int)auVar115._8_4_;
    bVar11 = (bool)((byte)(uVar89 >> 3) & 1);
    auVar148._12_4_ = (uint)bVar11 * auVar116._12_4_ | (uint)!bVar11 * (int)auVar115._12_4_;
    bVar11 = (bool)((byte)(uVar89 >> 4) & 1);
    auVar148._16_4_ = (uint)bVar11 * auVar116._16_4_ | (uint)!bVar11 * (int)auVar115._16_4_;
    bVar11 = (bool)((byte)(uVar89 >> 5) & 1);
    auVar148._20_4_ = (uint)bVar11 * auVar116._20_4_ | (uint)!bVar11 * (int)auVar115._20_4_;
    bVar11 = (bool)((byte)(uVar89 >> 6) & 1);
    auVar148._24_4_ = (uint)bVar11 * auVar116._24_4_ | (uint)!bVar11 * (int)auVar115._24_4_;
    auVar148._28_4_ =
         (uVar89 >> 7) * auVar116._28_4_ | (uint)!SUB41(uVar89 >> 7,0) * (int)auVar115._28_4_;
    auVar115 = vshufps_avx(auVar148,auVar148,0xb1);
    auVar115 = vminps_avx(auVar148,auVar115);
    auVar116 = vshufpd_avx(auVar115,auVar115,5);
    auVar115 = vminps_avx(auVar115,auVar116);
    auVar116 = vpermpd_avx2(auVar115,0x4e);
    auVar115 = vminps_avx(auVar115,auVar116);
    uVar26 = vcmpps_avx512vl(auVar148,auVar115,0);
    bVar79 = (byte)uVar26 & bVar75;
    if (bVar79 != 0) {
      uVar89 = (uint)bVar79;
    }
    uVar153 = 0;
    for (; (uVar89 & 1) == 0; uVar89 = uVar89 >> 1 | 0x80000000) {
      uVar153 = uVar153 + 1;
    }
    iVar82 = aiStack_158[uVar81 * 0x18];
    bVar75 = ~('\x01' << ((byte)uVar153 & 0x1f)) & bVar75;
    abStack_1a0[lVar85] = bVar75;
    if (bVar75 == 0) {
      uVar90 = uVar90 - 1;
    }
    uVar161 = (undefined4)uVar83;
    auVar168._4_4_ = uVar161;
    auVar168._0_4_ = uVar161;
    auVar168._8_4_ = uVar161;
    auVar168._12_4_ = uVar161;
    auVar168._16_4_ = uVar161;
    auVar168._20_4_ = uVar161;
    auVar168._24_4_ = uVar161;
    auVar168._28_4_ = uVar161;
    auVar94 = vmovshdup_avx(auVar175);
    auVar94 = vsubps_avx(auVar94,auVar175);
    auVar187._0_4_ = auVar94._0_4_;
    auVar187._4_4_ = auVar187._0_4_;
    auVar187._8_4_ = auVar187._0_4_;
    auVar187._12_4_ = auVar187._0_4_;
    auVar187._16_4_ = auVar187._0_4_;
    auVar187._20_4_ = auVar187._0_4_;
    auVar187._24_4_ = auVar187._0_4_;
    auVar187._28_4_ = auVar187._0_4_;
    auVar94 = vfmadd132ps_fma(auVar187,auVar168,_DAT_01faff20);
    auVar115 = ZEXT1632(auVar94);
    local_400[0] = (RTCHitN)auVar115[0];
    local_400[1] = (RTCHitN)auVar115[1];
    local_400[2] = (RTCHitN)auVar115[2];
    local_400[3] = (RTCHitN)auVar115[3];
    local_400[4] = (RTCHitN)auVar115[4];
    local_400[5] = (RTCHitN)auVar115[5];
    local_400[6] = (RTCHitN)auVar115[6];
    local_400[7] = (RTCHitN)auVar115[7];
    local_400[8] = (RTCHitN)auVar115[8];
    local_400[9] = (RTCHitN)auVar115[9];
    local_400[10] = (RTCHitN)auVar115[10];
    local_400[0xb] = (RTCHitN)auVar115[0xb];
    local_400[0xc] = (RTCHitN)auVar115[0xc];
    local_400[0xd] = (RTCHitN)auVar115[0xd];
    local_400[0xe] = (RTCHitN)auVar115[0xe];
    local_400[0xf] = (RTCHitN)auVar115[0xf];
    local_400[0x10] = (RTCHitN)auVar115[0x10];
    local_400[0x11] = (RTCHitN)auVar115[0x11];
    local_400[0x12] = (RTCHitN)auVar115[0x12];
    local_400[0x13] = (RTCHitN)auVar115[0x13];
    local_400[0x14] = (RTCHitN)auVar115[0x14];
    local_400[0x15] = (RTCHitN)auVar115[0x15];
    local_400[0x16] = (RTCHitN)auVar115[0x16];
    local_400[0x17] = (RTCHitN)auVar115[0x17];
    local_400[0x18] = (RTCHitN)auVar115[0x18];
    local_400[0x19] = (RTCHitN)auVar115[0x19];
    local_400[0x1a] = (RTCHitN)auVar115[0x1a];
    local_400[0x1b] = (RTCHitN)auVar115[0x1b];
    local_400[0x1c] = (RTCHitN)auVar115[0x1c];
    local_400[0x1d] = (RTCHitN)auVar115[0x1d];
    local_400[0x1e] = (RTCHitN)auVar115[0x1e];
    local_400[0x1f] = (RTCHitN)auVar115[0x1f];
    local_670._8_8_ = 0;
    local_670._0_8_ = *(ulong *)(local_400 + (ulong)uVar153 * 4);
    uVar81 = (ulong)uVar90;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }